

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86_fma::forward
          (BinaryOp_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  uint uVar3;
  Mat *this_00;
  _func_int *p_Var4;
  size_t sVar5;
  Allocator *pAVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  __m256 afVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  int iVar35;
  float *pfVar36;
  undefined1 (*pauVar37) [32];
  undefined1 (*pauVar38) [32];
  float *pfVar39;
  long lVar40;
  void *pvVar41;
  Mat *pMVar42;
  float *pfVar43;
  undefined1 (*pauVar44) [32];
  undefined1 (*pauVar45) [16];
  Mat *b;
  Mat *a;
  ulong uVar46;
  int y;
  uint uVar47;
  size_t sVar48;
  uint uVar49;
  uint uVar50;
  int y_32;
  uint uVar51;
  __m256 *pafVar52;
  undefined1 (*pauVar53) [16];
  long lVar54;
  void *pvVar55;
  __m256 *pafVar56;
  long lVar57;
  ulong uVar58;
  uint uVar59;
  undefined8 *puVar60;
  uint uVar61;
  __m256 *pafVar62;
  undefined1 (*pauVar63) [16];
  bool bVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined8 uVar101;
  undefined1 auVar100 [56];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined8 uVar98;
  undefined8 uVar102;
  undefined1 auVar88 [64];
  undefined8 uVar99;
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  float in_register_0000125c;
  __m128 afVar103;
  binary_op_pow op;
  __m256 _p1;
  __m256 _a0;
  binary_op_pow local_101;
  Mat *local_100;
  __m256 *local_f8;
  Mat *local_f0;
  __m256 *local_e8;
  __m256 *local_e0;
  ulong local_d8;
  void *local_d0;
  __m256 *local_c8;
  ulong local_c0;
  ulong local_b8;
  Option *local_b0;
  size_t local_a8;
  __m256 local_a0;
  __m256 local_80;
  size_t local_60;
  
  a = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  b = a + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar29 = a->elempack;
  uVar47 = a[1].elempack;
  local_f0 = b;
  if (uVar47 != 8 && iVar29 != 8) {
switchD_003985fc_default:
    p_Var4 = this->_vptr_BinaryOp_x86_fma[-3];
    if (uVar47 != 4 && iVar29 != 4) {
switchD_00398776_default:
      iVar29 = BinaryOp::forward((BinaryOp *)((long)&this->_vptr_BinaryOp_x86_fma + (long)p_Var4),
                                 bottom_blobs,top_blobs,opt);
      return iVar29;
    }
    switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var4)) {
    case 0:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
      uVar49 = a->w;
      uVar51 = a->h;
      iVar35 = a->d;
      uVar50 = a->c;
      local_f8 = (__m256 *)(ulong)uVar50;
      local_d0 = (void *)CONCAT44(local_d0._4_4_,uVar51 * uVar49 * iVar35);
      sVar48 = a->elemsize;
      uVar61 = a[1].w;
      uVar59 = a[1].h;
      iVar34 = a[1].d;
      uVar3 = a[1].c;
      local_e8 = (__m256 *)(ulong)uVar3;
      local_c8 = (__m256 *)CONCAT44(local_c8._4_4_,uVar59 * uVar61 * iVar34);
      sVar5 = a[1].elemsize;
      switch(a->dims) {
      case 1:
        if (iVar29 != 1 || uVar49 != 1) {
          switch(a[1].dims) {
          case 1:
            goto switchD_0039ca84_caseD_1;
          case 2:
            local_100 = a;
            Mat::create(this_00,uVar61,uVar59,sVar5,uVar47,opt->blob_allocator);
            pfVar36 = (float *)this_00->data;
            if (pfVar36 == (float *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              pfVar43 = (float *)local_100->data;
              pfVar39 = (float *)local_100[1].data;
              if ((int)uVar61 < 1) {
                uVar61 = 0;
              }
              if ((int)uVar59 < 1) {
                uVar59 = 0;
              }
              for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                fVar2 = *pfVar43;
                fVar14 = pfVar43[1];
                fVar15 = pfVar43[2];
                fVar16 = pfVar43[3];
                uVar49 = uVar61;
                while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                  fVar17 = pfVar39[1];
                  fVar18 = pfVar39[2];
                  fVar19 = pfVar39[3];
                  *pfVar36 = fVar2 + *pfVar39;
                  pfVar36[1] = fVar14 + fVar17;
                  pfVar36[2] = fVar15 + fVar18;
                  pfVar36[3] = fVar16 + fVar19;
                  pfVar39 = pfVar39 + 4;
                  pfVar36 = pfVar36 + 4;
                }
                pfVar43 = pfVar43 + 4;
              }
              return 0;
            }
            return -100;
          case 3:
            local_100 = a;
            Mat::create(this_00,uVar61,uVar59,uVar3,sVar5,uVar47,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)local_c8 < 1) {
                local_c8._0_4_ = 0;
              }
              uVar58 = (ulong)local_e8 & 0xffffffff;
              if ((int)local_e8 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                sVar48 = local_100[1].cstep;
                sVar5 = local_100[1].elemsize;
                pfVar36 = (float *)((long)local_100->data + uVar32 * 0x10);
                fVar2 = *pfVar36;
                fVar14 = pfVar36[1];
                fVar15 = pfVar36[2];
                fVar16 = pfVar36[3];
                pvVar9 = local_100[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar41 = this_00->data;
                lVar40 = 0;
                iVar29 = (int)local_c8;
                while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                  pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                  fVar17 = pfVar36[1];
                  fVar18 = pfVar36[2];
                  fVar19 = pfVar36[3];
                  pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
                  *pfVar43 = fVar2 + *pfVar36;
                  pfVar43[1] = fVar14 + fVar17;
                  pfVar43[2] = fVar15 + fVar18;
                  pfVar43[3] = fVar16 + fVar19;
                  lVar40 = lVar40 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          case 4:
            local_100 = a;
            Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)local_c8 < 1) {
                local_c8._0_4_ = 0;
              }
              uVar58 = (ulong)local_e8 & 0xffffffff;
              if ((int)local_e8 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                sVar48 = local_100[1].cstep;
                sVar5 = local_100[1].elemsize;
                pfVar36 = (float *)((long)local_100->data + uVar32 * 0x10);
                fVar2 = *pfVar36;
                fVar14 = pfVar36[1];
                fVar15 = pfVar36[2];
                fVar16 = pfVar36[3];
                pvVar9 = local_100[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar41 = this_00->data;
                lVar40 = 0;
                iVar29 = (int)local_c8;
                while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                  pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                  fVar17 = pfVar36[1];
                  fVar18 = pfVar36[2];
                  fVar19 = pfVar36[3];
                  pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
                  *pfVar43 = fVar2 + *pfVar36;
                  pfVar43[1] = fVar14 + fVar17;
                  pfVar43[2] = fVar15 + fVar18;
                  pfVar43[3] = fVar16 + fVar19;
                  lVar40 = lVar40 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          default:
            return 0;
          }
        }
LAB_00398817:
        local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
        local_100 = a;
        iVar29 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_add>(a,b,this_00,opt);
        return iVar29;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,uVar3,sVar5,uVar47,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar53 = (undefined1 (*) [16])
                         ((long)local_100->w * uVar32 * local_100->elemsize + (long)local_100->data)
              ;
              pfVar36 = (float *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                                 (long)local_100[1].data);
              pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                auVar69 = *pauVar53;
                uVar49 = uVar61;
                while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                  fVar2 = pfVar36[1];
                  fVar14 = pfVar36[2];
                  fVar15 = pfVar36[3];
                  *pfVar43 = auVar69._0_4_ + *pfVar36;
                  pfVar43[1] = auVar69._4_4_ + fVar2;
                  pfVar43[2] = auVar69._8_4_ + fVar14;
                  pfVar43[3] = auVar69._12_4_ + fVar15;
                  pfVar36 = pfVar36 + 4;
                  pfVar43 = pfVar43 + 4;
                }
                pauVar53 = pauVar53 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            if (iVar34 < 1) {
              iVar34 = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar53 = (undefined1 (*) [16])
                         ((long)local_100->w * uVar32 * local_100->elemsize + (long)local_100->data)
              ;
              pfVar36 = (float *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                                 (long)local_100[1].data);
              pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              for (iVar29 = 0; iVar29 != iVar34; iVar29 = iVar29 + 1) {
                auVar69 = *pauVar53;
                for (uVar47 = 0; uVar49 = uVar61, uVar47 != uVar59; uVar47 = uVar47 + 1) {
                  while (uVar49 != 0) {
                    fVar2 = pfVar36[1];
                    fVar14 = pfVar36[2];
                    fVar15 = pfVar36[3];
                    *pfVar43 = auVar69._0_4_ + *pfVar36;
                    pfVar43[1] = auVar69._4_4_ + fVar2;
                    pfVar43[2] = auVar69._8_4_ + fVar14;
                    pfVar43[3] = auVar69._12_4_ + fVar15;
                    pfVar36 = pfVar36 + 4;
                    pfVar43 = pfVar43 + 4;
                    uVar49 = uVar49 - 1;
                  }
                }
                pauVar53 = pauVar53 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        local_d8 = CONCAT44(local_d8._4_4_,uVar47);
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,sVar48,iVar29,pAVar6);
        if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) {
          return -100;
        }
        iVar29 = local_100[1].dims;
        if (iVar29 == 1) {
          Mat::create(this_00,uVar49,uVar51,sVar48,(int)local_e0,opt->blob_allocator);
          pfVar36 = (float *)this_00->data;
          if (pfVar36 == (float *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          a = local_100;
          if ((int)local_d8 != 1 || local_100[1].w != 1) {
            pfVar43 = (float *)local_100->data;
            pfVar39 = (float *)local_100[1].data;
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
              fVar2 = *pfVar39;
              fVar14 = pfVar39[1];
              fVar15 = pfVar39[2];
              fVar16 = pfVar39[3];
              uVar50 = uVar49;
              while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                fVar17 = pfVar43[1];
                fVar18 = pfVar43[2];
                fVar19 = pfVar43[3];
                *pfVar36 = fVar2 + *pfVar43;
                pfVar36[1] = fVar14 + fVar17;
                pfVar36[2] = fVar15 + fVar18;
                pfVar36[3] = fVar16 + fVar19;
                pfVar43 = pfVar43 + 4;
                pfVar36 = pfVar36 + 4;
              }
              pfVar39 = pfVar39 + 4;
            }
            return 0;
          }
          goto LAB_003a3733;
        }
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            local_100 = a;
            Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)uVar61 < 1) {
                uVar61 = 0;
              }
              if ((int)uVar59 < 1) {
                uVar59 = 0;
              }
              if (iVar34 < 1) {
                iVar34 = 0;
              }
              uVar58 = (ulong)local_e8 & 0xffffffff;
              if ((int)local_e8 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                pauVar53 = (undefined1 (*) [16])
                           (local_100->cstep * uVar32 * local_100->elemsize + (long)local_100->data)
                ;
                pfVar36 = (float *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                                   (long)local_100[1].data);
                pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize +
                                   (long)this_00->data);
                for (iVar29 = 0; iVar29 != iVar34; iVar29 = iVar29 + 1) {
                  for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                    auVar69 = *pauVar53;
                    uVar49 = uVar61;
                    while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                      fVar2 = pfVar36[1];
                      fVar14 = pfVar36[2];
                      fVar15 = pfVar36[3];
                      *pfVar43 = auVar69._0_4_ + *pfVar36;
                      pfVar43[1] = auVar69._4_4_ + fVar2;
                      pfVar43[2] = auVar69._8_4_ + fVar14;
                      pfVar43[3] = auVar69._12_4_ + fVar15;
                      pfVar36 = pfVar36 + 4;
                      pfVar43 = pfVar43 + 4;
                    }
                    pauVar53 = pauVar53 + 1;
                  }
                }
              }
              return 0;
            }
            return -100;
          }
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (local_100[1].dims != 1) {
            if (local_100[1].dims == 2) {
              if ((int)uVar49 < 1) {
                uVar49 = 0;
              }
              if ((int)uVar51 < 1) {
                uVar51 = 0;
              }
              uVar58 = (ulong)local_f8 & 0xffffffff;
              if ((int)local_f8 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                pfVar36 = (float *)(local_100->cstep * uVar32 * local_100->elemsize +
                                   (long)local_100->data);
                pauVar53 = (undefined1 (*) [16])
                           ((long)local_100[1].w * uVar32 * local_100[1].elemsize +
                           (long)local_100[1].data);
                pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                  auVar69 = *pauVar53;
                  uVar50 = uVar49;
                  while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                    fVar2 = pfVar36[1];
                    fVar14 = pfVar36[2];
                    fVar15 = pfVar36[3];
                    *pfVar43 = auVar69._0_4_ + *pfVar36;
                    pfVar43[1] = auVar69._4_4_ + fVar2;
                    pfVar43[2] = auVar69._8_4_ + fVar14;
                    pfVar43[3] = auVar69._12_4_ + fVar15;
                    pfVar36 = pfVar36 + 4;
                    pfVar43 = pfVar43 + 4;
                  }
                  pauVar53 = pauVar53 + 1;
                }
              }
              return 0;
            }
            return 0;
          }
          a = local_100;
          if (uVar47 != 1 || local_100[1].w != 1) {
            if ((int)local_d0 < 1) {
              local_d0._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100->cstep;
              sVar5 = local_100->elemsize;
              pfVar36 = (float *)((long)local_100[1].data + uVar32 * 0x10);
              fVar2 = *pfVar36;
              fVar14 = pfVar36[1];
              fVar15 = pfVar36[2];
              fVar16 = pfVar36[3];
              pvVar9 = local_100->data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar41 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_d0;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                fVar17 = pfVar36[1];
                fVar18 = pfVar36[2];
                fVar19 = pfVar36[3];
                pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
                *pfVar43 = fVar2 + *pfVar36;
                pfVar43[1] = fVar14 + fVar17;
                pfVar43[2] = fVar15 + fVar18;
                pfVar43[3] = fVar16 + fVar19;
                lVar40 = lVar40 + 0x10;
              }
            }
            return 0;
          }
          goto LAB_003a3733;
        }
        local_d8 = CONCAT44(local_d8._4_4_,uVar47);
        uVar31 = uVar3 ^ uVar50;
        if (((uVar61 ^ 1) == 0 && (uVar59 ^ 1) == 0) && uVar31 == 0) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_d0 < 1) {
              local_d0._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = this_00->cstep;
              sVar5 = local_100->cstep;
              sVar7 = local_100->elemsize;
              pvVar9 = local_100->data;
              pfVar36 = (float *)((long)local_100[1].data +
                                 local_100[1].cstep * uVar32 * local_100[1].elemsize);
              fVar2 = *pfVar36;
              fVar14 = pfVar36[1];
              fVar15 = pfVar36[2];
              fVar16 = pfVar36[3];
              sVar8 = this_00->elemsize;
              pvVar41 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_d0;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar5 * sVar7 * uVar32);
                fVar17 = pfVar36[1];
                fVar18 = pfVar36[2];
                fVar19 = pfVar36[3];
                pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar48 * sVar8 * uVar32);
                *pfVar43 = fVar2 + *pfVar36;
                pfVar43[1] = fVar14 + fVar17;
                pfVar43[2] = fVar15 + fVar18;
                pfVar43[3] = fVar16 + fVar19;
                lVar40 = lVar40 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((uVar61 == uVar49) && (uVar47 == 1 && (uVar3 == 1 && uVar59 == uVar51))) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_d0 < 1) {
              local_d0._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100->cstep;
              sVar5 = local_100->elemsize;
              pvVar9 = local_100[1].data;
              pvVar41 = local_100->data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_d0;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                fVar2 = *(float *)((long)pvVar9 + lVar40);
                pfVar36 = (float *)((long)pvVar41 + lVar40 * 4 + sVar48 * sVar5 * uVar32);
                auVar67._0_4_ = fVar2 + *pfVar36;
                auVar67._4_4_ = fVar2 + pfVar36[1];
                auVar67._8_4_ = fVar2 + pfVar36[2];
                auVar67._12_4_ = fVar2 + pfVar36[3];
                *(undefined1 (*) [16])((long)pvVar55 + lVar40 * 4 + sVar7 * sVar8 * uVar32) =
                     auVar67;
                lVar40 = lVar40 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        local_d0 = (void *)sVar48;
        if (((uVar49 ^ 1) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,uVar50,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = this_00->cstep;
              sVar5 = this_00->elemsize;
              sVar7 = local_100[1].cstep;
              pvVar9 = this_00->data;
              pfVar36 = (float *)((long)local_100->data +
                                 local_100->cstep * uVar32 * local_100->elemsize);
              fVar2 = *pfVar36;
              fVar14 = pfVar36[1];
              fVar15 = pfVar36[2];
              fVar16 = pfVar36[3];
              sVar8 = local_100[1].elemsize;
              pvVar41 = local_100[1].data;
              lVar40 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                pfVar36 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
                fVar17 = pfVar36[1];
                fVar18 = pfVar36[2];
                fVar19 = pfVar36[3];
                pfVar43 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                *pfVar43 = fVar2 + *pfVar36;
                pfVar43[1] = fVar14 + fVar17;
                pfVar43[2] = fVar15 + fVar18;
                pfVar43[3] = fVar16 + fVar19;
                lVar40 = lVar40 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if (((uVar61 == uVar49) && (iVar29 == 1)) && ((uVar59 == uVar51 && (uVar50 == 1)))) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar3,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100[1].cstep;
              sVar5 = local_100[1].elemsize;
              pvVar9 = local_100->data;
              pvVar41 = local_100[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                fVar2 = *(float *)((long)pvVar9 + lVar40);
                pfVar36 = (float *)((long)pvVar41 + lVar40 * 4 + sVar48 * sVar5 * uVar32);
                auVar72._0_4_ = fVar2 + *pfVar36;
                auVar72._4_4_ = fVar2 + pfVar36[1];
                auVar72._8_4_ = fVar2 + pfVar36[2];
                auVar72._12_4_ = fVar2 + pfVar36[3];
                *(undefined1 (*) [16])((long)pvVar55 + lVar40 * 4 + sVar7 * sVar8 * uVar32) =
                     auVar72;
                lVar40 = lVar40 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar61 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar49 != 1) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            uVar58 = (ulong)uVar51;
            if ((int)uVar51 < 1) {
              uVar58 = 0;
            }
            uVar32 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar32 = 0;
            }
            for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
              pfVar36 = (float *)(local_100->cstep * uVar33 * local_100->elemsize +
                                 (long)local_100->data);
              sVar48 = local_100[1].cstep;
              sVar5 = local_100[1].elemsize;
              pvVar9 = local_100[1].data;
              pfVar43 = (float *)(this_00->cstep * uVar33 * this_00->elemsize + (long)this_00->data)
              ;
              for (uVar46 = 0; uVar46 != uVar58; uVar46 = uVar46 + 1) {
                auVar69 = *(undefined1 (*) [16])
                           ((long)pvVar9 + uVar46 * 0x10 + sVar48 * uVar33 * sVar5);
                uVar47 = uVar49;
                while (bVar64 = uVar47 != 0, uVar47 = uVar47 - 1, bVar64) {
                  fVar2 = pfVar36[1];
                  fVar14 = pfVar36[2];
                  fVar15 = pfVar36[3];
                  *pfVar43 = auVar69._0_4_ + *pfVar36;
                  pfVar43[1] = auVar69._4_4_ + fVar2;
                  pfVar43[2] = auVar69._8_4_ + fVar14;
                  pfVar43[3] = auVar69._12_4_ + fVar15;
                  pfVar36 = pfVar36 + 4;
                  pfVar43 = pfVar43 + 4;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar59 ^ 1) == 0 && (uVar61 ^ uVar49) == 0) && uVar31 == 0) && uVar51 != 1) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pvVar41 = (void *)(local_100->cstep * uVar32 * local_100->elemsize +
                                (long)local_100->data);
              sVar48 = local_100[1].cstep;
              pvVar55 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              sVar5 = local_100[1].elemsize;
              pvVar9 = local_100[1].data;
              for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                for (lVar40 = 0; (ulong)uVar49 * 0x10 != lVar40; lVar40 = lVar40 + 0x10) {
                  pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                  pfVar43 = (float *)((long)pvVar41 + lVar40);
                  auVar75._0_4_ = *pfVar36 + *pfVar43;
                  auVar75._4_4_ = pfVar36[1] + pfVar43[1];
                  auVar75._8_4_ = pfVar36[2] + pfVar43[2];
                  auVar75._12_4_ = pfVar36[3] + pfVar43[3];
                  *(undefined1 (*) [16])((long)pvVar55 + lVar40) = auVar75;
                }
                pvVar41 = (void *)((long)pvVar41 + lVar40);
                pvVar55 = (void *)((long)pvVar55 + lVar40);
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar49 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar61 != 1) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar51,uVar50,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            uVar58 = (ulong)uVar51;
            if ((int)uVar51 < 1) {
              uVar58 = 0;
            }
            uVar32 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar32 = 0;
            }
            for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
              sVar48 = local_100->cstep;
              sVar5 = local_100->elemsize;
              pvVar9 = local_100->data;
              pfVar36 = (float *)(local_100[1].cstep * uVar33 * local_100[1].elemsize +
                                 (long)local_100[1].data);
              pfVar43 = (float *)(this_00->cstep * uVar33 * this_00->elemsize + (long)this_00->data)
              ;
              for (uVar46 = 0; uVar46 != uVar58; uVar46 = uVar46 + 1) {
                auVar69 = *(undefined1 (*) [16])
                           ((long)pvVar9 + uVar46 * 0x10 + sVar48 * uVar33 * sVar5);
                uVar47 = uVar61;
                while (bVar64 = uVar47 != 0, uVar47 = uVar47 - 1, bVar64) {
                  fVar2 = pfVar36[1];
                  fVar14 = pfVar36[2];
                  fVar15 = pfVar36[3];
                  *pfVar43 = auVar69._0_4_ + *pfVar36;
                  pfVar43[1] = auVar69._4_4_ + fVar2;
                  pfVar43[2] = auVar69._8_4_ + fVar14;
                  pfVar43[3] = auVar69._12_4_ + fVar15;
                  pfVar36 = pfVar36 + 4;
                  pfVar43 = pfVar43 + 4;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar61 ^ uVar49) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) && uVar59 != 1) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar59,uVar50,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100->cstep;
              pvVar41 = (void *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                                (long)local_100[1].data);
              pvVar55 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              sVar5 = local_100->elemsize;
              pvVar9 = local_100->data;
              for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                for (lVar40 = 0; (ulong)uVar49 * 0x10 != lVar40; lVar40 = lVar40 + 0x10) {
                  pfVar36 = (float *)((long)pvVar41 + lVar40);
                  pfVar43 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                  auVar77._0_4_ = *pfVar36 + *pfVar43;
                  auVar77._4_4_ = pfVar36[1] + pfVar43[1];
                  auVar77._8_4_ = pfVar36[2] + pfVar43[2];
                  auVar77._12_4_ = pfVar36[3] + pfVar43[3];
                  *(undefined1 (*) [16])((long)pvVar55 + lVar40) = auVar77;
                }
                pvVar41 = (void *)((long)pvVar41 + lVar40);
                pvVar55 = (void *)((long)pvVar55 + lVar40);
              }
            }
            return 0;
          }
          return -100;
        }
        goto LAB_003a5fe5;
      case 4:
        if (a[1].dims != 4) {
          local_d8 = CONCAT44(local_d8._4_4_,uVar47);
          local_b0 = opt;
          Mat::create(this_00,uVar49,uVar51,iVar35,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          iVar29 = a[1].dims;
          iVar34 = (int)local_f8;
          if (iVar29 != 1) {
            if (iVar29 == 3) {
              if ((int)uVar49 < 1) {
                uVar49 = 0;
              }
              if ((int)uVar51 < 1) {
                uVar51 = 0;
              }
              if (iVar35 < 1) {
                iVar35 = 0;
              }
              uVar58 = (ulong)local_f8 & 0xffffffff;
              if (iVar34 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                pfVar36 = (float *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
                pauVar53 = (undefined1 (*) [16])
                           (a[1].cstep * uVar32 * a[1].elemsize + (long)a[1].data);
                pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize +
                                   (long)this_00->data);
                for (iVar29 = 0; iVar29 != iVar35; iVar29 = iVar29 + 1) {
                  for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                    auVar69 = *pauVar53;
                    uVar50 = uVar49;
                    while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                      fVar2 = pfVar36[1];
                      fVar14 = pfVar36[2];
                      fVar15 = pfVar36[3];
                      *pfVar43 = auVar69._0_4_ + *pfVar36;
                      pfVar43[1] = auVar69._4_4_ + fVar2;
                      pfVar43[2] = auVar69._8_4_ + fVar14;
                      pfVar43[3] = auVar69._12_4_ + fVar15;
                      pfVar36 = pfVar36 + 4;
                      pfVar43 = pfVar43 + 4;
                    }
                    pauVar53 = pauVar53 + 1;
                  }
                }
              }
              return 0;
            }
            if (iVar29 == 2) {
              if ((int)uVar49 < 1) {
                uVar49 = 0;
              }
              if ((int)uVar51 < 1) {
                uVar51 = 0;
              }
              if (iVar35 < 1) {
                iVar35 = 0;
              }
              uVar58 = (ulong)local_f8 & 0xffffffff;
              if (iVar34 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                pfVar36 = (float *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
                pauVar53 = (undefined1 (*) [16])
                           ((long)a[1].w * uVar32 * a[1].elemsize + (long)a[1].data);
                pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize +
                                   (long)this_00->data);
                for (iVar29 = 0; iVar29 != iVar35; iVar29 = iVar29 + 1) {
                  auVar69 = *pauVar53;
                  for (uVar47 = 0; uVar50 = uVar49, uVar47 != uVar51; uVar47 = uVar47 + 1) {
                    while (uVar50 != 0) {
                      fVar2 = pfVar36[1];
                      fVar14 = pfVar36[2];
                      fVar15 = pfVar36[3];
                      *pfVar43 = auVar69._0_4_ + *pfVar36;
                      pfVar43[1] = auVar69._4_4_ + fVar2;
                      pfVar43[2] = auVar69._8_4_ + fVar14;
                      pfVar43[3] = auVar69._12_4_ + fVar15;
                      pfVar36 = pfVar36 + 4;
                      pfVar43 = pfVar43 + 4;
                      uVar50 = uVar50 - 1;
                    }
                  }
                  pauVar53 = pauVar53 + 1;
                }
              }
              return 0;
            }
            return 0;
          }
          opt = local_b0;
          if ((int)local_d8 != 1 || a[1].w != 1) {
            if ((int)local_d0 < 1) {
              local_d0._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if (iVar34 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = a->cstep;
              sVar5 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pvVar9 = this_00->data;
              pfVar36 = (float *)((long)a[1].data + uVar32 * 0x10);
              fVar2 = *pfVar36;
              fVar14 = pfVar36[1];
              fVar15 = pfVar36[2];
              fVar16 = pfVar36[3];
              sVar8 = a->elemsize;
              pvVar41 = a->data;
              lVar40 = 0;
              iVar29 = (int)local_d0;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                pfVar36 = (float *)((long)pvVar41 + lVar40 + sVar48 * sVar8 * uVar32);
                fVar17 = pfVar36[1];
                fVar18 = pfVar36[2];
                fVar19 = pfVar36[3];
                pfVar43 = (float *)((long)pvVar9 + lVar40 + sVar5 * sVar7 * uVar32);
                *pfVar43 = fVar2 + *pfVar36;
                pfVar43[1] = fVar14 + fVar17;
                pfVar43[2] = fVar15 + fVar18;
                pfVar43[3] = fVar16 + fVar19;
                lVar40 = lVar40 + 0x10;
              }
            }
            return 0;
          }
          goto LAB_003a3733;
        }
        goto LAB_0039a78d;
      }
      goto LAB_0039deeb;
    case 1:
      pMVar42 = b;
      break;
    case 2:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
      uVar49 = a->w;
      uVar51 = a->h;
      iVar35 = a->d;
      uVar50 = a->c;
      local_f8 = (__m256 *)(ulong)uVar50;
      local_d0 = (void *)CONCAT44(local_d0._4_4_,uVar51 * uVar49 * iVar35);
      sVar48 = a->elemsize;
      uVar61 = a[1].w;
      uVar59 = a[1].h;
      iVar34 = a[1].d;
      uVar3 = a[1].c;
      local_e8 = (__m256 *)(ulong)uVar3;
      local_c8 = (__m256 *)CONCAT44(local_c8._4_4_,uVar59 * uVar61 * iVar34);
      sVar5 = a[1].elemsize;
      switch(a->dims) {
      case 1:
        if (iVar29 != 1 || uVar49 != 1) {
          switch(a[1].dims) {
          case 1:
            goto switchD_00398a6a_caseD_1;
          case 2:
            local_100 = a;
            Mat::create(this_00,uVar61,uVar59,sVar5,uVar47,opt->blob_allocator);
            pfVar36 = (float *)this_00->data;
            if (pfVar36 == (float *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              pfVar43 = (float *)local_100->data;
              pfVar39 = (float *)local_100[1].data;
              if ((int)uVar61 < 1) {
                uVar61 = 0;
              }
              if ((int)uVar59 < 1) {
                uVar59 = 0;
              }
              for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                fVar2 = *pfVar43;
                fVar14 = pfVar43[1];
                fVar15 = pfVar43[2];
                fVar16 = pfVar43[3];
                uVar49 = uVar61;
                while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                  fVar17 = pfVar39[1];
                  fVar18 = pfVar39[2];
                  fVar19 = pfVar39[3];
                  *pfVar36 = fVar2 * *pfVar39;
                  pfVar36[1] = fVar14 * fVar17;
                  pfVar36[2] = fVar15 * fVar18;
                  pfVar36[3] = fVar16 * fVar19;
                  pfVar39 = pfVar39 + 4;
                  pfVar36 = pfVar36 + 4;
                }
                pfVar43 = pfVar43 + 4;
              }
              return 0;
            }
            return -100;
          case 3:
            local_100 = a;
            Mat::create(this_00,uVar61,uVar59,uVar3,sVar5,uVar47,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)local_c8 < 1) {
                local_c8._0_4_ = 0;
              }
              uVar58 = (ulong)local_e8 & 0xffffffff;
              if ((int)local_e8 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                sVar48 = local_100[1].cstep;
                sVar5 = local_100[1].elemsize;
                pfVar36 = (float *)((long)local_100->data + uVar32 * 0x10);
                fVar2 = *pfVar36;
                fVar14 = pfVar36[1];
                fVar15 = pfVar36[2];
                fVar16 = pfVar36[3];
                pvVar9 = local_100[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar41 = this_00->data;
                lVar40 = 0;
                iVar29 = (int)local_c8;
                while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                  pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                  fVar17 = pfVar36[1];
                  fVar18 = pfVar36[2];
                  fVar19 = pfVar36[3];
                  pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
                  *pfVar43 = fVar2 * *pfVar36;
                  pfVar43[1] = fVar14 * fVar17;
                  pfVar43[2] = fVar15 * fVar18;
                  pfVar43[3] = fVar16 * fVar19;
                  lVar40 = lVar40 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          case 4:
            local_100 = a;
            Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)local_c8 < 1) {
                local_c8._0_4_ = 0;
              }
              uVar58 = (ulong)local_e8 & 0xffffffff;
              if ((int)local_e8 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                sVar48 = local_100[1].cstep;
                sVar5 = local_100[1].elemsize;
                pfVar36 = (float *)((long)local_100->data + uVar32 * 0x10);
                fVar2 = *pfVar36;
                fVar14 = pfVar36[1];
                fVar15 = pfVar36[2];
                fVar16 = pfVar36[3];
                pvVar9 = local_100[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar41 = this_00->data;
                lVar40 = 0;
                iVar29 = (int)local_c8;
                while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                  pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                  fVar17 = pfVar36[1];
                  fVar18 = pfVar36[2];
                  fVar19 = pfVar36[3];
                  pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
                  *pfVar43 = fVar2 * *pfVar36;
                  pfVar43[1] = fVar14 * fVar17;
                  pfVar43[2] = fVar15 * fVar18;
                  pfVar43[3] = fVar16 * fVar19;
                  lVar40 = lVar40 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          default:
            return 0;
          }
        }
LAB_00398eb8:
        local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
        local_100 = a;
        iVar29 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_mul>(a,b,this_00,opt);
        return iVar29;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,uVar3,sVar5,uVar47,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar53 = (undefined1 (*) [16])
                         ((long)local_100->w * uVar32 * local_100->elemsize + (long)local_100->data)
              ;
              pfVar36 = (float *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                                 (long)local_100[1].data);
              pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                auVar69 = *pauVar53;
                uVar49 = uVar61;
                while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                  fVar2 = pfVar36[1];
                  fVar14 = pfVar36[2];
                  fVar15 = pfVar36[3];
                  *pfVar43 = auVar69._0_4_ * *pfVar36;
                  pfVar43[1] = auVar69._4_4_ * fVar2;
                  pfVar43[2] = auVar69._8_4_ * fVar14;
                  pfVar43[3] = auVar69._12_4_ * fVar15;
                  pfVar36 = pfVar36 + 4;
                  pfVar43 = pfVar43 + 4;
                }
                pauVar53 = pauVar53 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            if (iVar34 < 1) {
              iVar34 = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar53 = (undefined1 (*) [16])
                         ((long)local_100->w * uVar32 * local_100->elemsize + (long)local_100->data)
              ;
              pfVar36 = (float *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                                 (long)local_100[1].data);
              pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              for (iVar29 = 0; iVar29 != iVar34; iVar29 = iVar29 + 1) {
                auVar69 = *pauVar53;
                for (uVar47 = 0; uVar49 = uVar61, uVar47 != uVar59; uVar47 = uVar47 + 1) {
                  while (uVar49 != 0) {
                    fVar2 = pfVar36[1];
                    fVar14 = pfVar36[2];
                    fVar15 = pfVar36[3];
                    *pfVar43 = auVar69._0_4_ * *pfVar36;
                    pfVar43[1] = auVar69._4_4_ * fVar2;
                    pfVar43[2] = auVar69._8_4_ * fVar14;
                    pfVar43[3] = auVar69._12_4_ * fVar15;
                    pfVar36 = pfVar36 + 4;
                    pfVar43 = pfVar43 + 4;
                    uVar49 = uVar49 - 1;
                  }
                }
                pauVar53 = pauVar53 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        local_d8 = CONCAT44(local_d8._4_4_,uVar47);
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,sVar48,iVar29,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = local_100[1].dims;
        if (iVar29 == 1) {
          Mat::create(this_00,uVar49,uVar51,sVar48,(int)local_e0,opt->blob_allocator);
          pfVar36 = (float *)this_00->data;
          if (pfVar36 == (float *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          a = local_100;
          if ((int)local_d8 != 1 || local_100[1].w != 1) {
            pfVar43 = (float *)local_100->data;
            pfVar39 = (float *)local_100[1].data;
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
              fVar2 = *pfVar39;
              fVar14 = pfVar39[1];
              fVar15 = pfVar39[2];
              fVar16 = pfVar39[3];
              uVar50 = uVar49;
              while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                fVar17 = pfVar43[1];
                fVar18 = pfVar43[2];
                fVar19 = pfVar43[3];
                *pfVar36 = fVar2 * *pfVar43;
                pfVar36[1] = fVar14 * fVar17;
                pfVar36[2] = fVar15 * fVar18;
                pfVar36[3] = fVar16 * fVar19;
                pfVar43 = pfVar43 + 4;
                pfVar36 = pfVar36 + 4;
              }
              pfVar39 = pfVar39 + 4;
            }
            return 0;
          }
LAB_003a361f:
          iVar29 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_fma_functor::binary_op_mul>
                             (a,local_f0,this_00,opt);
          return iVar29;
        }
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            local_100 = a;
            Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)uVar61 < 1) {
                uVar61 = 0;
              }
              if ((int)uVar59 < 1) {
                uVar59 = 0;
              }
              if (iVar34 < 1) {
                iVar34 = 0;
              }
              uVar58 = (ulong)local_e8 & 0xffffffff;
              if ((int)local_e8 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                pauVar53 = (undefined1 (*) [16])
                           (local_100->cstep * uVar32 * local_100->elemsize + (long)local_100->data)
                ;
                pfVar36 = (float *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                                   (long)local_100[1].data);
                pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize +
                                   (long)this_00->data);
                for (iVar29 = 0; iVar29 != iVar34; iVar29 = iVar29 + 1) {
                  for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                    auVar69 = *pauVar53;
                    uVar49 = uVar61;
                    while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                      fVar2 = pfVar36[1];
                      fVar14 = pfVar36[2];
                      fVar15 = pfVar36[3];
                      *pfVar43 = auVar69._0_4_ * *pfVar36;
                      pfVar43[1] = auVar69._4_4_ * fVar2;
                      pfVar43[2] = auVar69._8_4_ * fVar14;
                      pfVar43[3] = auVar69._12_4_ * fVar15;
                      pfVar36 = pfVar36 + 4;
                      pfVar43 = pfVar43 + 4;
                    }
                    pauVar53 = pauVar53 + 1;
                  }
                }
              }
              return 0;
            }
            return -100;
          }
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (local_100[1].dims != 1) {
            if (local_100[1].dims == 2) {
              if ((int)uVar49 < 1) {
                uVar49 = 0;
              }
              if ((int)uVar51 < 1) {
                uVar51 = 0;
              }
              uVar58 = (ulong)local_f8 & 0xffffffff;
              if ((int)local_f8 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                pfVar36 = (float *)(local_100->cstep * uVar32 * local_100->elemsize +
                                   (long)local_100->data);
                pauVar53 = (undefined1 (*) [16])
                           ((long)local_100[1].w * uVar32 * local_100[1].elemsize +
                           (long)local_100[1].data);
                pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize +
                                   (long)this_00->data);
                for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                  auVar69 = *pauVar53;
                  uVar50 = uVar49;
                  while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                    fVar2 = pfVar36[1];
                    fVar14 = pfVar36[2];
                    fVar15 = pfVar36[3];
                    *pfVar43 = auVar69._0_4_ * *pfVar36;
                    pfVar43[1] = auVar69._4_4_ * fVar2;
                    pfVar43[2] = auVar69._8_4_ * fVar14;
                    pfVar43[3] = auVar69._12_4_ * fVar15;
                    pfVar36 = pfVar36 + 4;
                    pfVar43 = pfVar43 + 4;
                  }
                  pauVar53 = pauVar53 + 1;
                }
              }
              return 0;
            }
            return 0;
          }
          a = local_100;
          if (uVar47 != 1 || local_100[1].w != 1) {
            if ((int)local_d0 < 1) {
              local_d0._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100->cstep;
              sVar5 = local_100->elemsize;
              pfVar36 = (float *)((long)local_100[1].data + uVar32 * 0x10);
              fVar2 = *pfVar36;
              fVar14 = pfVar36[1];
              fVar15 = pfVar36[2];
              fVar16 = pfVar36[3];
              pvVar9 = local_100->data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar41 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_d0;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                fVar17 = pfVar36[1];
                fVar18 = pfVar36[2];
                fVar19 = pfVar36[3];
                pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
                *pfVar43 = fVar2 * *pfVar36;
                pfVar43[1] = fVar14 * fVar17;
                pfVar43[2] = fVar15 * fVar18;
                pfVar43[3] = fVar16 * fVar19;
                lVar40 = lVar40 + 0x10;
              }
            }
            return 0;
          }
          goto LAB_003a361f;
        }
        local_d8 = CONCAT44(local_d8._4_4_,uVar47);
        uVar31 = uVar3 ^ uVar50;
        if (((uVar61 ^ 1) == 0 && (uVar59 ^ 1) == 0) && uVar31 == 0) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_d0 < 1) {
              local_d0._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = this_00->cstep;
              sVar5 = local_100->cstep;
              sVar7 = local_100->elemsize;
              pvVar9 = local_100->data;
              pfVar36 = (float *)((long)local_100[1].data +
                                 local_100[1].cstep * uVar32 * local_100[1].elemsize);
              fVar2 = *pfVar36;
              fVar14 = pfVar36[1];
              fVar15 = pfVar36[2];
              fVar16 = pfVar36[3];
              sVar8 = this_00->elemsize;
              pvVar41 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_d0;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar5 * sVar7 * uVar32);
                fVar17 = pfVar36[1];
                fVar18 = pfVar36[2];
                fVar19 = pfVar36[3];
                pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar48 * sVar8 * uVar32);
                *pfVar43 = fVar2 * *pfVar36;
                pfVar43[1] = fVar14 * fVar17;
                pfVar43[2] = fVar15 * fVar18;
                pfVar43[3] = fVar16 * fVar19;
                lVar40 = lVar40 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((uVar61 == uVar49) && (uVar47 == 1 && (uVar3 == 1 && uVar59 == uVar51))) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_d0 < 1) {
              local_d0._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100->cstep;
              sVar5 = local_100->elemsize;
              pvVar9 = local_100[1].data;
              pvVar41 = local_100->data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_d0;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                fVar2 = *(float *)((long)pvVar9 + lVar40);
                pfVar36 = (float *)((long)pvVar41 + lVar40 * 4 + sVar48 * sVar5 * uVar32);
                auVar66._0_4_ = fVar2 * *pfVar36;
                auVar66._4_4_ = fVar2 * pfVar36[1];
                auVar66._8_4_ = fVar2 * pfVar36[2];
                auVar66._12_4_ = fVar2 * pfVar36[3];
                *(undefined1 (*) [16])((long)pvVar55 + lVar40 * 4 + sVar7 * sVar8 * uVar32) =
                     auVar66;
                lVar40 = lVar40 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        local_d0 = (void *)sVar48;
        if (((uVar49 ^ 1) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,uVar50,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = this_00->cstep;
              sVar5 = this_00->elemsize;
              sVar7 = local_100[1].cstep;
              pvVar9 = this_00->data;
              pfVar36 = (float *)((long)local_100->data +
                                 local_100->cstep * uVar32 * local_100->elemsize);
              fVar2 = *pfVar36;
              fVar14 = pfVar36[1];
              fVar15 = pfVar36[2];
              fVar16 = pfVar36[3];
              sVar8 = local_100[1].elemsize;
              pvVar41 = local_100[1].data;
              lVar40 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                pfVar36 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
                fVar17 = pfVar36[1];
                fVar18 = pfVar36[2];
                fVar19 = pfVar36[3];
                pfVar43 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                *pfVar43 = fVar2 * *pfVar36;
                pfVar43[1] = fVar14 * fVar17;
                pfVar43[2] = fVar15 * fVar18;
                pfVar43[3] = fVar16 * fVar19;
                lVar40 = lVar40 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar61 == uVar49) && (iVar29 == 1)) && (uVar59 == uVar51)) && (uVar50 == 1)) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar3,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100[1].cstep;
              sVar5 = local_100[1].elemsize;
              pvVar9 = local_100->data;
              pvVar41 = local_100[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                fVar2 = *(float *)((long)pvVar9 + lVar40);
                pfVar36 = (float *)((long)pvVar41 + lVar40 * 4 + sVar48 * sVar5 * uVar32);
                auVar71._0_4_ = fVar2 * *pfVar36;
                auVar71._4_4_ = fVar2 * pfVar36[1];
                auVar71._8_4_ = fVar2 * pfVar36[2];
                auVar71._12_4_ = fVar2 * pfVar36[3];
                *(undefined1 (*) [16])((long)pvVar55 + lVar40 * 4 + sVar7 * sVar8 * uVar32) =
                     auVar71;
                lVar40 = lVar40 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar61 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar49 != 1) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            uVar58 = (ulong)uVar51;
            if ((int)uVar51 < 1) {
              uVar58 = 0;
            }
            uVar32 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar32 = 0;
            }
            for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
              pfVar36 = (float *)(local_100->cstep * uVar33 * local_100->elemsize +
                                 (long)local_100->data);
              sVar48 = local_100[1].cstep;
              sVar5 = local_100[1].elemsize;
              pvVar9 = local_100[1].data;
              pfVar43 = (float *)(this_00->cstep * uVar33 * this_00->elemsize + (long)this_00->data)
              ;
              for (uVar46 = 0; uVar46 != uVar58; uVar46 = uVar46 + 1) {
                auVar69 = *(undefined1 (*) [16])
                           ((long)pvVar9 + uVar46 * 0x10 + sVar48 * uVar33 * sVar5);
                uVar47 = uVar49;
                while (bVar64 = uVar47 != 0, uVar47 = uVar47 - 1, bVar64) {
                  fVar2 = pfVar36[1];
                  fVar14 = pfVar36[2];
                  fVar15 = pfVar36[3];
                  *pfVar43 = auVar69._0_4_ * *pfVar36;
                  pfVar43[1] = auVar69._4_4_ * fVar2;
                  pfVar43[2] = auVar69._8_4_ * fVar14;
                  pfVar43[3] = auVar69._12_4_ * fVar15;
                  pfVar36 = pfVar36 + 4;
                  pfVar43 = pfVar43 + 4;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar59 ^ 1) == 0 && (uVar61 ^ uVar49) == 0) && uVar31 == 0) && uVar51 != 1) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pvVar41 = (void *)(local_100->cstep * uVar32 * local_100->elemsize +
                                (long)local_100->data);
              sVar48 = local_100[1].cstep;
              pvVar55 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              sVar5 = local_100[1].elemsize;
              pvVar9 = local_100[1].data;
              for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                for (lVar40 = 0; (ulong)uVar49 * 0x10 != lVar40; lVar40 = lVar40 + 0x10) {
                  pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                  pfVar43 = (float *)((long)pvVar41 + lVar40);
                  auVar74._0_4_ = *pfVar36 * *pfVar43;
                  auVar74._4_4_ = pfVar36[1] * pfVar43[1];
                  auVar74._8_4_ = pfVar36[2] * pfVar43[2];
                  auVar74._12_4_ = pfVar36[3] * pfVar43[3];
                  *(undefined1 (*) [16])((long)pvVar55 + lVar40) = auVar74;
                }
                pvVar41 = (void *)((long)pvVar41 + lVar40);
                pvVar55 = (void *)((long)pvVar55 + lVar40);
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar49 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar61 != 1) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar51,uVar50,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            uVar58 = (ulong)uVar51;
            if ((int)uVar51 < 1) {
              uVar58 = 0;
            }
            uVar32 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar32 = 0;
            }
            for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
              sVar48 = local_100->cstep;
              sVar5 = local_100->elemsize;
              pvVar9 = local_100->data;
              pfVar36 = (float *)(local_100[1].cstep * uVar33 * local_100[1].elemsize +
                                 (long)local_100[1].data);
              pfVar43 = (float *)(this_00->cstep * uVar33 * this_00->elemsize + (long)this_00->data)
              ;
              for (uVar46 = 0; uVar46 != uVar58; uVar46 = uVar46 + 1) {
                auVar69 = *(undefined1 (*) [16])
                           ((long)pvVar9 + uVar46 * 0x10 + sVar48 * uVar33 * sVar5);
                uVar47 = uVar61;
                while (bVar64 = uVar47 != 0, uVar47 = uVar47 - 1, bVar64) {
                  fVar2 = pfVar36[1];
                  fVar14 = pfVar36[2];
                  fVar15 = pfVar36[3];
                  *pfVar43 = auVar69._0_4_ * *pfVar36;
                  pfVar43[1] = auVar69._4_4_ * fVar2;
                  pfVar43[2] = auVar69._8_4_ * fVar14;
                  pfVar43[3] = auVar69._12_4_ * fVar15;
                  pfVar36 = pfVar36 + 4;
                  pfVar43 = pfVar43 + 4;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar61 ^ uVar49) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) && uVar59 != 1) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar59,uVar50,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100->cstep;
              pvVar41 = (void *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                                (long)local_100[1].data);
              pvVar55 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              sVar5 = local_100->elemsize;
              pvVar9 = local_100->data;
              for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                for (lVar40 = 0; (ulong)uVar49 * 0x10 != lVar40; lVar40 = lVar40 + 0x10) {
                  pfVar36 = (float *)((long)pvVar41 + lVar40);
                  pfVar43 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                  auVar76._0_4_ = *pfVar36 * *pfVar43;
                  auVar76._4_4_ = pfVar36[1] * pfVar43[1];
                  auVar76._8_4_ = pfVar36[2] * pfVar43[2];
                  auVar76._12_4_ = pfVar36[3] * pfVar43[3];
                  *(undefined1 (*) [16])((long)pvVar55 + lVar40) = auVar76;
                }
                pvVar41 = (void *)((long)pvVar41 + lVar40);
                pvVar55 = (void *)((long)pvVar55 + lVar40);
              }
            }
            return 0;
          }
          return -100;
        }
        goto LAB_003a5ebd;
      case 4:
        if (a[1].dims != 4) {
          local_d8 = CONCAT44(local_d8._4_4_,uVar47);
          local_b0 = opt;
          Mat::create(this_00,uVar49,uVar51,iVar35,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          iVar29 = a[1].dims;
          iVar34 = (int)local_f8;
          if (iVar29 != 1) {
            if (iVar29 == 3) {
              if ((int)uVar49 < 1) {
                uVar49 = 0;
              }
              if ((int)uVar51 < 1) {
                uVar51 = 0;
              }
              if (iVar35 < 1) {
                iVar35 = 0;
              }
              uVar58 = (ulong)local_f8 & 0xffffffff;
              if (iVar34 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                pfVar36 = (float *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
                pauVar53 = (undefined1 (*) [16])
                           (a[1].cstep * uVar32 * a[1].elemsize + (long)a[1].data);
                pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize +
                                   (long)this_00->data);
                for (iVar29 = 0; iVar29 != iVar35; iVar29 = iVar29 + 1) {
                  for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                    auVar69 = *pauVar53;
                    uVar50 = uVar49;
                    while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                      fVar2 = pfVar36[1];
                      fVar14 = pfVar36[2];
                      fVar15 = pfVar36[3];
                      *pfVar43 = auVar69._0_4_ * *pfVar36;
                      pfVar43[1] = auVar69._4_4_ * fVar2;
                      pfVar43[2] = auVar69._8_4_ * fVar14;
                      pfVar43[3] = auVar69._12_4_ * fVar15;
                      pfVar36 = pfVar36 + 4;
                      pfVar43 = pfVar43 + 4;
                    }
                    pauVar53 = pauVar53 + 1;
                  }
                }
              }
              return 0;
            }
            if (iVar29 == 2) {
              if ((int)uVar49 < 1) {
                uVar49 = 0;
              }
              if ((int)uVar51 < 1) {
                uVar51 = 0;
              }
              if (iVar35 < 1) {
                iVar35 = 0;
              }
              uVar58 = (ulong)local_f8 & 0xffffffff;
              if (iVar34 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                pfVar36 = (float *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
                pauVar53 = (undefined1 (*) [16])
                           ((long)a[1].w * uVar32 * a[1].elemsize + (long)a[1].data);
                pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize +
                                   (long)this_00->data);
                for (iVar29 = 0; iVar29 != iVar35; iVar29 = iVar29 + 1) {
                  auVar69 = *pauVar53;
                  for (uVar47 = 0; uVar50 = uVar49, uVar47 != uVar51; uVar47 = uVar47 + 1) {
                    while (uVar50 != 0) {
                      fVar2 = pfVar36[1];
                      fVar14 = pfVar36[2];
                      fVar15 = pfVar36[3];
                      *pfVar43 = auVar69._0_4_ * *pfVar36;
                      pfVar43[1] = auVar69._4_4_ * fVar2;
                      pfVar43[2] = auVar69._8_4_ * fVar14;
                      pfVar43[3] = auVar69._12_4_ * fVar15;
                      pfVar36 = pfVar36 + 4;
                      pfVar43 = pfVar43 + 4;
                      uVar50 = uVar50 - 1;
                    }
                  }
                  pauVar53 = pauVar53 + 1;
                }
              }
              return 0;
            }
            return 0;
          }
          opt = local_b0;
          if ((int)local_d8 != 1 || a[1].w != 1) {
            if ((int)local_d0 < 1) {
              local_d0._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if (iVar34 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = a->cstep;
              sVar5 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pvVar9 = this_00->data;
              pfVar36 = (float *)((long)a[1].data + uVar32 * 0x10);
              fVar2 = *pfVar36;
              fVar14 = pfVar36[1];
              fVar15 = pfVar36[2];
              fVar16 = pfVar36[3];
              sVar8 = a->elemsize;
              pvVar41 = a->data;
              lVar40 = 0;
              iVar29 = (int)local_d0;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                pfVar36 = (float *)((long)pvVar41 + lVar40 + sVar48 * sVar8 * uVar32);
                fVar17 = pfVar36[1];
                fVar18 = pfVar36[2];
                fVar19 = pfVar36[3];
                pfVar43 = (float *)((long)pvVar9 + lVar40 + sVar5 * sVar7 * uVar32);
                *pfVar43 = fVar2 * *pfVar36;
                pfVar43[1] = fVar14 * fVar17;
                pfVar43[2] = fVar15 * fVar18;
                pfVar43[3] = fVar16 * fVar19;
                lVar40 = lVar40 + 0x10;
              }
            }
            return 0;
          }
          goto LAB_003a361f;
        }
        goto LAB_0039a53c;
      }
      goto LAB_0039dd60;
    case 3:
      pMVar42 = b;
      goto LAB_0039908a;
    case 4:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
      uVar49 = a->w;
      uVar51 = a->h;
      iVar35 = a->d;
      uVar50 = a->c;
      local_f8 = (__m256 *)(ulong)uVar50;
      local_d0 = (void *)CONCAT44(local_d0._4_4_,uVar51 * uVar49 * iVar35);
      sVar48 = a->elemsize;
      uVar61 = a[1].w;
      uVar59 = a[1].h;
      iVar34 = a[1].d;
      uVar3 = a[1].c;
      local_e8 = (__m256 *)(ulong)uVar3;
      local_c8 = (__m256 *)CONCAT44(local_c8._4_4_,uVar59 * uVar61 * iVar34);
      sVar5 = a[1].elemsize;
      switch(a->dims) {
      case 1:
        if (iVar29 != 1 || uVar49 != 1) {
          switch(a[1].dims) {
          case 1:
            goto switchD_00398908_caseD_1;
          case 2:
            local_100 = a;
            Mat::create(this_00,uVar61,uVar59,sVar5,uVar47,opt->blob_allocator);
            pauVar53 = (undefined1 (*) [16])this_00->data;
            if (pauVar53 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              pauVar63 = (undefined1 (*) [16])local_100->data;
              pauVar45 = (undefined1 (*) [16])local_100[1].data;
              if ((int)uVar61 < 1) {
                uVar61 = 0;
              }
              if ((int)uVar59 < 1) {
                uVar59 = 0;
              }
              for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                auVar69 = *pauVar63;
                uVar49 = uVar61;
                while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                  auVar68 = vmaxps_avx(auVar69,*pauVar45);
                  *pauVar53 = auVar68;
                  pauVar45 = pauVar45 + 1;
                  pauVar53 = pauVar53 + 1;
                }
                pauVar63 = pauVar63 + 1;
              }
              return 0;
            }
            return -100;
          case 3:
            local_100 = a;
            Mat::create(this_00,uVar61,uVar59,uVar3,sVar5,uVar47,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)local_c8 < 1) {
                local_c8._0_4_ = 0;
              }
              uVar58 = (ulong)local_e8 & 0xffffffff;
              if ((int)local_e8 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                sVar48 = local_100[1].cstep;
                sVar5 = local_100[1].elemsize;
                auVar69 = *(undefined1 (*) [16])((long)local_100->data + uVar32 * 0x10);
                pvVar9 = local_100[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar41 = this_00->data;
                lVar40 = 0;
                iVar29 = (int)local_c8;
                while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                  auVar68 = vmaxps_avx(auVar69,*(undefined1 (*) [16])
                                                ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
                  *(undefined1 (*) [16])((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32) = auVar68;
                  lVar40 = lVar40 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          case 4:
            local_100 = a;
            Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)local_c8 < 1) {
                local_c8._0_4_ = 0;
              }
              uVar58 = (ulong)local_e8 & 0xffffffff;
              if ((int)local_e8 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                sVar48 = local_100[1].cstep;
                sVar5 = local_100[1].elemsize;
                auVar69 = *(undefined1 (*) [16])((long)local_100->data + uVar32 * 0x10);
                pvVar9 = local_100[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar41 = this_00->data;
                lVar40 = 0;
                iVar29 = (int)local_c8;
                while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                  auVar68 = vmaxps_avx(auVar69,*(undefined1 (*) [16])
                                                ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
                  *(undefined1 (*) [16])((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32) = auVar68;
                  lVar40 = lVar40 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          default:
            return 0;
          }
        }
LAB_00398dfd:
        local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
        local_100 = a;
        iVar29 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_max>(a,b,this_00,opt);
        return iVar29;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,uVar3,sVar5,uVar47,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar53 = (undefined1 (*) [16])
                         ((long)local_100->w * uVar32 * local_100->elemsize + (long)local_100->data)
              ;
              pauVar63 = (undefined1 (*) [16])
                         (local_100[1].cstep * uVar32 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pauVar45 = (undefined1 (*) [16])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                auVar69 = *pauVar53;
                uVar49 = uVar61;
                while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                  auVar68 = vmaxps_avx(auVar69,*pauVar63);
                  *pauVar45 = auVar68;
                  pauVar63 = pauVar63 + 1;
                  pauVar45 = pauVar45 + 1;
                }
                pauVar53 = pauVar53 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            if (iVar34 < 1) {
              iVar34 = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar53 = (undefined1 (*) [16])
                         ((long)local_100->w * uVar32 * local_100->elemsize + (long)local_100->data)
              ;
              pauVar63 = (undefined1 (*) [16])
                         (local_100[1].cstep * uVar32 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pauVar45 = (undefined1 (*) [16])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              for (iVar29 = 0; iVar29 != iVar34; iVar29 = iVar29 + 1) {
                auVar69 = *pauVar53;
                for (uVar47 = 0; uVar49 = uVar61, uVar47 != uVar59; uVar47 = uVar47 + 1) {
                  while (uVar49 != 0) {
                    auVar68 = vmaxps_avx(auVar69,*pauVar63);
                    *pauVar45 = auVar68;
                    pauVar63 = pauVar63 + 1;
                    pauVar45 = pauVar45 + 1;
                    uVar49 = uVar49 - 1;
                  }
                }
                pauVar53 = pauVar53 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        local_d8 = CONCAT44(local_d8._4_4_,uVar47);
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,sVar48,iVar29,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = local_100[1].dims;
        if (iVar29 == 1) {
          Mat::create(this_00,uVar49,uVar51,sVar48,(int)local_e0,opt->blob_allocator);
          pauVar53 = (undefined1 (*) [16])this_00->data;
          if (pauVar53 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          a = local_100;
          if ((int)local_d8 != 1 || local_100[1].w != 1) {
            pauVar63 = (undefined1 (*) [16])local_100->data;
            pauVar45 = (undefined1 (*) [16])local_100[1].data;
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
              auVar69 = *pauVar45;
              uVar50 = uVar49;
              while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                auVar68 = vmaxps_avx(auVar69,*pauVar63);
                *pauVar53 = auVar68;
                pauVar63 = pauVar63 + 1;
                pauVar53 = pauVar53 + 1;
              }
              pauVar45 = pauVar45 + 1;
            }
            return 0;
          }
LAB_003a346d:
          iVar29 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_fma_functor::binary_op_max>
                             (a,local_f0,this_00,opt);
          return iVar29;
        }
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            local_100 = a;
            Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)uVar61 < 1) {
                uVar61 = 0;
              }
              if ((int)uVar59 < 1) {
                uVar59 = 0;
              }
              if (iVar34 < 1) {
                iVar34 = 0;
              }
              uVar58 = (ulong)local_e8 & 0xffffffff;
              if ((int)local_e8 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                pauVar53 = (undefined1 (*) [16])
                           (local_100->cstep * uVar32 * local_100->elemsize + (long)local_100->data)
                ;
                pauVar63 = (undefined1 (*) [16])
                           (local_100[1].cstep * uVar32 * local_100[1].elemsize +
                           (long)local_100[1].data);
                pauVar45 = (undefined1 (*) [16])
                           (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
                for (iVar29 = 0; iVar29 != iVar34; iVar29 = iVar29 + 1) {
                  for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                    auVar69 = *pauVar53;
                    uVar49 = uVar61;
                    while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                      auVar68 = vmaxps_avx(auVar69,*pauVar63);
                      *pauVar45 = auVar68;
                      pauVar63 = pauVar63 + 1;
                      pauVar45 = pauVar45 + 1;
                    }
                    pauVar53 = pauVar53 + 1;
                  }
                }
              }
              return 0;
            }
            return -100;
          }
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (local_100[1].dims != 1) {
            if (local_100[1].dims == 2) {
              if ((int)uVar49 < 1) {
                uVar49 = 0;
              }
              if ((int)uVar51 < 1) {
                uVar51 = 0;
              }
              uVar58 = (ulong)local_f8 & 0xffffffff;
              if ((int)local_f8 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                pauVar53 = (undefined1 (*) [16])
                           (local_100->cstep * uVar32 * local_100->elemsize + (long)local_100->data)
                ;
                pauVar63 = (undefined1 (*) [16])
                           ((long)local_100[1].w * uVar32 * local_100[1].elemsize +
                           (long)local_100[1].data);
                pauVar45 = (undefined1 (*) [16])
                           (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
                for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                  auVar69 = *pauVar63;
                  uVar50 = uVar49;
                  while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                    auVar68 = vmaxps_avx(auVar69,*pauVar53);
                    *pauVar45 = auVar68;
                    pauVar53 = pauVar53 + 1;
                    pauVar45 = pauVar45 + 1;
                  }
                  pauVar63 = pauVar63 + 1;
                }
              }
              return 0;
            }
            return 0;
          }
          a = local_100;
          if (uVar47 != 1 || local_100[1].w != 1) {
            if ((int)local_d0 < 1) {
              local_d0._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100->cstep;
              sVar5 = local_100->elemsize;
              auVar69 = *(undefined1 (*) [16])((long)local_100[1].data + uVar32 * 0x10);
              pvVar9 = local_100->data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar41 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_d0;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                auVar68 = vmaxps_avx(auVar69,*(undefined1 (*) [16])
                                              ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
                *(undefined1 (*) [16])((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32) = auVar68;
                lVar40 = lVar40 + 0x10;
              }
            }
            return 0;
          }
          goto LAB_003a346d;
        }
        local_d8 = CONCAT44(local_d8._4_4_,uVar47);
        uVar31 = uVar3 ^ uVar50;
        if (((uVar61 ^ 1) == 0 && (uVar59 ^ 1) == 0) && uVar31 == 0) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_d0 < 1) {
              local_d0._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = this_00->cstep;
              sVar5 = local_100->cstep;
              sVar7 = local_100->elemsize;
              pvVar9 = local_100->data;
              auVar69 = *(undefined1 (*) [16])
                         ((long)local_100[1].data +
                         local_100[1].cstep * uVar32 * local_100[1].elemsize);
              sVar8 = this_00->elemsize;
              pvVar41 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_d0;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                auVar68 = vmaxps_avx(auVar69,*(undefined1 (*) [16])
                                              ((long)pvVar9 + lVar40 + sVar5 * sVar7 * uVar32));
                *(undefined1 (*) [16])((long)pvVar41 + lVar40 + sVar48 * sVar8 * uVar32) = auVar68;
                lVar40 = lVar40 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((uVar61 == uVar49) && (uVar47 == 1 && (uVar3 == 1 && uVar59 == uVar51))) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_d0 < 1) {
              local_d0._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100->cstep;
              sVar5 = local_100->elemsize;
              pvVar9 = local_100[1].data;
              pvVar41 = local_100->data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_d0;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                uVar1 = *(undefined4 *)((long)pvVar9 + lVar40);
                auVar65._4_4_ = uVar1;
                auVar65._0_4_ = uVar1;
                auVar65._8_4_ = uVar1;
                auVar65._12_4_ = uVar1;
                auVar69 = vmaxps_avx(auVar65,*(undefined1 (*) [16])
                                              ((long)pvVar41 + lVar40 * 4 + sVar48 * sVar5 * uVar32)
                                    );
                *(undefined1 (*) [16])((long)pvVar55 + lVar40 * 4 + sVar7 * sVar8 * uVar32) =
                     auVar69;
                lVar40 = lVar40 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        local_d0 = (void *)sVar48;
        if (((uVar49 ^ 1) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,uVar50,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = this_00->cstep;
              sVar5 = this_00->elemsize;
              sVar7 = local_100[1].cstep;
              pvVar9 = this_00->data;
              auVar69 = *(undefined1 (*) [16])
                         ((long)local_100->data + local_100->cstep * uVar32 * local_100->elemsize);
              sVar8 = local_100[1].elemsize;
              pvVar41 = local_100[1].data;
              lVar40 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                auVar68 = vmaxps_avx(auVar69,*(undefined1 (*) [16])
                                              ((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32));
                *(undefined1 (*) [16])((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32) = auVar68;
                lVar40 = lVar40 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if (((uVar61 == uVar49) && (iVar29 == 1)) && ((uVar59 == uVar51 && (uVar50 == 1)))) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar3,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100[1].cstep;
              sVar5 = local_100[1].elemsize;
              pvVar9 = local_100->data;
              pvVar41 = local_100[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                uVar1 = *(undefined4 *)((long)pvVar9 + lVar40);
                auVar70._4_4_ = uVar1;
                auVar70._0_4_ = uVar1;
                auVar70._8_4_ = uVar1;
                auVar70._12_4_ = uVar1;
                auVar69 = vmaxps_avx(auVar70,*(undefined1 (*) [16])
                                              ((long)pvVar41 + lVar40 * 4 + sVar48 * sVar5 * uVar32)
                                    );
                *(undefined1 (*) [16])((long)pvVar55 + lVar40 * 4 + sVar7 * sVar8 * uVar32) =
                     auVar69;
                lVar40 = lVar40 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar61 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar49 != 1) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            uVar58 = (ulong)uVar51;
            if ((int)uVar51 < 1) {
              uVar58 = 0;
            }
            uVar32 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar32 = 0;
            }
            for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
              pauVar53 = (undefined1 (*) [16])
                         (local_100->cstep * uVar33 * local_100->elemsize + (long)local_100->data);
              sVar48 = local_100[1].cstep;
              sVar5 = local_100[1].elemsize;
              pvVar9 = local_100[1].data;
              pauVar63 = (undefined1 (*) [16])
                         (this_00->cstep * uVar33 * this_00->elemsize + (long)this_00->data);
              for (uVar46 = 0; uVar46 != uVar58; uVar46 = uVar46 + 1) {
                auVar69 = *(undefined1 (*) [16])
                           ((long)pvVar9 + uVar46 * 0x10 + sVar48 * uVar33 * sVar5);
                uVar47 = uVar49;
                while (bVar64 = uVar47 != 0, uVar47 = uVar47 - 1, bVar64) {
                  auVar68 = vmaxps_avx(auVar69,*pauVar53);
                  *pauVar63 = auVar68;
                  pauVar53 = pauVar53 + 1;
                  pauVar63 = pauVar63 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar59 ^ 1) == 0 && (uVar61 ^ uVar49) == 0) && uVar31 == 0) && uVar51 != 1) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pvVar41 = (void *)(local_100->cstep * uVar32 * local_100->elemsize +
                                (long)local_100->data);
              sVar48 = local_100[1].cstep;
              pvVar55 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              sVar5 = local_100[1].elemsize;
              pvVar9 = local_100[1].data;
              for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                for (lVar40 = 0; (ulong)uVar49 * 0x10 != lVar40; lVar40 = lVar40 + 0x10) {
                  auVar69 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar41 + lVar40),
                                       *(undefined1 (*) [16])
                                        ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
                  *(undefined1 (*) [16])((long)pvVar55 + lVar40) = auVar69;
                }
                pvVar41 = (void *)((long)pvVar41 + lVar40);
                pvVar55 = (void *)((long)pvVar55 + lVar40);
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar49 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar61 != 1) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar51,uVar50,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            uVar58 = (ulong)uVar51;
            if ((int)uVar51 < 1) {
              uVar58 = 0;
            }
            uVar32 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar32 = 0;
            }
            for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
              sVar48 = local_100->cstep;
              sVar5 = local_100->elemsize;
              pvVar9 = local_100->data;
              pauVar53 = (undefined1 (*) [16])
                         (local_100[1].cstep * uVar33 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pauVar63 = (undefined1 (*) [16])
                         (this_00->cstep * uVar33 * this_00->elemsize + (long)this_00->data);
              for (uVar46 = 0; uVar46 != uVar58; uVar46 = uVar46 + 1) {
                auVar69 = *(undefined1 (*) [16])
                           ((long)pvVar9 + uVar46 * 0x10 + sVar48 * uVar33 * sVar5);
                uVar47 = uVar61;
                while (bVar64 = uVar47 != 0, uVar47 = uVar47 - 1, bVar64) {
                  auVar68 = vmaxps_avx(auVar69,*pauVar53);
                  *pauVar63 = auVar68;
                  pauVar53 = pauVar53 + 1;
                  pauVar63 = pauVar63 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar61 ^ uVar49) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) && uVar59 != 1) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar59,uVar50,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100->cstep;
              pvVar41 = (void *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                                (long)local_100[1].data);
              pvVar55 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              sVar5 = local_100->elemsize;
              pvVar9 = local_100->data;
              for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                for (lVar40 = 0; (ulong)uVar49 * 0x10 != lVar40; lVar40 = lVar40 + 0x10) {
                  auVar69 = vmaxps_avx(*(undefined1 (*) [16])
                                        ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32),
                                       *(undefined1 (*) [16])((long)pvVar41 + lVar40));
                  *(undefined1 (*) [16])((long)pvVar55 + lVar40) = auVar69;
                }
                pvVar41 = (void *)((long)pvVar41 + lVar40);
                pvVar55 = (void *)((long)pvVar55 + lVar40);
              }
            }
            return 0;
          }
          return -100;
        }
        goto LAB_003a5d95;
      case 4:
        if (a[1].dims != 4) {
          local_d8 = CONCAT44(local_d8._4_4_,uVar47);
          local_b0 = opt;
          Mat::create(this_00,uVar49,uVar51,iVar35,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          iVar29 = a[1].dims;
          iVar34 = (int)local_f8;
          if (iVar29 != 1) {
            if (iVar29 == 3) {
              if ((int)uVar49 < 1) {
                uVar49 = 0;
              }
              if ((int)uVar51 < 1) {
                uVar51 = 0;
              }
              if (iVar35 < 1) {
                iVar35 = 0;
              }
              uVar58 = (ulong)local_f8 & 0xffffffff;
              if (iVar34 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                pauVar53 = (undefined1 (*) [16])(a->cstep * uVar32 * a->elemsize + (long)a->data);
                pauVar63 = (undefined1 (*) [16])
                           (a[1].cstep * uVar32 * a[1].elemsize + (long)a[1].data);
                pauVar45 = (undefined1 (*) [16])
                           (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
                for (iVar29 = 0; iVar29 != iVar35; iVar29 = iVar29 + 1) {
                  for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                    auVar69 = *pauVar63;
                    uVar50 = uVar49;
                    while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                      auVar68 = vmaxps_avx(auVar69,*pauVar53);
                      *pauVar45 = auVar68;
                      pauVar53 = pauVar53 + 1;
                      pauVar45 = pauVar45 + 1;
                    }
                    pauVar63 = pauVar63 + 1;
                  }
                }
              }
              return 0;
            }
            if (iVar29 == 2) {
              if ((int)uVar49 < 1) {
                uVar49 = 0;
              }
              if ((int)uVar51 < 1) {
                uVar51 = 0;
              }
              if (iVar35 < 1) {
                iVar35 = 0;
              }
              uVar58 = (ulong)local_f8 & 0xffffffff;
              if (iVar34 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                pauVar53 = (undefined1 (*) [16])(a->cstep * uVar32 * a->elemsize + (long)a->data);
                pauVar63 = (undefined1 (*) [16])
                           ((long)a[1].w * uVar32 * a[1].elemsize + (long)a[1].data);
                pauVar45 = (undefined1 (*) [16])
                           (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
                for (iVar29 = 0; iVar29 != iVar35; iVar29 = iVar29 + 1) {
                  auVar69 = *pauVar63;
                  for (uVar47 = 0; uVar50 = uVar49, uVar47 != uVar51; uVar47 = uVar47 + 1) {
                    while (uVar50 != 0) {
                      auVar68 = vmaxps_avx(auVar69,*pauVar53);
                      *pauVar45 = auVar68;
                      pauVar53 = pauVar53 + 1;
                      pauVar45 = pauVar45 + 1;
                      uVar50 = uVar50 - 1;
                    }
                  }
                  pauVar63 = pauVar63 + 1;
                }
              }
              return 0;
            }
            return 0;
          }
          opt = local_b0;
          if ((int)local_d8 != 1 || a[1].w != 1) {
            if ((int)local_d0 < 1) {
              local_d0._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if (iVar34 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = a->cstep;
              sVar5 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pvVar9 = this_00->data;
              auVar69 = *(undefined1 (*) [16])((long)a[1].data + uVar32 * 0x10);
              sVar8 = a->elemsize;
              pvVar41 = a->data;
              lVar40 = 0;
              iVar29 = (int)local_d0;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                auVar68 = vmaxps_avx(auVar69,*(undefined1 (*) [16])
                                              ((long)pvVar41 + lVar40 + sVar48 * sVar8 * uVar32));
                *(undefined1 (*) [16])((long)pvVar9 + lVar40 + sVar5 * sVar7 * uVar32) = auVar68;
                lVar40 = lVar40 + 0x10;
              }
            }
            return 0;
          }
          goto LAB_003a346d;
        }
        goto LAB_0039a2eb;
      }
      goto LAB_0039d88c;
    case 5:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
      uVar49 = a->w;
      uVar51 = a->h;
      iVar35 = a->d;
      uVar50 = a->c;
      local_f8 = (__m256 *)(ulong)uVar50;
      local_d0 = (void *)CONCAT44(local_d0._4_4_,uVar51 * uVar49 * iVar35);
      sVar48 = a->elemsize;
      uVar61 = a[1].w;
      uVar59 = a[1].h;
      iVar34 = a[1].d;
      uVar3 = a[1].c;
      local_e8 = (__m256 *)(ulong)uVar3;
      local_c8 = (__m256 *)CONCAT44(local_c8._4_4_,uVar59 * uVar61 * iVar34);
      sVar5 = a[1].elemsize;
      switch(a->dims) {
      case 1:
        if (iVar29 != 1 || uVar49 != 1) {
          switch(a[1].dims) {
          case 1:
            goto switchD_00398bf5_caseD_1;
          case 2:
            local_100 = a;
            Mat::create(this_00,uVar61,uVar59,sVar5,uVar47,opt->blob_allocator);
            pauVar53 = (undefined1 (*) [16])this_00->data;
            if (pauVar53 == (undefined1 (*) [16])0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              pauVar63 = (undefined1 (*) [16])local_100->data;
              pauVar45 = (undefined1 (*) [16])local_100[1].data;
              if ((int)uVar61 < 1) {
                uVar61 = 0;
              }
              if ((int)uVar59 < 1) {
                uVar59 = 0;
              }
              for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                auVar69 = *pauVar63;
                uVar49 = uVar61;
                while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                  auVar68 = vminps_avx(auVar69,*pauVar45);
                  *pauVar53 = auVar68;
                  pauVar45 = pauVar45 + 1;
                  pauVar53 = pauVar53 + 1;
                }
                pauVar63 = pauVar63 + 1;
              }
              return 0;
            }
            return -100;
          case 3:
            local_100 = a;
            Mat::create(this_00,uVar61,uVar59,uVar3,sVar5,uVar47,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)local_c8 < 1) {
                local_c8._0_4_ = 0;
              }
              uVar58 = (ulong)local_e8 & 0xffffffff;
              if ((int)local_e8 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                sVar48 = local_100[1].cstep;
                sVar5 = local_100[1].elemsize;
                auVar69 = *(undefined1 (*) [16])((long)local_100->data + uVar32 * 0x10);
                pvVar9 = local_100[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar41 = this_00->data;
                lVar40 = 0;
                iVar29 = (int)local_c8;
                while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                  auVar68 = vminps_avx(auVar69,*(undefined1 (*) [16])
                                                ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
                  *(undefined1 (*) [16])((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32) = auVar68;
                  lVar40 = lVar40 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          case 4:
            local_100 = a;
            Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)local_c8 < 1) {
                local_c8._0_4_ = 0;
              }
              uVar58 = (ulong)local_e8 & 0xffffffff;
              if ((int)local_e8 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                sVar48 = local_100[1].cstep;
                sVar5 = local_100[1].elemsize;
                auVar69 = *(undefined1 (*) [16])((long)local_100->data + uVar32 * 0x10);
                pvVar9 = local_100[1].data;
                sVar7 = this_00->cstep;
                sVar8 = this_00->elemsize;
                pvVar41 = this_00->data;
                lVar40 = 0;
                iVar29 = (int)local_c8;
                while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                  auVar68 = vminps_avx(auVar69,*(undefined1 (*) [16])
                                                ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
                  *(undefined1 (*) [16])((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32) = auVar68;
                  lVar40 = lVar40 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          default:
            return 0;
          }
        }
LAB_00398f9c:
        local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
        local_100 = a;
        iVar29 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_min>(a,b,this_00,opt);
        return iVar29;
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,uVar3,sVar5,uVar47,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar53 = (undefined1 (*) [16])
                         ((long)local_100->w * uVar32 * local_100->elemsize + (long)local_100->data)
              ;
              pauVar63 = (undefined1 (*) [16])
                         (local_100[1].cstep * uVar32 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pauVar45 = (undefined1 (*) [16])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                auVar69 = *pauVar53;
                uVar49 = uVar61;
                while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                  auVar68 = vminps_avx(auVar69,*pauVar63);
                  *pauVar45 = auVar68;
                  pauVar63 = pauVar63 + 1;
                  pauVar45 = pauVar45 + 1;
                }
                pauVar53 = pauVar53 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            if (iVar34 < 1) {
              iVar34 = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar53 = (undefined1 (*) [16])
                         ((long)local_100->w * uVar32 * local_100->elemsize + (long)local_100->data)
              ;
              pauVar63 = (undefined1 (*) [16])
                         (local_100[1].cstep * uVar32 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pauVar45 = (undefined1 (*) [16])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              for (iVar29 = 0; iVar29 != iVar34; iVar29 = iVar29 + 1) {
                auVar69 = *pauVar53;
                for (uVar47 = 0; uVar49 = uVar61, uVar47 != uVar59; uVar47 = uVar47 + 1) {
                  while (uVar49 != 0) {
                    auVar68 = vminps_avx(auVar69,*pauVar63);
                    *pauVar45 = auVar68;
                    pauVar63 = pauVar63 + 1;
                    pauVar45 = pauVar45 + 1;
                    uVar49 = uVar49 - 1;
                  }
                }
                pauVar53 = pauVar53 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        local_d8 = CONCAT44(local_d8._4_4_,uVar47);
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,sVar48,iVar29,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = local_100[1].dims;
        if (iVar29 == 1) {
          Mat::create(this_00,uVar49,uVar51,sVar48,(int)local_e0,opt->blob_allocator);
          pauVar53 = (undefined1 (*) [16])this_00->data;
          if (pauVar53 == (undefined1 (*) [16])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          a = local_100;
          if ((int)local_d8 != 1 || local_100[1].w != 1) {
            pauVar63 = (undefined1 (*) [16])local_100->data;
            pauVar45 = (undefined1 (*) [16])local_100[1].data;
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
              auVar69 = *pauVar45;
              uVar50 = uVar49;
              while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                auVar68 = vminps_avx(auVar69,*pauVar63);
                *pauVar53 = auVar68;
                pauVar63 = pauVar63 + 1;
                pauVar53 = pauVar53 + 1;
              }
              pauVar45 = pauVar45 + 1;
            }
            return 0;
          }
LAB_003a37d9:
          iVar29 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_fma_functor::binary_op_min>
                             (a,local_f0,this_00,opt);
          return iVar29;
        }
        break;
      case 3:
        if (a[1].dims != 3) {
          if (a[1].dims == 4) {
            local_100 = a;
            Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)uVar61 < 1) {
                uVar61 = 0;
              }
              if ((int)uVar59 < 1) {
                uVar59 = 0;
              }
              if (iVar34 < 1) {
                iVar34 = 0;
              }
              uVar58 = (ulong)local_e8 & 0xffffffff;
              if ((int)local_e8 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                pauVar53 = (undefined1 (*) [16])
                           (local_100->cstep * uVar32 * local_100->elemsize + (long)local_100->data)
                ;
                pauVar63 = (undefined1 (*) [16])
                           (local_100[1].cstep * uVar32 * local_100[1].elemsize +
                           (long)local_100[1].data);
                pauVar45 = (undefined1 (*) [16])
                           (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
                for (iVar29 = 0; iVar29 != iVar34; iVar29 = iVar29 + 1) {
                  for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                    auVar69 = *pauVar53;
                    uVar49 = uVar61;
                    while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                      auVar68 = vminps_avx(auVar69,*pauVar63);
                      *pauVar45 = auVar68;
                      pauVar63 = pauVar63 + 1;
                      pauVar45 = pauVar45 + 1;
                    }
                    pauVar53 = pauVar53 + 1;
                  }
                }
              }
              return 0;
            }
            return -100;
          }
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if (local_100[1].dims != 1) {
            if (local_100[1].dims == 2) {
              if ((int)uVar49 < 1) {
                uVar49 = 0;
              }
              if ((int)uVar51 < 1) {
                uVar51 = 0;
              }
              uVar58 = (ulong)local_f8 & 0xffffffff;
              if ((int)local_f8 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                pauVar53 = (undefined1 (*) [16])
                           (local_100->cstep * uVar32 * local_100->elemsize + (long)local_100->data)
                ;
                pauVar63 = (undefined1 (*) [16])
                           ((long)local_100[1].w * uVar32 * local_100[1].elemsize +
                           (long)local_100[1].data);
                pauVar45 = (undefined1 (*) [16])
                           (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
                for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                  auVar69 = *pauVar63;
                  uVar50 = uVar49;
                  while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                    auVar68 = vminps_avx(auVar69,*pauVar53);
                    *pauVar45 = auVar68;
                    pauVar53 = pauVar53 + 1;
                    pauVar45 = pauVar45 + 1;
                  }
                  pauVar63 = pauVar63 + 1;
                }
              }
              return 0;
            }
            return 0;
          }
          a = local_100;
          if (uVar47 != 1 || local_100[1].w != 1) {
            if ((int)local_d0 < 1) {
              local_d0._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100->cstep;
              sVar5 = local_100->elemsize;
              auVar69 = *(undefined1 (*) [16])((long)local_100[1].data + uVar32 * 0x10);
              pvVar9 = local_100->data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar41 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_d0;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                auVar68 = vminps_avx(auVar69,*(undefined1 (*) [16])
                                              ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
                *(undefined1 (*) [16])((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32) = auVar68;
                lVar40 = lVar40 + 0x10;
              }
            }
            return 0;
          }
          goto LAB_003a37d9;
        }
        local_d8 = CONCAT44(local_d8._4_4_,uVar47);
        uVar31 = uVar3 ^ uVar50;
        if (((uVar61 ^ 1) == 0 && (uVar59 ^ 1) == 0) && uVar31 == 0) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_d0 < 1) {
              local_d0._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = this_00->cstep;
              sVar5 = local_100->cstep;
              sVar7 = local_100->elemsize;
              pvVar9 = local_100->data;
              auVar69 = *(undefined1 (*) [16])
                         ((long)local_100[1].data +
                         local_100[1].cstep * uVar32 * local_100[1].elemsize);
              sVar8 = this_00->elemsize;
              pvVar41 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_d0;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                auVar68 = vminps_avx(auVar69,*(undefined1 (*) [16])
                                              ((long)pvVar9 + lVar40 + sVar5 * sVar7 * uVar32));
                *(undefined1 (*) [16])((long)pvVar41 + lVar40 + sVar48 * sVar8 * uVar32) = auVar68;
                lVar40 = lVar40 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((uVar61 == uVar49) && (uVar47 == 1 && (uVar3 == 1 && uVar59 == uVar51))) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_d0 < 1) {
              local_d0._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100->cstep;
              sVar5 = local_100->elemsize;
              pvVar9 = local_100[1].data;
              pvVar41 = local_100->data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_d0;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                uVar1 = *(undefined4 *)((long)pvVar9 + lVar40);
                auVar68._4_4_ = uVar1;
                auVar68._0_4_ = uVar1;
                auVar68._8_4_ = uVar1;
                auVar68._12_4_ = uVar1;
                auVar69 = vminps_avx(auVar68,*(undefined1 (*) [16])
                                              ((long)pvVar41 + lVar40 * 4 + sVar48 * sVar5 * uVar32)
                                    );
                *(undefined1 (*) [16])((long)pvVar55 + lVar40 * 4 + sVar7 * sVar8 * uVar32) =
                     auVar69;
                lVar40 = lVar40 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        local_d0 = (void *)sVar48;
        if (((uVar49 ^ 1) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,uVar50,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = this_00->cstep;
              sVar5 = this_00->elemsize;
              sVar7 = local_100[1].cstep;
              pvVar9 = this_00->data;
              auVar69 = *(undefined1 (*) [16])
                         ((long)local_100->data + local_100->cstep * uVar32 * local_100->elemsize);
              sVar8 = local_100[1].elemsize;
              pvVar41 = local_100[1].data;
              lVar40 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                auVar68 = vminps_avx(auVar69,*(undefined1 (*) [16])
                                              ((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32));
                *(undefined1 (*) [16])((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32) = auVar68;
                lVar40 = lVar40 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar61 == uVar49) && (iVar29 == 1)) && (uVar59 == uVar51)) && (uVar50 == 1)) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar3,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100[1].cstep;
              sVar5 = local_100[1].elemsize;
              pvVar9 = local_100->data;
              pvVar41 = local_100[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar55 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                uVar1 = *(undefined4 *)((long)pvVar9 + lVar40);
                auVar73._4_4_ = uVar1;
                auVar73._0_4_ = uVar1;
                auVar73._8_4_ = uVar1;
                auVar73._12_4_ = uVar1;
                auVar69 = vminps_avx(auVar73,*(undefined1 (*) [16])
                                              ((long)pvVar41 + lVar40 * 4 + sVar48 * sVar5 * uVar32)
                                    );
                *(undefined1 (*) [16])((long)pvVar55 + lVar40 * 4 + sVar7 * sVar8 * uVar32) =
                     auVar69;
                lVar40 = lVar40 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar61 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar49 != 1) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            uVar58 = (ulong)uVar51;
            if ((int)uVar51 < 1) {
              uVar58 = 0;
            }
            uVar32 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar32 = 0;
            }
            for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
              pauVar53 = (undefined1 (*) [16])
                         (local_100->cstep * uVar33 * local_100->elemsize + (long)local_100->data);
              sVar48 = local_100[1].cstep;
              sVar5 = local_100[1].elemsize;
              pvVar9 = local_100[1].data;
              pauVar63 = (undefined1 (*) [16])
                         (this_00->cstep * uVar33 * this_00->elemsize + (long)this_00->data);
              for (uVar46 = 0; uVar46 != uVar58; uVar46 = uVar46 + 1) {
                auVar69 = *(undefined1 (*) [16])
                           ((long)pvVar9 + uVar46 * 0x10 + sVar48 * uVar33 * sVar5);
                uVar47 = uVar49;
                while (bVar64 = uVar47 != 0, uVar47 = uVar47 - 1, bVar64) {
                  auVar68 = vminps_avx(auVar69,*pauVar53);
                  *pauVar63 = auVar68;
                  pauVar53 = pauVar53 + 1;
                  pauVar63 = pauVar63 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar59 ^ 1) == 0 && (uVar61 ^ uVar49) == 0) && uVar31 == 0) && uVar51 != 1) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pvVar41 = (void *)(local_100->cstep * uVar32 * local_100->elemsize +
                                (long)local_100->data);
              sVar48 = local_100[1].cstep;
              pvVar55 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              sVar5 = local_100[1].elemsize;
              pvVar9 = local_100[1].data;
              for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                for (lVar40 = 0; (ulong)uVar49 * 0x10 != lVar40; lVar40 = lVar40 + 0x10) {
                  auVar69 = vminps_avx(*(undefined1 (*) [16])((long)pvVar41 + lVar40),
                                       *(undefined1 (*) [16])
                                        ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
                  *(undefined1 (*) [16])((long)pvVar55 + lVar40) = auVar69;
                }
                pvVar41 = (void *)((long)pvVar41 + lVar40);
                pvVar55 = (void *)((long)pvVar55 + lVar40);
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar49 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar61 != 1) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar51,uVar50,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            uVar58 = (ulong)uVar51;
            if ((int)uVar51 < 1) {
              uVar58 = 0;
            }
            uVar32 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar32 = 0;
            }
            for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
              sVar48 = local_100->cstep;
              sVar5 = local_100->elemsize;
              pvVar9 = local_100->data;
              pauVar53 = (undefined1 (*) [16])
                         (local_100[1].cstep * uVar33 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pauVar63 = (undefined1 (*) [16])
                         (this_00->cstep * uVar33 * this_00->elemsize + (long)this_00->data);
              for (uVar46 = 0; uVar46 != uVar58; uVar46 = uVar46 + 1) {
                auVar69 = *(undefined1 (*) [16])
                           ((long)pvVar9 + uVar46 * 0x10 + sVar48 * uVar33 * sVar5);
                uVar47 = uVar61;
                while (bVar64 = uVar47 != 0, uVar47 = uVar47 - 1, bVar64) {
                  auVar68 = vminps_avx(auVar69,*pauVar53);
                  *pauVar63 = auVar68;
                  pauVar53 = pauVar53 + 1;
                  pauVar63 = pauVar63 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar61 ^ uVar49) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) && uVar59 != 1) {
          local_100 = a;
          Mat::create(this_00,uVar49,uVar59,uVar50,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100->cstep;
              pvVar41 = (void *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                                (long)local_100[1].data);
              pvVar55 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              sVar5 = local_100->elemsize;
              pvVar9 = local_100->data;
              for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                for (lVar40 = 0; (ulong)uVar49 * 0x10 != lVar40; lVar40 = lVar40 + 0x10) {
                  auVar69 = vminps_avx(*(undefined1 (*) [16])
                                        ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32),
                                       *(undefined1 (*) [16])((long)pvVar41 + lVar40));
                  *(undefined1 (*) [16])((long)pvVar55 + lVar40) = auVar69;
                }
                pvVar41 = (void *)((long)pvVar41 + lVar40);
                pvVar55 = (void *)((long)pvVar55 + lVar40);
              }
            }
            return 0;
          }
          return -100;
        }
        goto LAB_003a610d;
      case 4:
        if (a[1].dims != 4) {
          local_d8 = CONCAT44(local_d8._4_4_,uVar47);
          local_b0 = opt;
          Mat::create(this_00,uVar49,uVar51,iVar35,uVar50,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          iVar29 = a[1].dims;
          iVar34 = (int)local_f8;
          if (iVar29 != 1) {
            if (iVar29 == 3) {
              if ((int)uVar49 < 1) {
                uVar49 = 0;
              }
              if ((int)uVar51 < 1) {
                uVar51 = 0;
              }
              if (iVar35 < 1) {
                iVar35 = 0;
              }
              uVar58 = (ulong)local_f8 & 0xffffffff;
              if (iVar34 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                pauVar53 = (undefined1 (*) [16])(a->cstep * uVar32 * a->elemsize + (long)a->data);
                pauVar63 = (undefined1 (*) [16])
                           (a[1].cstep * uVar32 * a[1].elemsize + (long)a[1].data);
                pauVar45 = (undefined1 (*) [16])
                           (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
                for (iVar29 = 0; iVar29 != iVar35; iVar29 = iVar29 + 1) {
                  for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                    auVar69 = *pauVar63;
                    uVar50 = uVar49;
                    while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                      auVar68 = vminps_avx(auVar69,*pauVar53);
                      *pauVar45 = auVar68;
                      pauVar53 = pauVar53 + 1;
                      pauVar45 = pauVar45 + 1;
                    }
                    pauVar63 = pauVar63 + 1;
                  }
                }
              }
              return 0;
            }
            if (iVar29 == 2) {
              if ((int)uVar49 < 1) {
                uVar49 = 0;
              }
              if ((int)uVar51 < 1) {
                uVar51 = 0;
              }
              if (iVar35 < 1) {
                iVar35 = 0;
              }
              uVar58 = (ulong)local_f8 & 0xffffffff;
              if (iVar34 < 1) {
                uVar58 = 0;
              }
              for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
                pauVar53 = (undefined1 (*) [16])(a->cstep * uVar32 * a->elemsize + (long)a->data);
                pauVar63 = (undefined1 (*) [16])
                           ((long)a[1].w * uVar32 * a[1].elemsize + (long)a[1].data);
                pauVar45 = (undefined1 (*) [16])
                           (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
                for (iVar29 = 0; iVar29 != iVar35; iVar29 = iVar29 + 1) {
                  auVar69 = *pauVar63;
                  for (uVar47 = 0; uVar50 = uVar49, uVar47 != uVar51; uVar47 = uVar47 + 1) {
                    while (uVar50 != 0) {
                      auVar68 = vminps_avx(auVar69,*pauVar53);
                      *pauVar45 = auVar68;
                      pauVar53 = pauVar53 + 1;
                      pauVar45 = pauVar45 + 1;
                      uVar50 = uVar50 - 1;
                    }
                  }
                  pauVar63 = pauVar63 + 1;
                }
              }
              return 0;
            }
            return 0;
          }
          opt = local_b0;
          if ((int)local_d8 != 1 || a[1].w != 1) {
            if ((int)local_d0 < 1) {
              local_d0._0_4_ = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if (iVar34 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = a->cstep;
              sVar5 = this_00->cstep;
              sVar7 = this_00->elemsize;
              pvVar9 = this_00->data;
              auVar69 = *(undefined1 (*) [16])((long)a[1].data + uVar32 * 0x10);
              sVar8 = a->elemsize;
              pvVar41 = a->data;
              lVar40 = 0;
              iVar29 = (int)local_d0;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                auVar68 = vminps_avx(auVar69,*(undefined1 (*) [16])
                                              ((long)pvVar41 + lVar40 + sVar48 * sVar8 * uVar32));
                *(undefined1 (*) [16])((long)pvVar9 + lVar40 + sVar5 * sVar7 * uVar32) = auVar68;
                lVar40 = lVar40 + 0x10;
              }
            }
            return 0;
          }
          goto LAB_003a37d9;
        }
        goto LAB_0039ab78;
      }
      goto LAB_0039e0f2;
    case 6:
      if (3 < a->dims - 1U) {
        return 0;
      }
      local_d8 = CONCAT44(local_d8._4_4_,uVar47);
      uVar49 = a->w;
      uVar32 = (ulong)uVar49;
      uVar51 = a->h;
      local_f8 = (__m256 *)(ulong)uVar51;
      local_c8._0_4_ = a->d;
      uVar50 = a->c;
      uVar58 = (ulong)uVar50;
      iVar35 = uVar51 * uVar49 * (int)local_c8;
      local_60 = a->elemsize;
      uVar61 = a[1].w;
      uVar59 = a[1].h;
      local_e0._0_4_ = a[1].d;
      uVar3 = a[1].c;
      local_c0 = (ulong)uVar3;
      local_f0 = (Mat *)CONCAT44(local_f0._4_4_,uVar59);
      iVar34 = uVar59 * uVar61 * (int)local_e0;
      sVar48 = a[1].elemsize;
      local_b8 = uVar58;
      local_e8._0_4_ = uVar61;
      local_a8._0_4_ = iVar35;
      switch(a->dims) {
      case 1:
        if (iVar29 == 1 && uVar49 == 1) {
          local_c8._0_4_ = iVar34;
          iVar29 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>
                             (a,b,this_00,opt);
          return iVar29;
        }
        switch(a[1].dims) {
        case 1:
          goto switchD_0039ceb3_caseD_1;
        case 2:
          local_c8._0_4_ = iVar34;
          Mat::create(this_00,uVar61,uVar59,sVar48,uVar47,opt->blob_allocator);
          puVar60 = (undefined8 *)this_00->data;
          if (puVar60 == (undefined8 *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            local_f8 = (__m256 *)a->data;
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            local_e8 = (__m256 *)CONCAT44(local_e8._4_4_,uVar61);
            pauVar53 = (undefined1 (*) [16])a[1].data;
            iVar29 = (int)local_f0;
            if ((int)local_f0 < 1) {
              iVar29 = 0;
            }
            local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar29);
            iVar29 = 0;
            while (iVar29 != (int)local_f0) {
              local_d0 = (void *)CONCAT44(local_d0._4_4_,iVar29);
              local_80._0_16_ = *(undefined1 (*) [16])local_f8;
              iVar29 = (uint)local_e8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                uVar99 = *(undefined8 *)((long)*pauVar53 + 8);
                local_a0._0_16_ = *pauVar53;
                afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                     (&local_101,(__m128 *)local_80,(__m128 *)local_a0);
                *puVar60 = afVar103._0_8_;
                puVar60[1] = uVar99;
                pauVar53 = pauVar53 + 1;
                puVar60 = puVar60 + 2;
              }
              local_f8 = (__m256 *)((long)local_f8 + 0x10);
              iVar29 = (int)local_d0 + 1;
            }
            return 0;
          }
          return -100;
        case 3:
          local_c8._0_4_ = iVar34;
          Mat::create(this_00,uVar61,uVar59,uVar3,sVar48,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            iVar29 = (int)local_c0;
            local_c0 = local_c0 & 0xffffffff;
            if (iVar29 < 1) {
              local_c0 = 0;
            }
            local_100 = a;
            for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)local_c0;
                local_f0 = (Mat *)((long)local_f0 + 1)) {
              local_80._0_16_ =
                   *(undefined1 (*) [16])((long)local_100->data + (long)local_f0 * 0x10);
              lVar54 = local_100[1].cstep * local_100[1].elemsize * (long)local_f0;
              pvVar9 = local_100[1].data;
              lVar40 = this_00->cstep * this_00->elemsize * (long)local_f0;
              pvVar41 = this_00->data;
              lVar57 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                pauVar53 = (undefined1 (*) [16])((long)pvVar9 + lVar57 + lVar54);
                uVar99 = *(undefined8 *)(*pauVar53 + 8);
                local_a0._0_16_ = *pauVar53;
                afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                     (&local_101,(__m128 *)local_80,(__m128 *)local_a0);
                puVar60 = (undefined8 *)((long)pvVar41 + lVar57 + lVar40);
                *puVar60 = afVar103._0_8_;
                puVar60[1] = uVar99;
                lVar57 = lVar57 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        case 4:
          local_c8._0_4_ = iVar34;
          Mat::create(this_00,uVar61,uVar59,(int)local_e0,uVar3,sVar48,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            iVar29 = (int)local_c0;
            local_c0 = local_c0 & 0xffffffff;
            if (iVar29 < 1) {
              local_c0 = 0;
            }
            local_100 = a;
            for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)local_c0;
                local_f0 = (Mat *)((long)local_f0 + 1)) {
              local_80._0_16_ =
                   *(undefined1 (*) [16])((long)local_100->data + (long)local_f0 * 0x10);
              lVar54 = local_100[1].cstep * local_100[1].elemsize * (long)local_f0;
              pvVar9 = local_100[1].data;
              lVar40 = this_00->cstep * this_00->elemsize * (long)local_f0;
              pvVar41 = this_00->data;
              lVar57 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                pauVar53 = (undefined1 (*) [16])((long)pvVar9 + lVar57 + lVar54);
                uVar99 = *(undefined8 *)(*pauVar53 + 8);
                local_a0._0_16_ = *pauVar53;
                afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                     (&local_101,(__m128 *)local_80,(__m128 *)local_a0);
                puVar60 = (undefined8 *)((long)pvVar41 + lVar57 + lVar40);
                *puVar60 = afVar103._0_8_;
                puVar60[1] = uVar99;
                lVar57 = lVar57 + 0x10;
              }
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      case 2:
        pAVar6 = opt->blob_allocator;
        if (a[1].dims == 3) {
          local_c8._0_4_ = iVar34;
          Mat::create(this_00,uVar61,uVar59,uVar3,sVar48,uVar47,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            local_e8 = (__m256 *)CONCAT44(local_e8._4_4_,uVar61);
            iVar29 = (int)local_f0;
            if ((int)local_f0 < 1) {
              iVar29 = 0;
            }
            local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar29);
            iVar29 = (int)local_c0;
            local_c0 = local_c0 & 0xffffffff;
            if (iVar29 < 1) {
              local_c0 = 0;
            }
            local_100 = a;
            for (local_e0 = (__m256 *)0x0; local_e0 != (__m256 *)local_c0;
                local_e0 = (__m256 *)((long)local_e0 + 1)) {
              local_f8 = (__m256 *)
                         ((long)local_100->w * (long)local_e0 * local_100->elemsize +
                         (long)local_100->data);
              pauVar63 = (undefined1 (*) [16])
                         (local_100[1].cstep * (long)local_e0 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pauVar53 = (undefined1 (*) [16])
                         (this_00->cstep * (long)local_e0 * this_00->elemsize + (long)this_00->data)
              ;
              iVar29 = 0;
              while (iVar29 != (int)local_f0) {
                local_d0 = (void *)CONCAT44(local_d0._4_4_,iVar29);
                local_80._0_16_ = *(undefined1 (*) [16])local_f8;
                iVar29 = (uint)local_e8;
                while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                  auVar100 = ZEXT856(*(ulong *)((long)*pauVar63 + 8));
                  local_a0._0_16_ = *pauVar63;
                  afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                       (&local_101,(__m128 *)local_80,(__m128 *)local_a0);
                  auVar89._0_8_ = afVar103._0_8_;
                  auVar89._8_56_ = auVar100;
                  *pauVar53 = auVar89._0_16_;
                  pauVar63 = pauVar63 + 1;
                  pauVar53 = pauVar53 + 1;
                }
                local_f8 = (__m256 *)((long)local_f8 + 0x10);
                iVar29 = (int)local_d0 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        if (a[1].dims == 4) {
          local_c8._0_4_ = iVar34;
          Mat::create(this_00,uVar61,uVar59,(int)local_e0,uVar3,sVar48,uVar47,pAVar6);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            local_e8 = (__m256 *)CONCAT44(local_e8._4_4_,uVar61);
            iVar29 = (int)local_f0;
            if ((int)local_f0 < 1) {
              iVar29 = 0;
            }
            local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar29);
            if ((int)local_e0 < 1) {
              local_e0._0_4_ = 0;
            }
            iVar29 = (int)local_c0;
            local_c0 = local_c0 & 0xffffffff;
            if (iVar29 < 1) {
              local_c0 = 0;
            }
            local_100 = a;
            for (local_d8 = 0; local_d8 != local_c0; local_d8 = local_d8 + 1) {
              local_c8 = (__m256 *)
                         ((long)local_100->w * local_d8 * local_100->elemsize +
                         (long)local_100->data);
              pauVar53 = (undefined1 (*) [16])
                         (local_100[1].cstep * local_d8 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pauVar63 = (undefined1 (*) [16])
                         (this_00->cstep * local_d8 * this_00->elemsize + (long)this_00->data);
              for (iVar29 = 0; iVar29 != (int)local_e0; iVar29 = iVar29 + 1) {
                local_80._0_16_ = *(undefined1 (*) [16])local_c8;
                local_d0 = (void *)CONCAT44(local_d0._4_4_,iVar29);
                iVar35 = 0;
                while (iVar35 != (int)local_f0) {
                  local_f8 = (__m256 *)CONCAT44(local_f8._4_4_,iVar35);
                  iVar29 = (uint)local_e8;
                  while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                    auVar100 = ZEXT856(*(ulong *)((long)*pauVar53 + 8));
                    local_a0._0_16_ = *pauVar53;
                    afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                         (&local_101,(__m128 *)local_80,(__m128 *)local_a0);
                    auVar87._0_8_ = afVar103._0_8_;
                    auVar87._8_56_ = auVar100;
                    *pauVar63 = auVar87._0_16_;
                    pauVar53 = pauVar53 + 1;
                    pauVar63 = pauVar63 + 1;
                  }
                  iVar29 = (int)local_d0;
                  iVar35 = (int)local_f8 + 1;
                }
                local_c8 = (__m256 *)((long)local_c8 + 0x10);
              }
            }
            return 0;
          }
          return -100;
        }
        local_b0 = opt;
        local_c8._0_4_ = iVar34;
        Mat::create(this_00,uVar49,uVar51,local_60,iVar29,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (a[1].dims != 1) {
          opt = local_b0;
          local_f0 = b;
          if (a[1].dims != 2) {
            return 0;
          }
LAB_0039abac:
          iVar29 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>
                             (a,b,this_00,opt);
          return iVar29;
        }
        local_f0 = b;
        Mat::create(this_00,uVar49,(int)local_f8,local_60,iVar29,local_b0->blob_allocator);
        puVar60 = (undefined8 *)this_00->data;
        if (puVar60 == (undefined8 *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        opt = local_b0;
        b = local_f0;
        if ((int)local_d8 != 1 || a[1].w != 1) {
          pauVar53 = (undefined1 (*) [16])a->data;
          if ((int)uVar49 < 1) {
            uVar32 = 0;
          }
          local_e8 = (__m256 *)a[1].data;
          iVar29 = (int)local_f8;
          local_f8 = (__m256 *)((ulong)local_f8 & 0xffffffff);
          if (iVar29 < 1) {
            local_f8 = (__m256 *)0x0;
          }
          iVar29 = 0;
          local_d0 = (void *)uVar32;
          while( true ) {
            local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar29);
            if (iVar29 == (int)local_f8) break;
            local_80._0_16_ = *(undefined1 (*) [16])local_e8;
            uVar58 = (ulong)local_d0 & 0xffffffff;
            while (iVar29 = (int)uVar58, uVar58 = (ulong)(iVar29 - 1), iVar29 != 0) {
              uVar99 = *(undefined8 *)((long)*pauVar53 + 8);
              local_a0._0_16_ = *pauVar53;
              afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                   (&local_101,(__m128 *)local_a0,(__m128 *)local_80);
              *puVar60 = afVar103._0_8_;
              puVar60[1] = uVar99;
              pauVar53 = pauVar53 + 1;
              puVar60 = puVar60 + 2;
            }
            local_e8 = (__m256 *)((long)local_e8 + 0x10);
            iVar29 = (int)local_f0 + 1;
          }
          return 0;
        }
        break;
      case 3:
        if (a[1].dims == 3) {
          uVar31 = uVar3 ^ uVar50;
          local_d0 = (void *)uVar32;
          if (((uVar61 ^ 1) == 0 && (uVar59 ^ 1) == 0) && uVar31 == 0) {
            local_e0._0_4_ = iVar29;
            local_c8._0_4_ = iVar34;
            Mat::create(this_00,uVar49,uVar51,uVar50,local_60,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)local_a8 < 1) {
                local_a8._0_4_ = 0;
              }
              local_b8 = uVar58;
              if ((int)uVar50 < 1) {
                local_b8 = 0;
              }
              local_100 = a;
              for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)local_b8;
                  local_f0 = (Mat *)((long)local_f0 + 1)) {
                lVar40 = local_100->cstep * local_100->elemsize * (long)local_f0;
                pvVar9 = local_100->data;
                lVar54 = this_00->cstep * this_00->elemsize * (long)local_f0;
                pvVar41 = this_00->data;
                local_80._0_16_ =
                     *(undefined1 (*) [16])
                      ((long)local_100[1].data +
                      local_100[1].cstep * (long)local_f0 * local_100[1].elemsize);
                lVar57 = 0;
                iVar29 = (int)local_a8;
                while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                  pauVar53 = (undefined1 (*) [16])((long)pvVar9 + lVar57 + lVar40);
                  uVar99 = *(undefined8 *)(*pauVar53 + 8);
                  local_a0._0_16_ = *pauVar53;
                  afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                       (&local_101,(__m128 *)local_a0,(__m128 *)local_80);
                  puVar60 = (undefined8 *)((long)pvVar41 + lVar57 + lVar54);
                  *puVar60 = afVar103._0_8_;
                  puVar60[1] = uVar99;
                  lVar57 = lVar57 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          }
          if ((uVar61 == uVar49) && (uVar47 == 1 && (uVar3 == 1 && uVar59 == uVar51))) {
            local_e0._0_4_ = iVar29;
            local_c8._0_4_ = iVar34;
            Mat::create(this_00,uVar49,uVar51,uVar50,local_60,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)local_a8 < 1) {
                local_a8._0_4_ = 0;
              }
              local_b8 = uVar58;
              if ((int)uVar50 < 1) {
                local_b8 = 0;
              }
              local_100 = a;
              for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)local_b8;
                  local_f0 = (Mat *)((long)local_f0 + 1)) {
                pvVar9 = local_100[1].data;
                lVar54 = local_100->cstep * local_100->elemsize * (long)local_f0;
                pvVar41 = local_100->data;
                lVar40 = this_00->cstep * this_00->elemsize * (long)local_f0;
                pvVar55 = this_00->data;
                lVar57 = 0;
                iVar29 = (int)local_a8;
                while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                  local_80._0_16_ = *(undefined1 (*) [16])((long)pvVar41 + lVar57 * 4 + lVar54);
                  uVar1 = *(undefined4 *)((long)pvVar9 + lVar57);
                  auVar69._4_4_ = uVar1;
                  auVar69._0_4_ = uVar1;
                  auVar69._8_4_ = uVar1;
                  auVar69._12_4_ = uVar1;
                  auVar100 = ZEXT856(auVar69._8_8_);
                  local_a0[0] = (float)uVar1;
                  local_a0[1] = (float)uVar1;
                  local_a0[2] = (float)uVar1;
                  local_a0[3] = (float)uVar1;
                  afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                       (&local_101,(__m128 *)local_80,(__m128 *)local_a0);
                  auVar91._0_8_ = afVar103._0_8_;
                  auVar91._8_56_ = auVar100;
                  *(undefined1 (*) [16])((long)pvVar55 + lVar57 * 4 + lVar40) = auVar91._0_16_;
                  lVar57 = lVar57 + 4;
                }
              }
              return 0;
            }
            return -100;
          }
          if (((uVar49 ^ 1) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) {
            local_e0._0_4_ = iVar29;
            local_c8._0_4_ = iVar34;
            Mat::create(this_00,uVar61,uVar59,uVar50,sVar48,uVar47,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)local_c8 < 1) {
                local_c8._0_4_ = 0;
              }
              local_b8 = uVar58;
              if ((int)uVar50 < 1) {
                local_b8 = 0;
              }
              local_100 = a;
              for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)local_b8;
                  local_f0 = (Mat *)((long)local_f0 + 1)) {
                lVar54 = this_00->cstep * this_00->elemsize * (long)local_f0;
                pvVar9 = this_00->data;
                lVar40 = local_100[1].cstep * local_100[1].elemsize * (long)local_f0;
                pvVar41 = local_100[1].data;
                local_80._0_16_ =
                     *(undefined1 (*) [16])
                      ((long)local_100->data +
                      local_100->cstep * (long)local_f0 * local_100->elemsize);
                lVar57 = 0;
                iVar29 = (int)local_c8;
                while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                  pauVar53 = (undefined1 (*) [16])((long)pvVar41 + lVar57 + lVar40);
                  uVar99 = *(undefined8 *)(*pauVar53 + 8);
                  local_a0._0_16_ = *pauVar53;
                  afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                       (&local_101,(__m128 *)local_80,(__m128 *)local_a0);
                  puVar60 = (undefined8 *)((long)pvVar9 + lVar57 + lVar54);
                  *puVar60 = afVar103._0_8_;
                  puVar60[1] = uVar99;
                  lVar57 = lVar57 + 0x10;
                }
              }
              return 0;
            }
            return -100;
          }
          if ((uVar61 == uVar49) && (iVar29 == 1 && (uVar50 == 1 && uVar59 == uVar51))) {
            local_b0 = opt;
            local_e0._0_4_ = iVar29;
            local_c8._0_4_ = iVar34;
            Mat::create(this_00,uVar49,uVar51,uVar3,sVar48,uVar47,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)local_c8 < 1) {
                local_c8._0_4_ = 0;
              }
              iVar29 = (int)local_c0;
              local_c0 = local_c0 & 0xffffffff;
              if (iVar29 < 1) {
                local_c0 = 0;
              }
              local_100 = a;
              for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)local_c0;
                  local_f0 = (Mat *)((long)local_f0 + 1)) {
                pvVar9 = local_100->data;
                lVar54 = local_100[1].cstep * local_100[1].elemsize * (long)local_f0;
                pvVar41 = local_100[1].data;
                lVar40 = this_00->cstep * this_00->elemsize * (long)local_f0;
                pvVar55 = this_00->data;
                lVar57 = 0;
                iVar29 = (int)local_c8;
                while (afVar28 = local_80, bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                  local_80[1] = *(float *)((long)pvVar9 + lVar57);
                  local_80[0] = local_80[1];
                  local_80[2] = local_80[1];
                  local_80._16_16_ = afVar28._16_16_;
                  local_80[3] = local_80[1];
                  pauVar53 = (undefined1 (*) [16])((long)pvVar41 + lVar57 * 4 + lVar54);
                  auVar100 = ZEXT856(*(ulong *)(*pauVar53 + 8));
                  local_a0._0_16_ = *pauVar53;
                  afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                       (&local_101,(__m128 *)local_80,(__m128 *)local_a0);
                  auVar92._0_8_ = afVar103._0_8_;
                  auVar92._8_56_ = auVar100;
                  *(undefined1 (*) [16])((long)pvVar55 + lVar57 * 4 + lVar40) = auVar92._0_16_;
                  lVar57 = lVar57 + 4;
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar61 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar49 != 1) {
            local_b0 = opt;
            local_e0._0_4_ = iVar29;
            local_c8._0_4_ = iVar34;
            Mat::create(this_00,uVar49,uVar51,uVar50,local_60,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)uVar49 < 1) {
                uVar32 = 0;
              }
              pafVar56 = (__m256 *)((ulong)local_f8 & 0xffffffff);
              if ((int)local_f8 < 1) {
                pafVar56 = (__m256 *)0x0;
              }
              if ((int)uVar50 < 1) {
                uVar58 = 0;
              }
              local_100 = a;
              local_f8 = pafVar56;
              local_d0 = (void *)uVar32;
              local_b8 = uVar58;
              for (local_e0 = (__m256 *)0x0; local_e0 != (__m256 *)local_b8;
                  local_e0 = (__m256 *)((long)local_e0 + 1)) {
                pauVar53 = (undefined1 (*) [16])
                           (local_100->cstep * (long)local_e0 * local_100->elemsize +
                           (long)local_100->data);
                local_e8 = (__m256 *)
                           (local_100[1].cstep * (long)local_e0 * local_100[1].elemsize +
                           (long)local_100[1].data);
                pauVar63 = (undefined1 (*) [16])
                           (this_00->cstep * (long)local_e0 * this_00->elemsize +
                           (long)this_00->data);
                for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)pafVar56;
                    local_f0 = (Mat *)((long)local_f0 + 1)) {
                  local_80._0_16_ = *(undefined1 (*) [16])((long)local_e8 + (long)local_f0 * 0x10);
                  uVar58 = (ulong)local_d0 & 0xffffffff;
                  while (iVar29 = (int)uVar58, uVar58 = (ulong)(iVar29 - 1), iVar29 != 0) {
                    auVar100 = ZEXT856(*(ulong *)((long)*pauVar53 + 8));
                    local_a0._0_16_ = *pauVar53;
                    afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                         (&local_101,(__m128 *)local_a0,(__m128 *)local_80);
                    auVar94._0_8_ = afVar103._0_8_;
                    auVar94._8_56_ = auVar100;
                    *pauVar63 = auVar94._0_16_;
                    pauVar53 = pauVar53 + 1;
                    pauVar63 = pauVar63 + 1;
                  }
                  pafVar56 = local_f8;
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar59 ^ 1) == 0 && (uVar61 ^ uVar49) == 0) && uVar31 == 0) && uVar51 != 1) {
            local_100 = a;
            local_b0 = opt;
            local_e0._0_4_ = iVar29;
            local_c8._0_4_ = iVar34;
            Mat::create(this_00,uVar49,uVar51,uVar50,local_60,iVar29,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar58 = (ulong)local_d0 & 0xffffffff;
              if ((int)local_d0 < 1) {
                uVar58 = 0;
              }
              iVar29 = (int)local_f8;
              local_f8 = (__m256 *)((ulong)local_f8 & 0xffffffff);
              if (iVar29 < 1) {
                local_f8 = (__m256 *)0x0;
              }
              iVar29 = (int)local_b8;
              local_b8 = local_b8 & 0xffffffff;
              if (iVar29 < 1) {
                local_b8 = 0;
              }
              for (local_e8 = (__m256 *)0x0; local_e8 != (__m256 *)local_b8;
                  local_e8 = (__m256 *)((long)local_e8 + 1)) {
                pvVar55 = (void *)(local_100->cstep * (long)local_e8 * local_100->elemsize +
                                  (long)local_100->data);
                pvVar41 = (void *)(this_00->cstep * (long)local_e8 * this_00->elemsize +
                                  (long)this_00->data);
                lVar40 = local_100[1].cstep * local_100[1].elemsize * (long)local_e8;
                pvVar9 = local_100[1].data;
                iVar29 = 0;
                while (iVar29 != (int)local_f8) {
                  local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar29);
                  for (lVar54 = 0; uVar58 * 0x10 != lVar54; lVar54 = lVar54 + 0x10) {
                    local_80._0_16_ = *(undefined1 (*) [16])((long)pvVar55 + lVar54);
                    pauVar53 = (undefined1 (*) [16])((long)pvVar9 + lVar54 + lVar40);
                    auVar100 = ZEXT856(*(ulong *)(*pauVar53 + 8));
                    local_a0._0_16_ = *pauVar53;
                    afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                         (&local_101,(__m128 *)local_80,(__m128 *)local_a0);
                    auVar95._0_8_ = afVar103._0_8_;
                    auVar95._8_56_ = auVar100;
                    *(undefined1 (*) [16])((long)pvVar41 + lVar54) = auVar95._0_16_;
                  }
                  pvVar55 = (void *)((long)pvVar55 + lVar54);
                  pvVar41 = (void *)((long)pvVar41 + lVar54);
                  iVar29 = (int)local_f0 + 1;
                }
              }
              return 0;
            }
            return -100;
          }
          if ((((uVar49 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar61 != 1) {
            local_100 = a;
            local_b0 = opt;
            local_e0._0_4_ = iVar29;
            local_c8._0_4_ = iVar34;
            Mat::create(this_00,uVar61,uVar51,uVar50,sVar48,uVar47,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              if ((int)(uint)local_e8 < 1) {
                local_e8._0_4_ = 0;
              }
              pafVar56 = (__m256 *)((ulong)local_f8 & 0xffffffff);
              if ((int)local_f8 < 1) {
                pafVar56 = (__m256 *)0;
              }
              iVar29 = (int)local_b8;
              local_b8 = local_b8 & 0xffffffff;
              if (iVar29 < 1) {
                local_b8 = 0;
              }
              local_f8 = pafVar56;
              for (local_e0 = (__m256 *)0x0; local_e0 != (__m256 *)local_b8;
                  local_e0 = (__m256 *)((long)local_e0 + 1)) {
                local_d0 = (void *)(local_100->cstep * (long)local_e0 * local_100->elemsize +
                                   (long)local_100->data);
                pauVar63 = (undefined1 (*) [16])
                           (local_100[1].cstep * (long)local_e0 * local_100[1].elemsize +
                           (long)local_100[1].data);
                pauVar53 = (undefined1 (*) [16])
                           (this_00->cstep * (long)local_e0 * this_00->elemsize +
                           (long)this_00->data);
                for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)pafVar56;
                    local_f0 = (Mat *)((long)local_f0 + 1)) {
                  local_80._0_16_ = *(undefined1 (*) [16])((long)local_d0 + (long)local_f0 * 0x10);
                  iVar29 = (uint)local_e8;
                  while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                    auVar100 = ZEXT856(*(ulong *)((long)*pauVar63 + 8));
                    local_a0._0_16_ = *pauVar63;
                    afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                         (&local_101,(__m128 *)local_80,(__m128 *)local_a0);
                    auVar96._0_8_ = afVar103._0_8_;
                    auVar96._8_56_ = auVar100;
                    *pauVar53 = auVar96._0_16_;
                    pauVar63 = pauVar63 + 1;
                    pauVar53 = pauVar53 + 1;
                  }
                  pafVar56 = local_f8;
                }
              }
              return 0;
            }
            return -100;
          }
          local_100 = a;
          local_b0 = opt;
          local_e0._0_4_ = iVar29;
          local_c8._0_4_ = iVar34;
          if ((((uVar61 ^ uVar49) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) && uVar59 != 1) {
            Mat::create(this_00,uVar49,uVar59,uVar50,sVar48,uVar47,opt->blob_allocator);
            if (this_00->data == (void *)0x0) {
              return -100;
            }
            if ((long)this_00->c * this_00->cstep != 0) {
              uVar58 = (ulong)local_d0 & 0xffffffff;
              if ((int)local_d0 < 1) {
                uVar58 = 0;
              }
              iVar29 = (int)local_f0;
              if ((int)local_f0 < 1) {
                iVar29 = 0;
              }
              local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar29);
              iVar29 = (int)local_b8;
              local_b8 = local_b8 & 0xffffffff;
              if (iVar29 < 1) {
                local_b8 = 0;
              }
              for (local_f8 = (__m256 *)0x0; local_f8 != (__m256 *)local_b8;
                  local_f8 = (__m256 *)((long)local_f8 + 1)) {
                pvVar55 = (void *)(local_100[1].cstep * (long)local_f8 * local_100[1].elemsize +
                                  (long)local_100[1].data);
                pvVar41 = (void *)(this_00->cstep * (long)local_f8 * this_00->elemsize +
                                  (long)this_00->data);
                lVar40 = local_100->cstep * local_100->elemsize * (long)local_f8;
                pvVar9 = local_100->data;
                for (local_e8._0_4_ = 0; (uint)local_e8 != (int)local_f0;
                    local_e8._0_4_ = (uint)local_e8 + 1) {
                  for (lVar54 = 0; uVar58 * 0x10 != lVar54; lVar54 = lVar54 + 0x10) {
                    local_80._0_16_ = *(undefined1 (*) [16])((long)pvVar9 + lVar54 + lVar40);
                    auVar100 = ZEXT856(*(ulong *)(*(undefined1 (*) [16])((long)pvVar55 + lVar54) + 8
                                                 ));
                    local_a0._0_16_ = *(undefined1 (*) [16])((long)pvVar55 + lVar54);
                    afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                         (&local_101,(__m128 *)local_80,(__m128 *)local_a0);
                    auVar97._0_8_ = afVar103._0_8_;
                    auVar97._8_56_ = auVar100;
                    *(undefined1 (*) [16])((long)pvVar41 + lVar54) = auVar97._0_16_;
                  }
                  pvVar55 = (void *)((long)pvVar55 + lVar54);
                  pvVar41 = (void *)((long)pvVar41 + lVar54);
                }
              }
              return 0;
            }
            return -100;
          }
          goto LAB_0039abac;
        }
        if (a[1].dims == 4) {
          local_c8._0_4_ = iVar34;
          Mat::create(this_00,uVar61,uVar59,(int)local_e0,uVar3,sVar48,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            iVar29 = (int)local_f0;
            if ((int)local_f0 < 1) {
              iVar29 = 0;
            }
            local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar29);
            if ((int)local_e0 < 1) {
              local_e0._0_4_ = 0;
            }
            iVar29 = (int)local_c0;
            local_c0 = local_c0 & 0xffffffff;
            if (iVar29 < 1) {
              local_c0 = 0;
            }
            local_e8 = (__m256 *)CONCAT44(local_e8._4_4_,uVar61);
            local_100 = a;
            for (local_c8 = (__m256 *)0x0; local_c8 != (__m256 *)local_c0;
                local_c8 = (__m256 *)((long)local_c8 + 1)) {
              local_f8 = (__m256 *)
                         (local_100->cstep * (long)local_c8 * local_100->elemsize +
                         (long)local_100->data);
              pauVar53 = (undefined1 (*) [16])
                         (local_100[1].cstep * (long)local_c8 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pauVar63 = (undefined1 (*) [16])
                         (this_00->cstep * (long)local_c8 * this_00->elemsize + (long)this_00->data)
              ;
              for (iVar29 = 0; iVar29 != (int)local_e0; iVar29 = iVar29 + 1) {
                local_d0 = (void *)CONCAT44(local_d0._4_4_,iVar29);
                for (iVar35 = 0; iVar35 != (int)local_f0; iVar35 = iVar35 + 1) {
                  local_80._0_16_ = *(undefined1 (*) [16])local_f8;
                  while (bVar64 = uVar61 != 0, uVar61 = uVar61 - 1, bVar64) {
                    auVar100 = ZEXT856(*(ulong *)((long)*pauVar53 + 8));
                    local_a0._0_16_ = *pauVar53;
                    afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                         (&local_101,(__m128 *)local_80,(__m128 *)local_a0);
                    auVar86._0_8_ = afVar103._0_8_;
                    auVar86._8_56_ = auVar100;
                    *pauVar63 = auVar86._0_16_;
                    pauVar53 = pauVar53 + 1;
                    pauVar63 = pauVar63 + 1;
                  }
                  local_f8 = (__m256 *)((long)local_f8 + 0x10);
                  iVar29 = (int)local_d0;
                  uVar61 = (uint)local_e8;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        local_c8._0_4_ = iVar34;
        Mat::create(this_00,uVar49,uVar51,uVar50,local_60,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = (int)local_b8;
        if (a[1].dims != 1) {
          if (a[1].dims == 2) {
            if ((int)uVar49 < 1) {
              uVar32 = 0;
            }
            iVar35 = (int)local_f8;
            local_f8 = (__m256 *)((ulong)local_f8 & 0xffffffff);
            if (iVar35 < 1) {
              local_f8 = (__m256 *)0x0;
            }
            local_b8 = local_b8 & 0xffffffff;
            if (iVar29 < 1) {
              local_b8 = 0;
            }
            local_100 = a;
            local_d0 = (void *)uVar32;
            for (local_e0 = (__m256 *)0x0; local_e0 != (__m256 *)local_b8;
                local_e0 = (__m256 *)((long)local_e0 + 1)) {
              pauVar53 = (undefined1 (*) [16])
                         (local_100->cstep * (long)local_e0 * local_100->elemsize +
                         (long)local_100->data);
              local_f0 = (Mat *)((long)local_100[1].w * (long)local_e0 * local_100[1].elemsize +
                                (long)local_100[1].data);
              pauVar63 = (undefined1 (*) [16])
                         (this_00->cstep * (long)local_e0 * this_00->elemsize + (long)this_00->data)
              ;
              for (local_e8._0_4_ = 0; (uint)local_e8 != (int)local_f8;
                  local_e8._0_4_ = (uint)local_e8 + 1) {
                local_80._0_16_ = *(undefined1 (*) [16])local_f0;
                uVar58 = (ulong)local_d0 & 0xffffffff;
                while (iVar29 = (int)uVar58, uVar58 = (ulong)(iVar29 - 1), iVar29 != 0) {
                  auVar100 = ZEXT856(*(ulong *)((long)*pauVar53 + 8));
                  local_a0._0_16_ = *pauVar53;
                  afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                       (&local_101,(__m128 *)local_a0,(__m128 *)local_80);
                  auVar90._0_8_ = afVar103._0_8_;
                  auVar90._8_56_ = auVar100;
                  *pauVar63 = auVar90._0_16_;
                  pauVar53 = pauVar53 + 1;
                  pauVar63 = pauVar63 + 1;
                }
                local_f0 = (Mat *)((long)local_f0 + 0x10);
              }
            }
            return 0;
          }
          return 0;
        }
        if ((int)local_d8 != 1 || a[1].w != 1) {
          if ((int)local_a8 < 1) {
            local_a8._0_4_ = 0;
          }
          local_b8 = local_b8 & 0xffffffff;
          if (iVar29 < 1) {
            local_b8 = 0;
          }
          local_100 = a;
          for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)local_b8;
              local_f0 = (Mat *)((long)local_f0 + 1)) {
            lVar54 = local_100->cstep * local_100->elemsize * (long)local_f0;
            pvVar9 = local_100->data;
            local_80._0_16_ =
                 *(undefined1 (*) [16])((long)local_100[1].data + (long)local_f0 * 0x10);
            lVar40 = this_00->cstep * this_00->elemsize * (long)local_f0;
            pvVar41 = this_00->data;
            lVar57 = 0;
            iVar29 = (int)local_a8;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              pauVar53 = (undefined1 (*) [16])((long)pvVar9 + lVar57 + lVar54);
              uVar99 = *(undefined8 *)(*pauVar53 + 8);
              local_a0._0_16_ = *pauVar53;
              afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                   (&local_101,(__m128 *)local_a0,(__m128 *)local_80);
              puVar60 = (undefined8 *)((long)pvVar41 + lVar57 + lVar40);
              *puVar60 = afVar103._0_8_;
              puVar60[1] = uVar99;
              lVar57 = lVar57 + 0x10;
            }
          }
          return 0;
        }
        break;
      case 4:
        if (a[1].dims == 4) goto LAB_0039abac;
        Mat::create(this_00,uVar49,uVar51,(int)local_c8,uVar50,local_60,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = a[1].dims;
        iVar35 = (int)local_b8;
        if (iVar29 != 1) {
          iVar34 = (int)local_f8;
          if (iVar29 == 3) {
            if ((int)uVar49 < 1) {
              uVar32 = 0;
            }
            local_f8 = (__m256 *)((ulong)local_f8 & 0xffffffff);
            if (iVar34 < 1) {
              local_f8 = (__m256 *)0x0;
            }
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            local_b8 = local_b8 & 0xffffffff;
            if (iVar35 < 1) {
              local_b8 = 0;
            }
            local_100 = a;
            local_d0 = (void *)uVar32;
            for (local_d8 = 0; local_d8 != local_b8; local_d8 = local_d8 + 1) {
              pauVar63 = (undefined1 (*) [16])
                         (local_100->cstep * local_d8 * local_100->elemsize + (long)local_100->data)
              ;
              local_f0 = (Mat *)(local_100[1].cstep * local_d8 * local_100[1].elemsize +
                                (long)local_100[1].data);
              pauVar53 = (undefined1 (*) [16])
                         (this_00->cstep * local_d8 * this_00->elemsize + (long)this_00->data);
              pafVar56 = local_f8;
              for (local_e0._0_4_ = 0; (int)local_e0 != (int)local_c8;
                  local_e0._0_4_ = (int)local_e0 + 1) {
                for (local_e8._0_4_ = 0; (uint)local_e8 != (int)pafVar56;
                    local_e8._0_4_ = (uint)local_e8 + 1) {
                  local_80._0_16_ = *(undefined1 (*) [16])local_f0;
                  uVar58 = (ulong)local_d0 & 0xffffffff;
                  while (iVar29 = (int)uVar58, uVar58 = (ulong)(iVar29 - 1), iVar29 != 0) {
                    auVar100 = ZEXT856(*(ulong *)((long)*pauVar63 + 8));
                    local_a0._0_16_ = *pauVar63;
                    afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                         (&local_101,(__m128 *)local_a0,(__m128 *)local_80);
                    auVar93._0_8_ = afVar103._0_8_;
                    auVar93._8_56_ = auVar100;
                    *pauVar53 = auVar93._0_16_;
                    pauVar63 = pauVar63 + 1;
                    pauVar53 = pauVar53 + 1;
                  }
                  local_f0 = (Mat *)((long)local_f0 + 0x10);
                  pafVar56 = local_f8;
                }
              }
            }
            return 0;
          }
          if (iVar29 == 2) {
            if ((int)uVar49 < 1) {
              uVar32 = 0;
            }
            local_f8 = (__m256 *)((ulong)local_f8 & 0xffffffff);
            if (iVar34 < 1) {
              local_f8 = (__m256 *)0x0;
            }
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            local_b8 = local_b8 & 0xffffffff;
            if (iVar35 < 1) {
              local_b8 = 0;
            }
            local_100 = a;
            local_d0 = (void *)uVar32;
            for (local_d8 = 0; local_d8 != local_b8; local_d8 = local_d8 + 1) {
              pauVar63 = (undefined1 (*) [16])
                         (local_100->cstep * local_d8 * local_100->elemsize + (long)local_100->data)
              ;
              local_e0 = (__m256 *)
                         ((long)local_100[1].w * local_d8 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pauVar53 = (undefined1 (*) [16])
                         (this_00->cstep * local_d8 * this_00->elemsize + (long)this_00->data);
              pafVar56 = local_f8;
              for (local_e8._0_4_ = 0; (uint)local_e8 != (int)local_c8;
                  local_e8._0_4_ = (uint)local_e8 + 1) {
                local_80._0_16_ = *(undefined1 (*) [16])local_e0;
                iVar29 = 0;
                while (iVar29 != (int)pafVar56) {
                  local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar29);
                  uVar58 = (ulong)local_d0 & 0xffffffff;
                  while (iVar29 = (int)uVar58, uVar58 = (ulong)(iVar29 - 1), iVar29 != 0) {
                    auVar100 = ZEXT856(*(ulong *)((long)*pauVar63 + 8));
                    local_a0._0_16_ = *pauVar63;
                    afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                         (&local_101,(__m128 *)local_a0,(__m128 *)local_80);
                    auVar88._0_8_ = afVar103._0_8_;
                    auVar88._8_56_ = auVar100;
                    *pauVar53 = auVar88._0_16_;
                    pauVar63 = pauVar63 + 1;
                    pauVar53 = pauVar53 + 1;
                  }
                  pafVar56 = local_f8;
                  iVar29 = (int)local_f0 + 1;
                }
                local_e0 = (__m256 *)((long)local_e0 + 0x10);
              }
            }
            return 0;
          }
          return 0;
        }
        if ((int)local_d8 != 1 || a[1].w != 1) {
          if ((int)local_a8 < 1) {
            local_a8._0_4_ = 0;
          }
          local_b8 = local_b8 & 0xffffffff;
          if (iVar35 < 1) {
            local_b8 = 0;
          }
          local_100 = a;
          for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)local_b8;
              local_f0 = (Mat *)((long)local_f0 + 1)) {
            lVar57 = local_100->cstep * local_100->elemsize * (long)local_f0;
            pvVar9 = local_100->data;
            local_80._0_16_ =
                 *(undefined1 (*) [16])((long)local_100[1].data + (long)local_f0 * 0x10);
            lVar54 = this_00->cstep * this_00->elemsize * (long)local_f0;
            pvVar41 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_a8;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              pauVar53 = (undefined1 (*) [16])((long)pvVar9 + lVar40 + lVar57);
              uVar99 = *(undefined8 *)(*pauVar53 + 8);
              local_a0._0_16_ = *pauVar53;
              afVar103 = BinaryOp_x86_fma_functor::binary_op_pow::func_pack4
                                   (&local_101,(__m128 *)local_a0,(__m128 *)local_80);
              puVar60 = (undefined8 *)((long)pvVar41 + lVar40 + lVar54);
              *puVar60 = afVar103._0_8_;
              puVar60[1] = uVar99;
              lVar40 = lVar40 + 0x10;
            }
          }
          return 0;
        }
      }
LAB_003a3763:
      iVar29 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>(a,b,this_00,opt);
      return iVar29;
    case 7:
      pMVar42 = a;
      a = b;
      break;
    case 8:
      pMVar42 = a;
      a = b;
LAB_0039908a:
      iVar29 = binary_op_pack4<ncnn::BinaryOp_x86_fma_functor::binary_op_div>(a,pMVar42,this_00,opt)
      ;
      return iVar29;
    default:
      goto switchD_00398776_default;
    }
    iVar29 = binary_op_pack4<ncnn::BinaryOp_x86_fma_functor::binary_op_sub>(a,pMVar42,this_00,opt);
    return iVar29;
  }
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_BinaryOp_x86_fma[-3])) {
  case 0:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
    uVar49 = a->w;
    uVar51 = a->h;
    iVar35 = a->d;
    uVar50 = a->c;
    local_f8 = (__m256 *)(ulong)uVar50;
    local_d0 = (void *)CONCAT44(local_d0._4_4_,uVar51 * uVar49 * iVar35);
    sVar48 = a->elemsize;
    uVar61 = a[1].w;
    uVar59 = a[1].h;
    iVar34 = a[1].d;
    uVar3 = a[1].c;
    local_e8 = (__m256 *)(ulong)uVar3;
    local_c8 = (__m256 *)CONCAT44(local_c8._4_4_,uVar59 * uVar61 * iVar34);
    sVar5 = a[1].elemsize;
    switch(a->dims) {
    case 1:
      if (iVar29 != 1 || uVar49 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_003986c3_caseD_1;
        case 2:
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,sVar5,uVar47,opt->blob_allocator);
          pfVar36 = (float *)this_00->data;
          if (pfVar36 == (float *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            pfVar43 = (float *)local_100->data;
            pfVar39 = (float *)local_100[1].data;
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
              fVar2 = *pfVar43;
              fVar14 = pfVar43[1];
              fVar15 = pfVar43[2];
              fVar16 = pfVar43[3];
              fVar17 = pfVar43[4];
              fVar18 = pfVar43[5];
              fVar19 = pfVar43[6];
              fVar20 = pfVar43[7];
              uVar49 = uVar61;
              while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                fVar21 = pfVar39[1];
                fVar22 = pfVar39[2];
                fVar23 = pfVar39[3];
                fVar24 = pfVar39[4];
                fVar25 = pfVar39[5];
                fVar26 = pfVar39[6];
                fVar27 = pfVar39[7];
                *pfVar36 = fVar2 + *pfVar39;
                pfVar36[1] = fVar14 + fVar21;
                pfVar36[2] = fVar15 + fVar22;
                pfVar36[3] = fVar16 + fVar23;
                pfVar36[4] = fVar17 + fVar24;
                pfVar36[5] = fVar18 + fVar25;
                pfVar36[6] = fVar19 + fVar26;
                pfVar36[7] = fVar20 + fVar27;
                pfVar39 = pfVar39 + 8;
                pfVar36 = pfVar36 + 8;
              }
              pfVar43 = pfVar43 + 8;
            }
            return 0;
          }
          return -100;
        case 3:
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,uVar3,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100[1].cstep;
              sVar5 = local_100[1].elemsize;
              pfVar36 = (float *)((long)local_100->data + uVar32 * 0x20);
              fVar2 = *pfVar36;
              fVar14 = pfVar36[1];
              fVar15 = pfVar36[2];
              fVar16 = pfVar36[3];
              fVar17 = pfVar36[4];
              fVar18 = pfVar36[5];
              fVar19 = pfVar36[6];
              fVar20 = pfVar36[7];
              pvVar9 = local_100[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar41 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                fVar21 = pfVar36[1];
                fVar22 = pfVar36[2];
                fVar23 = pfVar36[3];
                fVar24 = pfVar36[4];
                fVar25 = pfVar36[5];
                fVar26 = pfVar36[6];
                fVar27 = pfVar36[7];
                pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
                *pfVar43 = fVar2 + *pfVar36;
                pfVar43[1] = fVar14 + fVar21;
                pfVar43[2] = fVar15 + fVar22;
                pfVar43[3] = fVar16 + fVar23;
                pfVar43[4] = fVar17 + fVar24;
                pfVar43[5] = fVar18 + fVar25;
                pfVar43[6] = fVar19 + fVar26;
                pfVar43[7] = fVar20 + fVar27;
                lVar40 = lVar40 + 0x20;
              }
            }
            return 0;
          }
          return -100;
        case 4:
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100[1].cstep;
              sVar5 = local_100[1].elemsize;
              pfVar36 = (float *)((long)local_100->data + uVar32 * 0x20);
              fVar2 = *pfVar36;
              fVar14 = pfVar36[1];
              fVar15 = pfVar36[2];
              fVar16 = pfVar36[3];
              fVar17 = pfVar36[4];
              fVar18 = pfVar36[5];
              fVar19 = pfVar36[6];
              fVar20 = pfVar36[7];
              pvVar9 = local_100[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar41 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                fVar21 = pfVar36[1];
                fVar22 = pfVar36[2];
                fVar23 = pfVar36[3];
                fVar24 = pfVar36[4];
                fVar25 = pfVar36[5];
                fVar26 = pfVar36[6];
                fVar27 = pfVar36[7];
                pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
                *pfVar43 = fVar2 + *pfVar36;
                pfVar43[1] = fVar14 + fVar21;
                pfVar43[2] = fVar15 + fVar22;
                pfVar43[3] = fVar16 + fVar23;
                pfVar43[4] = fVar17 + fVar24;
                pfVar43[5] = fVar18 + fVar25;
                pfVar43[6] = fVar19 + fVar26;
                pfVar43[7] = fVar20 + fVar27;
                lVar40 = lVar40 + 0x20;
              }
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      goto LAB_00398817;
    case 2:
      pAVar6 = opt->blob_allocator;
      if (a[1].dims == 3) {
        local_100 = a;
        Mat::create(this_00,uVar61,uVar59,uVar3,sVar5,uVar47,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar61 < 1) {
            uVar61 = 0;
          }
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          uVar58 = (ulong)local_e8 & 0xffffffff;
          if ((int)local_e8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            pauVar37 = (undefined1 (*) [32])
                       ((long)local_100->w * uVar32 * local_100->elemsize + (long)local_100->data);
            pfVar36 = (float *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                               (long)local_100[1].data);
            pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
              auVar80 = *pauVar37;
              uVar49 = uVar61;
              while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                fVar2 = pfVar36[1];
                fVar14 = pfVar36[2];
                fVar15 = pfVar36[3];
                fVar16 = pfVar36[4];
                fVar17 = pfVar36[5];
                fVar18 = pfVar36[6];
                fVar19 = pfVar36[7];
                *pfVar43 = auVar80._0_4_ + *pfVar36;
                pfVar43[1] = auVar80._4_4_ + fVar2;
                pfVar43[2] = auVar80._8_4_ + fVar14;
                pfVar43[3] = auVar80._12_4_ + fVar15;
                pfVar43[4] = auVar80._16_4_ + fVar16;
                pfVar43[5] = auVar80._20_4_ + fVar17;
                pfVar43[6] = auVar80._24_4_ + fVar18;
                pfVar43[7] = auVar80._28_4_ + fVar19;
                pfVar36 = pfVar36 + 8;
                pfVar43 = pfVar43 + 8;
              }
              pauVar37 = pauVar37 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        local_100 = a;
        Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar61 < 1) {
            uVar61 = 0;
          }
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          if (iVar34 < 1) {
            iVar34 = 0;
          }
          uVar58 = (ulong)local_e8 & 0xffffffff;
          if ((int)local_e8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            pauVar37 = (undefined1 (*) [32])
                       ((long)local_100->w * uVar32 * local_100->elemsize + (long)local_100->data);
            pfVar36 = (float *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                               (long)local_100[1].data);
            pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            for (iVar29 = 0; iVar29 != iVar34; iVar29 = iVar29 + 1) {
              auVar80 = *pauVar37;
              for (uVar47 = 0; uVar49 = uVar61, uVar47 != uVar59; uVar47 = uVar47 + 1) {
                while (uVar49 != 0) {
                  fVar2 = pfVar36[1];
                  fVar14 = pfVar36[2];
                  fVar15 = pfVar36[3];
                  fVar16 = pfVar36[4];
                  fVar17 = pfVar36[5];
                  fVar18 = pfVar36[6];
                  fVar19 = pfVar36[7];
                  *pfVar43 = auVar80._0_4_ + *pfVar36;
                  pfVar43[1] = auVar80._4_4_ + fVar2;
                  pfVar43[2] = auVar80._8_4_ + fVar14;
                  pfVar43[3] = auVar80._12_4_ + fVar15;
                  pfVar43[4] = auVar80._16_4_ + fVar16;
                  pfVar43[5] = auVar80._20_4_ + fVar17;
                  pfVar43[6] = auVar80._24_4_ + fVar18;
                  pfVar43[7] = auVar80._28_4_ + fVar19;
                  pfVar36 = pfVar36 + 8;
                  pfVar43 = pfVar43 + 8;
                  uVar49 = uVar49 - 1;
                }
              }
              pauVar37 = pauVar37 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      local_d8 = CONCAT44(local_d8._4_4_,uVar47);
      local_100 = a;
      Mat::create(this_00,uVar49,uVar51,sVar48,iVar29,pAVar6);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar29 = local_100[1].dims;
      if (iVar29 == 1) {
        Mat::create(this_00,uVar49,uVar51,sVar48,(int)local_e0,opt->blob_allocator);
        pfVar36 = (float *)this_00->data;
        if (pfVar36 == (float *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        a = local_100;
        if ((int)local_d8 != 1 || local_100[1].w != 1) {
          pfVar43 = (float *)local_100->data;
          pfVar39 = (float *)local_100[1].data;
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
          if ((int)uVar51 < 1) {
            uVar51 = 0;
          }
          for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
            fVar2 = *pfVar39;
            fVar14 = pfVar39[1];
            fVar15 = pfVar39[2];
            fVar16 = pfVar39[3];
            fVar17 = pfVar39[4];
            fVar18 = pfVar39[5];
            fVar19 = pfVar39[6];
            fVar20 = pfVar39[7];
            uVar50 = uVar49;
            while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
              fVar21 = pfVar43[1];
              fVar22 = pfVar43[2];
              fVar23 = pfVar43[3];
              fVar24 = pfVar43[4];
              fVar25 = pfVar43[5];
              fVar26 = pfVar43[6];
              fVar27 = pfVar43[7];
              *pfVar36 = fVar2 + *pfVar43;
              pfVar36[1] = fVar14 + fVar21;
              pfVar36[2] = fVar15 + fVar22;
              pfVar36[3] = fVar16 + fVar23;
              pfVar36[4] = fVar17 + fVar24;
              pfVar36[5] = fVar18 + fVar25;
              pfVar36[6] = fVar19 + fVar26;
              pfVar36[7] = fVar20 + fVar27;
              pfVar43 = pfVar43 + 8;
              pfVar36 = pfVar36 + 8;
            }
            pfVar39 = pfVar39 + 8;
          }
          return 0;
        }
        goto LAB_003a3733;
      }
      break;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            if (iVar34 < 1) {
              iVar34 = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar37 = (undefined1 (*) [32])
                         (local_100->cstep * uVar32 * local_100->elemsize + (long)local_100->data);
              pfVar36 = (float *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                                 (long)local_100[1].data);
              pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              for (iVar29 = 0; iVar29 != iVar34; iVar29 = iVar29 + 1) {
                for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                  auVar80 = *pauVar37;
                  uVar49 = uVar61;
                  while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                    fVar2 = pfVar36[1];
                    fVar14 = pfVar36[2];
                    fVar15 = pfVar36[3];
                    fVar16 = pfVar36[4];
                    fVar17 = pfVar36[5];
                    fVar18 = pfVar36[6];
                    fVar19 = pfVar36[7];
                    *pfVar43 = auVar80._0_4_ + *pfVar36;
                    pfVar43[1] = auVar80._4_4_ + fVar2;
                    pfVar43[2] = auVar80._8_4_ + fVar14;
                    pfVar43[3] = auVar80._12_4_ + fVar15;
                    pfVar43[4] = auVar80._16_4_ + fVar16;
                    pfVar43[5] = auVar80._20_4_ + fVar17;
                    pfVar43[6] = auVar80._24_4_ + fVar18;
                    pfVar43[7] = auVar80._28_4_ + fVar19;
                    pfVar36 = pfVar36 + 8;
                    pfVar43 = pfVar43 + 8;
                  }
                  pauVar37 = pauVar37 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_100[1].dims != 1) {
          if (local_100[1].dims == 2) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pfVar36 = (float *)(local_100->cstep * uVar32 * local_100->elemsize +
                                 (long)local_100->data);
              pauVar37 = (undefined1 (*) [32])
                         ((long)local_100[1].w * uVar32 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                auVar80 = *pauVar37;
                uVar50 = uVar49;
                while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                  fVar2 = pfVar36[1];
                  fVar14 = pfVar36[2];
                  fVar15 = pfVar36[3];
                  fVar16 = pfVar36[4];
                  fVar17 = pfVar36[5];
                  fVar18 = pfVar36[6];
                  fVar19 = pfVar36[7];
                  *pfVar43 = auVar80._0_4_ + *pfVar36;
                  pfVar43[1] = auVar80._4_4_ + fVar2;
                  pfVar43[2] = auVar80._8_4_ + fVar14;
                  pfVar43[3] = auVar80._12_4_ + fVar15;
                  pfVar43[4] = auVar80._16_4_ + fVar16;
                  pfVar43[5] = auVar80._20_4_ + fVar17;
                  pfVar43[6] = auVar80._24_4_ + fVar18;
                  pfVar43[7] = auVar80._28_4_ + fVar19;
                  pfVar36 = pfVar36 + 8;
                  pfVar43 = pfVar43 + 8;
                }
                pauVar37 = pauVar37 + 1;
              }
            }
            return 0;
          }
          return 0;
        }
        a = local_100;
        if (uVar47 != 1 || local_100[1].w != 1) {
          if ((int)local_d0 < 1) {
            local_d0._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100->cstep;
            sVar5 = local_100->elemsize;
            pfVar36 = (float *)((long)local_100[1].data + uVar32 * 0x20);
            fVar2 = *pfVar36;
            fVar14 = pfVar36[1];
            fVar15 = pfVar36[2];
            fVar16 = pfVar36[3];
            fVar17 = pfVar36[4];
            fVar18 = pfVar36[5];
            fVar19 = pfVar36[6];
            fVar20 = pfVar36[7];
            pvVar9 = local_100->data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar41 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_d0;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
              fVar21 = pfVar36[1];
              fVar22 = pfVar36[2];
              fVar23 = pfVar36[3];
              fVar24 = pfVar36[4];
              fVar25 = pfVar36[5];
              fVar26 = pfVar36[6];
              fVar27 = pfVar36[7];
              pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
              *pfVar43 = fVar2 + *pfVar36;
              pfVar43[1] = fVar14 + fVar21;
              pfVar43[2] = fVar15 + fVar22;
              pfVar43[3] = fVar16 + fVar23;
              pfVar43[4] = fVar17 + fVar24;
              pfVar43[5] = fVar18 + fVar25;
              pfVar43[6] = fVar19 + fVar26;
              pfVar43[7] = fVar20 + fVar27;
              lVar40 = lVar40 + 0x20;
            }
          }
          return 0;
        }
        goto LAB_003a3733;
      }
      local_d8 = CONCAT44(local_d8._4_4_,uVar47);
      uVar31 = uVar3 ^ uVar50;
      if (((uVar61 ^ 1) == 0 && (uVar59 ^ 1) == 0) && uVar31 == 0) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_d0 < 1) {
            local_d0._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100->cstep;
            sVar5 = local_100->elemsize;
            sVar7 = this_00->cstep;
            pvVar9 = local_100->data;
            pfVar36 = (float *)((long)local_100[1].data +
                               local_100[1].cstep * uVar32 * local_100[1].elemsize);
            fVar2 = *pfVar36;
            fVar14 = pfVar36[1];
            fVar15 = pfVar36[2];
            fVar16 = pfVar36[3];
            fVar17 = pfVar36[4];
            fVar18 = pfVar36[5];
            fVar19 = pfVar36[6];
            fVar20 = pfVar36[7];
            sVar8 = this_00->elemsize;
            pvVar41 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_d0;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
              fVar21 = pfVar36[1];
              fVar22 = pfVar36[2];
              fVar23 = pfVar36[3];
              fVar24 = pfVar36[4];
              fVar25 = pfVar36[5];
              fVar26 = pfVar36[6];
              fVar27 = pfVar36[7];
              pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
              *pfVar43 = fVar2 + *pfVar36;
              pfVar43[1] = fVar14 + fVar21;
              pfVar43[2] = fVar15 + fVar22;
              pfVar43[3] = fVar16 + fVar23;
              pfVar43[4] = fVar17 + fVar24;
              pfVar43[5] = fVar18 + fVar25;
              pfVar43[6] = fVar19 + fVar26;
              pfVar43[7] = fVar20 + fVar27;
              lVar40 = lVar40 + 0x20;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((uVar61 == uVar49) && (uVar47 == 1 && (uVar3 == 1 && uVar59 == uVar51))) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_d0 < 1) {
            local_d0._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100->cstep;
            sVar5 = local_100->elemsize;
            pvVar9 = local_100[1].data;
            pvVar41 = local_100->data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar55 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_d0;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              fVar2 = *(float *)((long)pvVar9 + lVar40);
              pfVar36 = (float *)((long)pvVar41 + lVar40 * 8 + sVar48 * sVar5 * uVar32);
              auVar79._0_4_ = fVar2 + *pfVar36;
              auVar79._4_4_ = fVar2 + pfVar36[1];
              auVar79._8_4_ = fVar2 + pfVar36[2];
              auVar79._12_4_ = fVar2 + pfVar36[3];
              auVar79._16_4_ = fVar2 + pfVar36[4];
              auVar79._20_4_ = fVar2 + pfVar36[5];
              auVar79._24_4_ = fVar2 + pfVar36[6];
              auVar79._28_4_ = fVar2 + pfVar36[7];
              *(undefined1 (*) [32])((long)pvVar55 + lVar40 * 8 + sVar7 * sVar8 * uVar32) = auVar79;
              lVar40 = lVar40 + 4;
            }
          }
          return 0;
        }
        return -100;
      }
      local_d0 = (void *)sVar48;
      if (((uVar49 ^ 1) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) {
        local_100 = a;
        Mat::create(this_00,uVar61,uVar59,uVar50,sVar5,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_c8 < 1) {
            local_c8._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100[1].cstep;
            sVar5 = local_100[1].elemsize;
            sVar7 = this_00->cstep;
            pvVar9 = local_100[1].data;
            pfVar36 = (float *)((long)local_100->data +
                               local_100->cstep * uVar32 * local_100->elemsize);
            fVar2 = *pfVar36;
            fVar14 = pfVar36[1];
            fVar15 = pfVar36[2];
            fVar16 = pfVar36[3];
            fVar17 = pfVar36[4];
            fVar18 = pfVar36[5];
            fVar19 = pfVar36[6];
            fVar20 = pfVar36[7];
            sVar8 = this_00->elemsize;
            pvVar41 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_c8;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
              fVar21 = pfVar36[1];
              fVar22 = pfVar36[2];
              fVar23 = pfVar36[3];
              fVar24 = pfVar36[4];
              fVar25 = pfVar36[5];
              fVar26 = pfVar36[6];
              fVar27 = pfVar36[7];
              pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
              *pfVar43 = fVar2 + *pfVar36;
              pfVar43[1] = fVar14 + fVar21;
              pfVar43[2] = fVar15 + fVar22;
              pfVar43[3] = fVar16 + fVar23;
              pfVar43[4] = fVar17 + fVar24;
              pfVar43[5] = fVar18 + fVar25;
              pfVar43[6] = fVar19 + fVar26;
              pfVar43[7] = fVar20 + fVar27;
              lVar40 = lVar40 + 0x20;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar61 == uVar49) && (iVar29 == 1)) && (uVar59 == uVar51)) && (uVar50 == 1)) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar3,sVar5,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_c8 < 1) {
            local_c8._0_4_ = 0;
          }
          uVar58 = (ulong)local_e8 & 0xffffffff;
          if ((int)local_e8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100[1].cstep;
            sVar5 = local_100[1].elemsize;
            pvVar9 = local_100->data;
            pvVar41 = local_100[1].data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar55 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_c8;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              fVar2 = *(float *)((long)pvVar9 + lVar40);
              pfVar36 = (float *)((long)pvVar41 + lVar40 * 8 + sVar48 * sVar5 * uVar32);
              auVar82._0_4_ = fVar2 + *pfVar36;
              auVar82._4_4_ = fVar2 + pfVar36[1];
              auVar82._8_4_ = fVar2 + pfVar36[2];
              auVar82._12_4_ = fVar2 + pfVar36[3];
              auVar82._16_4_ = fVar2 + pfVar36[4];
              auVar82._20_4_ = fVar2 + pfVar36[5];
              auVar82._24_4_ = fVar2 + pfVar36[6];
              auVar82._28_4_ = fVar2 + pfVar36[7];
              *(undefined1 (*) [32])((long)pvVar55 + lVar40 * 8 + sVar7 * sVar8 * uVar32) = auVar82;
              lVar40 = lVar40 + 4;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar61 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar49 != 1) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
          uVar58 = (ulong)uVar51;
          if ((int)uVar51 < 1) {
            uVar58 = 0;
          }
          uVar32 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar32 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
            pfVar36 = (float *)(local_100->cstep * uVar33 * local_100->elemsize +
                               (long)local_100->data);
            sVar48 = local_100[1].cstep;
            sVar5 = local_100[1].elemsize;
            pvVar9 = local_100[1].data;
            pfVar43 = (float *)(this_00->cstep * uVar33 * this_00->elemsize + (long)this_00->data);
            for (uVar46 = 0; uVar46 != uVar58; uVar46 = uVar46 + 1) {
              auVar80 = *(undefined1 (*) [32])
                         ((long)pvVar9 + uVar46 * 0x20 + sVar48 * uVar33 * sVar5);
              uVar47 = uVar49;
              while (bVar64 = uVar47 != 0, uVar47 = uVar47 - 1, bVar64) {
                fVar2 = pfVar36[1];
                fVar14 = pfVar36[2];
                fVar15 = pfVar36[3];
                fVar16 = pfVar36[4];
                fVar17 = pfVar36[5];
                fVar18 = pfVar36[6];
                fVar19 = pfVar36[7];
                *pfVar43 = auVar80._0_4_ + *pfVar36;
                pfVar43[1] = auVar80._4_4_ + fVar2;
                pfVar43[2] = auVar80._8_4_ + fVar14;
                pfVar43[3] = auVar80._12_4_ + fVar15;
                pfVar43[4] = auVar80._16_4_ + fVar16;
                pfVar43[5] = auVar80._20_4_ + fVar17;
                pfVar43[6] = auVar80._24_4_ + fVar18;
                pfVar43[7] = auVar80._28_4_ + fVar19;
                pfVar36 = pfVar36 + 8;
                pfVar43 = pfVar43 + 8;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar59 ^ 1) == 0 && (uVar61 ^ uVar49) == 0) && uVar31 == 0) && uVar51 != 1) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
          if ((int)uVar51 < 1) {
            uVar51 = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            pvVar41 = (void *)(local_100->cstep * uVar32 * local_100->elemsize +
                              (long)local_100->data);
            sVar48 = local_100[1].cstep;
            pvVar55 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            sVar5 = local_100[1].elemsize;
            pvVar9 = local_100[1].data;
            for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
              for (lVar40 = 0; (ulong)uVar49 * 0x20 != lVar40; lVar40 = lVar40 + 0x20) {
                pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                pfVar43 = (float *)((long)pvVar41 + lVar40);
                auVar84._0_4_ = *pfVar36 + *pfVar43;
                auVar84._4_4_ = pfVar36[1] + pfVar43[1];
                auVar84._8_4_ = pfVar36[2] + pfVar43[2];
                auVar84._12_4_ = pfVar36[3] + pfVar43[3];
                auVar84._16_4_ = pfVar36[4] + pfVar43[4];
                auVar84._20_4_ = pfVar36[5] + pfVar43[5];
                auVar84._24_4_ = pfVar36[6] + pfVar43[6];
                auVar84._28_4_ = pfVar36[7] + pfVar43[7];
                *(undefined1 (*) [32])((long)pvVar55 + lVar40) = auVar84;
              }
              pvVar41 = (void *)((long)pvVar41 + lVar40);
              pvVar55 = (void *)((long)pvVar55 + lVar40);
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar49 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar61 != 1) {
        local_100 = a;
        Mat::create(this_00,uVar61,uVar51,uVar50,sVar5,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar61 < 1) {
            uVar61 = 0;
          }
          uVar58 = (ulong)uVar51;
          if ((int)uVar51 < 1) {
            uVar58 = 0;
          }
          uVar32 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar32 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
            sVar48 = local_100->cstep;
            sVar5 = local_100->elemsize;
            pvVar9 = local_100->data;
            pfVar36 = (float *)(local_100[1].cstep * uVar33 * local_100[1].elemsize +
                               (long)local_100[1].data);
            pfVar43 = (float *)(this_00->cstep * uVar33 * this_00->elemsize + (long)this_00->data);
            for (uVar46 = 0; uVar46 != uVar58; uVar46 = uVar46 + 1) {
              auVar80 = *(undefined1 (*) [32])
                         ((long)pvVar9 + uVar46 * 0x20 + sVar48 * uVar33 * sVar5);
              uVar47 = uVar61;
              while (bVar64 = uVar47 != 0, uVar47 = uVar47 - 1, bVar64) {
                fVar2 = pfVar36[1];
                fVar14 = pfVar36[2];
                fVar15 = pfVar36[3];
                fVar16 = pfVar36[4];
                fVar17 = pfVar36[5];
                fVar18 = pfVar36[6];
                fVar19 = pfVar36[7];
                *pfVar43 = auVar80._0_4_ + *pfVar36;
                pfVar43[1] = auVar80._4_4_ + fVar2;
                pfVar43[2] = auVar80._8_4_ + fVar14;
                pfVar43[3] = auVar80._12_4_ + fVar15;
                pfVar43[4] = auVar80._16_4_ + fVar16;
                pfVar43[5] = auVar80._20_4_ + fVar17;
                pfVar43[6] = auVar80._24_4_ + fVar18;
                pfVar43[7] = auVar80._28_4_ + fVar19;
                pfVar36 = pfVar36 + 8;
                pfVar43 = pfVar43 + 8;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar61 ^ uVar49) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) && uVar59 != 1) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar59,uVar50,sVar5,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100->cstep;
            pvVar41 = (void *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                              (long)local_100[1].data);
            pvVar55 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            sVar5 = local_100->elemsize;
            pvVar9 = local_100->data;
            for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
              for (lVar40 = 0; (ulong)uVar49 * 0x20 != lVar40; lVar40 = lVar40 + 0x20) {
                pfVar36 = (float *)((long)pvVar41 + lVar40);
                pfVar43 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                auVar85._0_4_ = *pfVar36 + *pfVar43;
                auVar85._4_4_ = pfVar36[1] + pfVar43[1];
                auVar85._8_4_ = pfVar36[2] + pfVar43[2];
                auVar85._12_4_ = pfVar36[3] + pfVar43[3];
                auVar85._16_4_ = pfVar36[4] + pfVar43[4];
                auVar85._20_4_ = pfVar36[5] + pfVar43[5];
                auVar85._24_4_ = pfVar36[6] + pfVar43[6];
                auVar85._28_4_ = pfVar36[7] + pfVar43[7];
                *(undefined1 (*) [32])((long)pvVar55 + lVar40) = auVar85;
              }
              pvVar41 = (void *)((long)pvVar41 + lVar40);
              pvVar55 = (void *)((long)pvVar55 + lVar40);
            }
          }
          return 0;
        }
        return -100;
      }
LAB_003a5fe5:
      local_d8 = CONCAT44(local_d8._4_4_,uVar47);
      local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
      local_100 = a;
      goto LAB_0039a79a;
    case 4:
      if (a[1].dims != 4) {
        local_d8 = CONCAT44(local_d8._4_4_,uVar47);
        local_b0 = opt;
        Mat::create(this_00,uVar49,uVar51,iVar35,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = a[1].dims;
        iVar34 = (int)local_f8;
        if (iVar29 != 1) {
          if (iVar29 == 3) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            if (iVar35 < 1) {
              iVar35 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if (iVar34 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pfVar36 = (float *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
              pauVar37 = (undefined1 (*) [32])
                         (a[1].cstep * uVar32 * a[1].elemsize + (long)a[1].data);
              pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              for (iVar29 = 0; iVar29 != iVar35; iVar29 = iVar29 + 1) {
                for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                  auVar80 = *pauVar37;
                  uVar50 = uVar49;
                  while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                    fVar2 = pfVar36[1];
                    fVar14 = pfVar36[2];
                    fVar15 = pfVar36[3];
                    fVar16 = pfVar36[4];
                    fVar17 = pfVar36[5];
                    fVar18 = pfVar36[6];
                    fVar19 = pfVar36[7];
                    *pfVar43 = auVar80._0_4_ + *pfVar36;
                    pfVar43[1] = auVar80._4_4_ + fVar2;
                    pfVar43[2] = auVar80._8_4_ + fVar14;
                    pfVar43[3] = auVar80._12_4_ + fVar15;
                    pfVar43[4] = auVar80._16_4_ + fVar16;
                    pfVar43[5] = auVar80._20_4_ + fVar17;
                    pfVar43[6] = auVar80._24_4_ + fVar18;
                    pfVar43[7] = auVar80._28_4_ + fVar19;
                    pfVar36 = pfVar36 + 8;
                    pfVar43 = pfVar43 + 8;
                  }
                  pauVar37 = pauVar37 + 1;
                }
              }
            }
            return 0;
          }
          if (iVar29 == 2) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            if (iVar35 < 1) {
              iVar35 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if (iVar34 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pfVar36 = (float *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
              pauVar37 = (undefined1 (*) [32])
                         ((long)a[1].w * uVar32 * a[1].elemsize + (long)a[1].data);
              pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              for (iVar29 = 0; iVar29 != iVar35; iVar29 = iVar29 + 1) {
                auVar80 = *pauVar37;
                for (uVar47 = 0; uVar50 = uVar49, uVar47 != uVar51; uVar47 = uVar47 + 1) {
                  while (uVar50 != 0) {
                    fVar2 = pfVar36[1];
                    fVar14 = pfVar36[2];
                    fVar15 = pfVar36[3];
                    fVar16 = pfVar36[4];
                    fVar17 = pfVar36[5];
                    fVar18 = pfVar36[6];
                    fVar19 = pfVar36[7];
                    *pfVar43 = auVar80._0_4_ + *pfVar36;
                    pfVar43[1] = auVar80._4_4_ + fVar2;
                    pfVar43[2] = auVar80._8_4_ + fVar14;
                    pfVar43[3] = auVar80._12_4_ + fVar15;
                    pfVar43[4] = auVar80._16_4_ + fVar16;
                    pfVar43[5] = auVar80._20_4_ + fVar17;
                    pfVar43[6] = auVar80._24_4_ + fVar18;
                    pfVar43[7] = auVar80._28_4_ + fVar19;
                    pfVar36 = pfVar36 + 8;
                    pfVar43 = pfVar43 + 8;
                    uVar50 = uVar50 - 1;
                  }
                }
                pauVar37 = pauVar37 + 1;
              }
            }
            return 0;
          }
          return 0;
        }
        opt = local_b0;
        if ((int)local_d8 != 1 || a[1].w != 1) {
          if ((int)local_d0 < 1) {
            local_d0._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if (iVar34 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = a->cstep;
            sVar5 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pvVar9 = this_00->data;
            pfVar36 = (float *)((long)a[1].data + uVar32 * 0x20);
            fVar2 = *pfVar36;
            fVar14 = pfVar36[1];
            fVar15 = pfVar36[2];
            fVar16 = pfVar36[3];
            fVar17 = pfVar36[4];
            fVar18 = pfVar36[5];
            fVar19 = pfVar36[6];
            fVar20 = pfVar36[7];
            sVar8 = a->elemsize;
            pvVar41 = a->data;
            lVar40 = 0;
            iVar29 = (int)local_d0;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              pfVar36 = (float *)((long)pvVar41 + lVar40 + sVar48 * sVar8 * uVar32);
              fVar21 = pfVar36[1];
              fVar22 = pfVar36[2];
              fVar23 = pfVar36[3];
              fVar24 = pfVar36[4];
              fVar25 = pfVar36[5];
              fVar26 = pfVar36[6];
              fVar27 = pfVar36[7];
              pfVar43 = (float *)((long)pvVar9 + lVar40 + sVar5 * sVar7 * uVar32);
              *pfVar43 = fVar2 + *pfVar36;
              pfVar43[1] = fVar14 + fVar21;
              pfVar43[2] = fVar15 + fVar22;
              pfVar43[3] = fVar16 + fVar23;
              pfVar43[4] = fVar17 + fVar24;
              pfVar43[5] = fVar18 + fVar25;
              pfVar43[6] = fVar19 + fVar26;
              pfVar43[7] = fVar20 + fVar27;
              lVar40 = lVar40 + 0x20;
            }
          }
          return 0;
        }
        goto LAB_003a3733;
      }
LAB_0039a78d:
      local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
      goto LAB_0039a79a;
    }
LAB_0039deeb:
    a = local_100;
    if (iVar29 != 2) {
      return 0;
    }
LAB_0039a79a:
    iVar29 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
                       (a,local_f0,this_00,opt);
    return iVar29;
  case 1:
    pMVar42 = b;
    break;
  case 2:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
    uVar49 = a->w;
    uVar51 = a->h;
    iVar35 = a->d;
    uVar50 = a->c;
    local_f8 = (__m256 *)(ulong)uVar50;
    local_d0 = (void *)CONCAT44(local_d0._4_4_,uVar51 * uVar49 * iVar35);
    sVar48 = a->elemsize;
    uVar61 = a[1].w;
    uVar59 = a[1].h;
    iVar34 = a[1].d;
    uVar3 = a[1].c;
    local_e8 = (__m256 *)(ulong)uVar3;
    local_c8 = (__m256 *)CONCAT44(local_c8._4_4_,uVar59 * uVar61 * iVar34);
    sVar5 = a[1].elemsize;
    switch(a->dims) {
    case 1:
      if (iVar29 != 1 || uVar49 != 1) {
        switch(a[1].dims) {
        case 1:
switchD_00398a6a_caseD_1:
          local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
          local_100 = a;
          Mat::create(this_00,uVar49,sVar48,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          a = local_100;
          if (uVar47 != 1 || local_100[1].w != 1) {
            binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_mul>
                      (local_100,local_f0,this_00,opt);
            return 0;
          }
          goto LAB_003a361f;
        case 2:
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,sVar5,uVar47,opt->blob_allocator);
          pfVar36 = (float *)this_00->data;
          if (pfVar36 == (float *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            pfVar43 = (float *)local_100->data;
            pfVar39 = (float *)local_100[1].data;
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
              fVar2 = *pfVar43;
              fVar14 = pfVar43[1];
              fVar15 = pfVar43[2];
              fVar16 = pfVar43[3];
              fVar17 = pfVar43[4];
              fVar18 = pfVar43[5];
              fVar19 = pfVar43[6];
              uVar49 = uVar61;
              while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                fVar20 = pfVar39[1];
                fVar21 = pfVar39[2];
                fVar22 = pfVar39[3];
                fVar23 = pfVar39[4];
                fVar24 = pfVar39[5];
                fVar25 = pfVar39[6];
                *pfVar36 = fVar2 * *pfVar39;
                pfVar36[1] = fVar14 * fVar20;
                pfVar36[2] = fVar15 * fVar21;
                pfVar36[3] = fVar16 * fVar22;
                pfVar36[4] = fVar17 * fVar23;
                pfVar36[5] = fVar18 * fVar24;
                pfVar36[6] = fVar19 * fVar25;
                pfVar36[7] = in_register_0000125c;
                pfVar39 = pfVar39 + 8;
                pfVar36 = pfVar36 + 8;
              }
              pfVar43 = pfVar43 + 8;
            }
            return 0;
          }
          return -100;
        case 3:
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,uVar3,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_c8 < 1) {
            local_c8._0_4_ = 0;
          }
          uVar58 = (ulong)local_e8 & 0xffffffff;
          if ((int)local_e8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100[1].cstep;
            sVar5 = local_100[1].elemsize;
            pfVar36 = (float *)((long)local_100->data + uVar32 * 0x20);
            fVar2 = *pfVar36;
            fVar14 = pfVar36[1];
            fVar15 = pfVar36[2];
            fVar16 = pfVar36[3];
            fVar17 = pfVar36[4];
            fVar18 = pfVar36[5];
            fVar19 = pfVar36[6];
            pvVar9 = local_100[1].data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar41 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_c8;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
              fVar20 = pfVar36[1];
              fVar21 = pfVar36[2];
              fVar22 = pfVar36[3];
              fVar23 = pfVar36[4];
              fVar24 = pfVar36[5];
              fVar25 = pfVar36[6];
              pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
              *pfVar43 = fVar2 * *pfVar36;
              pfVar43[1] = fVar14 * fVar20;
              pfVar43[2] = fVar15 * fVar21;
              pfVar43[3] = fVar16 * fVar22;
              pfVar43[4] = fVar17 * fVar23;
              pfVar43[5] = fVar18 * fVar24;
              pfVar43[6] = fVar19 * fVar25;
              pfVar43[7] = in_register_0000125c;
              lVar40 = lVar40 + 0x20;
            }
          }
          break;
        case 4:
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep == 0) {
            return -100;
          }
          if ((int)local_c8 < 1) {
            local_c8._0_4_ = 0;
          }
          uVar58 = (ulong)local_e8 & 0xffffffff;
          if ((int)local_e8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100[1].cstep;
            sVar5 = local_100[1].elemsize;
            pfVar36 = (float *)((long)local_100->data + uVar32 * 0x20);
            fVar2 = *pfVar36;
            fVar14 = pfVar36[1];
            fVar15 = pfVar36[2];
            fVar16 = pfVar36[3];
            fVar17 = pfVar36[4];
            fVar18 = pfVar36[5];
            fVar19 = pfVar36[6];
            pvVar9 = local_100[1].data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar41 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_c8;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
              fVar20 = pfVar36[1];
              fVar21 = pfVar36[2];
              fVar22 = pfVar36[3];
              fVar23 = pfVar36[4];
              fVar24 = pfVar36[5];
              fVar25 = pfVar36[6];
              pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
              *pfVar43 = fVar2 * *pfVar36;
              pfVar43[1] = fVar14 * fVar20;
              pfVar43[2] = fVar15 * fVar21;
              pfVar43[3] = fVar16 * fVar22;
              pfVar43[4] = fVar17 * fVar23;
              pfVar43[5] = fVar18 * fVar24;
              pfVar43[6] = fVar19 * fVar25;
              pfVar43[7] = in_register_0000125c;
              lVar40 = lVar40 + 0x20;
            }
          }
          break;
        default:
          return 0;
        }
        return 0;
      }
      goto LAB_00398eb8;
    case 2:
      pAVar6 = opt->blob_allocator;
      if (a[1].dims == 3) {
        local_100 = a;
        Mat::create(this_00,uVar61,uVar59,uVar3,sVar5,uVar47,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar61 < 1) {
            uVar61 = 0;
          }
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          uVar58 = (ulong)local_e8 & 0xffffffff;
          if ((int)local_e8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            pauVar37 = (undefined1 (*) [32])
                       ((long)local_100->w * uVar32 * local_100->elemsize + (long)local_100->data);
            pfVar36 = (float *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                               (long)local_100[1].data);
            pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
              auVar80 = *pauVar37;
              uVar49 = uVar61;
              while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                fVar2 = pfVar36[1];
                fVar14 = pfVar36[2];
                fVar15 = pfVar36[3];
                fVar16 = pfVar36[4];
                fVar17 = pfVar36[5];
                fVar18 = pfVar36[6];
                *pfVar43 = auVar80._0_4_ * *pfVar36;
                pfVar43[1] = auVar80._4_4_ * fVar2;
                pfVar43[2] = auVar80._8_4_ * fVar14;
                pfVar43[3] = auVar80._12_4_ * fVar15;
                pfVar43[4] = auVar80._16_4_ * fVar16;
                pfVar43[5] = auVar80._20_4_ * fVar17;
                pfVar43[6] = auVar80._24_4_ * fVar18;
                pfVar43[7] = in_register_0000125c;
                pfVar36 = pfVar36 + 8;
                pfVar43 = pfVar43 + 8;
              }
              pauVar37 = pauVar37 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        local_100 = a;
        Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar61 < 1) {
            uVar61 = 0;
          }
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          if (iVar34 < 1) {
            iVar34 = 0;
          }
          uVar58 = (ulong)local_e8 & 0xffffffff;
          if ((int)local_e8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            pauVar37 = (undefined1 (*) [32])
                       ((long)local_100->w * uVar32 * local_100->elemsize + (long)local_100->data);
            pfVar36 = (float *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                               (long)local_100[1].data);
            pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            for (iVar29 = 0; iVar29 != iVar34; iVar29 = iVar29 + 1) {
              auVar80 = *pauVar37;
              for (uVar47 = 0; uVar49 = uVar61, uVar47 != uVar59; uVar47 = uVar47 + 1) {
                while (uVar49 != 0) {
                  fVar2 = pfVar36[1];
                  fVar14 = pfVar36[2];
                  fVar15 = pfVar36[3];
                  fVar16 = pfVar36[4];
                  fVar17 = pfVar36[5];
                  fVar18 = pfVar36[6];
                  *pfVar43 = auVar80._0_4_ * *pfVar36;
                  pfVar43[1] = auVar80._4_4_ * fVar2;
                  pfVar43[2] = auVar80._8_4_ * fVar14;
                  pfVar43[3] = auVar80._12_4_ * fVar15;
                  pfVar43[4] = auVar80._16_4_ * fVar16;
                  pfVar43[5] = auVar80._20_4_ * fVar17;
                  pfVar43[6] = auVar80._24_4_ * fVar18;
                  pfVar43[7] = in_register_0000125c;
                  pfVar36 = pfVar36 + 8;
                  pfVar43 = pfVar43 + 8;
                  uVar49 = uVar49 - 1;
                }
              }
              pauVar37 = pauVar37 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      local_d8 = CONCAT44(local_d8._4_4_,uVar47);
      local_100 = a;
      Mat::create(this_00,uVar49,uVar51,sVar48,iVar29,pAVar6);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar29 = local_100[1].dims;
      if (iVar29 == 1) {
        Mat::create(this_00,uVar49,uVar51,sVar48,(int)local_e0,opt->blob_allocator);
        pfVar36 = (float *)this_00->data;
        if (pfVar36 == (float *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        a = local_100;
        if ((int)local_d8 != 1 || local_100[1].w != 1) {
          pfVar43 = (float *)local_100->data;
          pfVar39 = (float *)local_100[1].data;
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
          if ((int)uVar51 < 1) {
            uVar51 = 0;
          }
          for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
            fVar2 = *pfVar39;
            fVar14 = pfVar39[1];
            fVar15 = pfVar39[2];
            fVar16 = pfVar39[3];
            fVar17 = pfVar39[4];
            fVar18 = pfVar39[5];
            fVar19 = pfVar39[6];
            uVar50 = uVar49;
            while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
              fVar20 = pfVar43[1];
              fVar21 = pfVar43[2];
              fVar22 = pfVar43[3];
              fVar23 = pfVar43[4];
              fVar24 = pfVar43[5];
              fVar25 = pfVar43[6];
              *pfVar36 = fVar2 * *pfVar43;
              pfVar36[1] = fVar14 * fVar20;
              pfVar36[2] = fVar15 * fVar21;
              pfVar36[3] = fVar16 * fVar22;
              pfVar36[4] = fVar17 * fVar23;
              pfVar36[5] = fVar18 * fVar24;
              pfVar36[6] = fVar19 * fVar25;
              pfVar36[7] = in_register_0000125c;
              pfVar43 = pfVar43 + 8;
              pfVar36 = pfVar36 + 8;
            }
            pfVar39 = pfVar39 + 8;
          }
          return 0;
        }
        goto LAB_003a361f;
      }
      break;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            if (iVar34 < 1) {
              iVar34 = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar37 = (undefined1 (*) [32])
                         (local_100->cstep * uVar32 * local_100->elemsize + (long)local_100->data);
              pfVar36 = (float *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                                 (long)local_100[1].data);
              pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              for (iVar29 = 0; iVar29 != iVar34; iVar29 = iVar29 + 1) {
                for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                  auVar80 = *pauVar37;
                  uVar49 = uVar61;
                  while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                    fVar2 = pfVar36[1];
                    fVar14 = pfVar36[2];
                    fVar15 = pfVar36[3];
                    fVar16 = pfVar36[4];
                    fVar17 = pfVar36[5];
                    fVar18 = pfVar36[6];
                    *pfVar43 = auVar80._0_4_ * *pfVar36;
                    pfVar43[1] = auVar80._4_4_ * fVar2;
                    pfVar43[2] = auVar80._8_4_ * fVar14;
                    pfVar43[3] = auVar80._12_4_ * fVar15;
                    pfVar43[4] = auVar80._16_4_ * fVar16;
                    pfVar43[5] = auVar80._20_4_ * fVar17;
                    pfVar43[6] = auVar80._24_4_ * fVar18;
                    pfVar43[7] = in_register_0000125c;
                    pfVar36 = pfVar36 + 8;
                    pfVar43 = pfVar43 + 8;
                  }
                  pauVar37 = pauVar37 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_100[1].dims != 1) {
          if (local_100[1].dims == 2) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pfVar36 = (float *)(local_100->cstep * uVar32 * local_100->elemsize +
                                 (long)local_100->data);
              pauVar37 = (undefined1 (*) [32])
                         ((long)local_100[1].w * uVar32 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                auVar80 = *pauVar37;
                uVar50 = uVar49;
                while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                  fVar2 = pfVar36[1];
                  fVar14 = pfVar36[2];
                  fVar15 = pfVar36[3];
                  fVar16 = pfVar36[4];
                  fVar17 = pfVar36[5];
                  fVar18 = pfVar36[6];
                  *pfVar43 = auVar80._0_4_ * *pfVar36;
                  pfVar43[1] = auVar80._4_4_ * fVar2;
                  pfVar43[2] = auVar80._8_4_ * fVar14;
                  pfVar43[3] = auVar80._12_4_ * fVar15;
                  pfVar43[4] = auVar80._16_4_ * fVar16;
                  pfVar43[5] = auVar80._20_4_ * fVar17;
                  pfVar43[6] = auVar80._24_4_ * fVar18;
                  pfVar43[7] = in_register_0000125c;
                  pfVar36 = pfVar36 + 8;
                  pfVar43 = pfVar43 + 8;
                }
                pauVar37 = pauVar37 + 1;
              }
            }
            return 0;
          }
          return 0;
        }
        a = local_100;
        if (uVar47 != 1 || local_100[1].w != 1) {
          if ((int)local_d0 < 1) {
            local_d0._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100->cstep;
            sVar5 = local_100->elemsize;
            pfVar36 = (float *)((long)local_100[1].data + uVar32 * 0x20);
            fVar2 = *pfVar36;
            fVar14 = pfVar36[1];
            fVar15 = pfVar36[2];
            fVar16 = pfVar36[3];
            fVar17 = pfVar36[4];
            fVar18 = pfVar36[5];
            fVar19 = pfVar36[6];
            pvVar9 = local_100->data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar41 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_d0;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
              fVar20 = pfVar36[1];
              fVar21 = pfVar36[2];
              fVar22 = pfVar36[3];
              fVar23 = pfVar36[4];
              fVar24 = pfVar36[5];
              fVar25 = pfVar36[6];
              pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
              *pfVar43 = fVar2 * *pfVar36;
              pfVar43[1] = fVar14 * fVar20;
              pfVar43[2] = fVar15 * fVar21;
              pfVar43[3] = fVar16 * fVar22;
              pfVar43[4] = fVar17 * fVar23;
              pfVar43[5] = fVar18 * fVar24;
              pfVar43[6] = fVar19 * fVar25;
              pfVar43[7] = in_register_0000125c;
              lVar40 = lVar40 + 0x20;
            }
          }
          return 0;
        }
        goto LAB_003a361f;
      }
      local_d8 = CONCAT44(local_d8._4_4_,uVar47);
      uVar31 = uVar3 ^ uVar50;
      if (((uVar61 ^ 1) == 0 && (uVar59 ^ 1) == 0) && uVar31 == 0) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_d0 < 1) {
            local_d0._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100->cstep;
            sVar5 = local_100->elemsize;
            sVar7 = this_00->cstep;
            pvVar9 = local_100->data;
            pfVar36 = (float *)((long)local_100[1].data +
                               local_100[1].cstep * uVar32 * local_100[1].elemsize);
            fVar2 = *pfVar36;
            fVar14 = pfVar36[1];
            fVar15 = pfVar36[2];
            fVar16 = pfVar36[3];
            fVar17 = pfVar36[4];
            fVar18 = pfVar36[5];
            fVar19 = pfVar36[6];
            sVar8 = this_00->elemsize;
            pvVar41 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_d0;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
              fVar20 = pfVar36[1];
              fVar21 = pfVar36[2];
              fVar22 = pfVar36[3];
              fVar23 = pfVar36[4];
              fVar24 = pfVar36[5];
              fVar25 = pfVar36[6];
              pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
              *pfVar43 = fVar2 * *pfVar36;
              pfVar43[1] = fVar14 * fVar20;
              pfVar43[2] = fVar15 * fVar21;
              pfVar43[3] = fVar16 * fVar22;
              pfVar43[4] = fVar17 * fVar23;
              pfVar43[5] = fVar18 * fVar24;
              pfVar43[6] = fVar19 * fVar25;
              pfVar43[7] = in_register_0000125c;
              lVar40 = lVar40 + 0x20;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((uVar61 == uVar49) && (uVar47 == 1 && (uVar3 == 1 && uVar59 == uVar51))) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_d0 < 1) {
            local_d0._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100->cstep;
            sVar5 = local_100->elemsize;
            pvVar9 = local_100[1].data;
            pvVar41 = local_100->data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar55 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_d0;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              fVar2 = *(float *)((long)pvVar9 + lVar40);
              pfVar36 = (float *)((long)pvVar41 + lVar40 * 8 + sVar48 * sVar5 * uVar32);
              auVar10._4_4_ = fVar2 * pfVar36[1];
              auVar10._0_4_ = fVar2 * *pfVar36;
              auVar10._8_4_ = fVar2 * pfVar36[2];
              auVar10._12_4_ = fVar2 * pfVar36[3];
              auVar10._16_4_ = fVar2 * pfVar36[4];
              auVar10._20_4_ = fVar2 * pfVar36[5];
              auVar10._24_4_ = fVar2 * pfVar36[6];
              auVar10._28_4_ = fVar2;
              *(undefined1 (*) [32])((long)pvVar55 + lVar40 * 8 + sVar7 * sVar8 * uVar32) = auVar10;
              lVar40 = lVar40 + 4;
            }
          }
          return 0;
        }
        return -100;
      }
      local_d0 = (void *)sVar48;
      if (((uVar49 ^ 1) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) {
        local_100 = a;
        Mat::create(this_00,uVar61,uVar59,uVar50,sVar5,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_c8 < 1) {
            local_c8._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100[1].cstep;
            sVar5 = local_100[1].elemsize;
            sVar7 = this_00->cstep;
            pvVar9 = local_100[1].data;
            pfVar36 = (float *)((long)local_100->data +
                               local_100->cstep * uVar32 * local_100->elemsize);
            fVar2 = *pfVar36;
            fVar14 = pfVar36[1];
            fVar15 = pfVar36[2];
            fVar16 = pfVar36[3];
            fVar17 = pfVar36[4];
            fVar18 = pfVar36[5];
            fVar19 = pfVar36[6];
            sVar8 = this_00->elemsize;
            pvVar41 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_c8;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
              fVar20 = pfVar36[1];
              fVar21 = pfVar36[2];
              fVar22 = pfVar36[3];
              fVar23 = pfVar36[4];
              fVar24 = pfVar36[5];
              fVar25 = pfVar36[6];
              pfVar43 = (float *)((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32);
              *pfVar43 = fVar2 * *pfVar36;
              pfVar43[1] = fVar14 * fVar20;
              pfVar43[2] = fVar15 * fVar21;
              pfVar43[3] = fVar16 * fVar22;
              pfVar43[4] = fVar17 * fVar23;
              pfVar43[5] = fVar18 * fVar24;
              pfVar43[6] = fVar19 * fVar25;
              pfVar43[7] = in_register_0000125c;
              lVar40 = lVar40 + 0x20;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((uVar61 == uVar49) && (iVar29 == 1)) && ((uVar59 == uVar51 && (uVar50 == 1)))) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar3,sVar5,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_c8 < 1) {
            local_c8._0_4_ = 0;
          }
          uVar58 = (ulong)local_e8 & 0xffffffff;
          if ((int)local_e8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100[1].cstep;
            sVar5 = local_100[1].elemsize;
            pvVar9 = local_100->data;
            pvVar41 = local_100[1].data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar55 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_c8;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              fVar2 = *(float *)((long)pvVar9 + lVar40);
              pfVar36 = (float *)((long)pvVar41 + lVar40 * 8 + sVar48 * sVar5 * uVar32);
              auVar11._4_4_ = fVar2 * pfVar36[1];
              auVar11._0_4_ = fVar2 * *pfVar36;
              auVar11._8_4_ = fVar2 * pfVar36[2];
              auVar11._12_4_ = fVar2 * pfVar36[3];
              auVar11._16_4_ = fVar2 * pfVar36[4];
              auVar11._20_4_ = fVar2 * pfVar36[5];
              auVar11._24_4_ = fVar2 * pfVar36[6];
              auVar11._28_4_ = fVar2;
              *(undefined1 (*) [32])((long)pvVar55 + lVar40 * 8 + sVar7 * sVar8 * uVar32) = auVar11;
              lVar40 = lVar40 + 4;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar61 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar49 != 1) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
          uVar58 = (ulong)uVar51;
          if ((int)uVar51 < 1) {
            uVar58 = 0;
          }
          uVar32 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar32 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
            pfVar36 = (float *)(local_100->cstep * uVar33 * local_100->elemsize +
                               (long)local_100->data);
            sVar48 = local_100[1].cstep;
            sVar5 = local_100[1].elemsize;
            pvVar9 = local_100[1].data;
            pfVar43 = (float *)(this_00->cstep * uVar33 * this_00->elemsize + (long)this_00->data);
            for (uVar46 = 0; uVar46 != uVar58; uVar46 = uVar46 + 1) {
              auVar80 = *(undefined1 (*) [32])
                         ((long)pvVar9 + uVar46 * 0x20 + sVar48 * uVar33 * sVar5);
              uVar47 = uVar49;
              while (bVar64 = uVar47 != 0, uVar47 = uVar47 - 1, bVar64) {
                fVar2 = pfVar36[1];
                fVar14 = pfVar36[2];
                fVar15 = pfVar36[3];
                fVar16 = pfVar36[4];
                fVar17 = pfVar36[5];
                fVar18 = pfVar36[6];
                *pfVar43 = auVar80._0_4_ * *pfVar36;
                pfVar43[1] = auVar80._4_4_ * fVar2;
                pfVar43[2] = auVar80._8_4_ * fVar14;
                pfVar43[3] = auVar80._12_4_ * fVar15;
                pfVar43[4] = auVar80._16_4_ * fVar16;
                pfVar43[5] = auVar80._20_4_ * fVar17;
                pfVar43[6] = auVar80._24_4_ * fVar18;
                pfVar43[7] = in_register_0000125c;
                pfVar36 = pfVar36 + 8;
                pfVar43 = pfVar43 + 8;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar59 ^ 1) == 0 && (uVar61 ^ uVar49) == 0) && uVar31 == 0) && uVar51 != 1) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
          if ((int)uVar51 < 1) {
            uVar51 = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            pvVar41 = (void *)(local_100->cstep * uVar32 * local_100->elemsize +
                              (long)local_100->data);
            sVar48 = local_100[1].cstep;
            pvVar55 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            sVar5 = local_100[1].elemsize;
            pvVar9 = local_100[1].data;
            for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
              for (lVar40 = 0; (ulong)uVar49 * 0x20 != lVar40; lVar40 = lVar40 + 0x20) {
                pfVar36 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                pfVar43 = (float *)((long)pvVar41 + lVar40);
                auVar12._4_4_ = pfVar36[1] * pfVar43[1];
                auVar12._0_4_ = *pfVar36 * *pfVar43;
                auVar12._8_4_ = pfVar36[2] * pfVar43[2];
                auVar12._12_4_ = pfVar36[3] * pfVar43[3];
                auVar12._16_4_ = pfVar36[4] * pfVar43[4];
                auVar12._20_4_ = pfVar36[5] * pfVar43[5];
                auVar12._24_4_ = pfVar36[6] * pfVar43[6];
                auVar12._28_4_ = pfVar36[7];
                *(undefined1 (*) [32])((long)pvVar55 + lVar40) = auVar12;
              }
              pvVar41 = (void *)((long)pvVar41 + lVar40);
              pvVar55 = (void *)((long)pvVar55 + lVar40);
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar49 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar61 != 1) {
        local_100 = a;
        Mat::create(this_00,uVar61,uVar51,uVar50,sVar5,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar61 < 1) {
            uVar61 = 0;
          }
          uVar58 = (ulong)uVar51;
          if ((int)uVar51 < 1) {
            uVar58 = 0;
          }
          uVar32 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar32 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
            sVar48 = local_100->cstep;
            sVar5 = local_100->elemsize;
            pvVar9 = local_100->data;
            pfVar36 = (float *)(local_100[1].cstep * uVar33 * local_100[1].elemsize +
                               (long)local_100[1].data);
            pfVar43 = (float *)(this_00->cstep * uVar33 * this_00->elemsize + (long)this_00->data);
            for (uVar46 = 0; uVar46 != uVar58; uVar46 = uVar46 + 1) {
              auVar80 = *(undefined1 (*) [32])
                         ((long)pvVar9 + uVar46 * 0x20 + sVar48 * uVar33 * sVar5);
              uVar47 = uVar61;
              while (bVar64 = uVar47 != 0, uVar47 = uVar47 - 1, bVar64) {
                fVar2 = pfVar36[1];
                fVar14 = pfVar36[2];
                fVar15 = pfVar36[3];
                fVar16 = pfVar36[4];
                fVar17 = pfVar36[5];
                fVar18 = pfVar36[6];
                *pfVar43 = auVar80._0_4_ * *pfVar36;
                pfVar43[1] = auVar80._4_4_ * fVar2;
                pfVar43[2] = auVar80._8_4_ * fVar14;
                pfVar43[3] = auVar80._12_4_ * fVar15;
                pfVar43[4] = auVar80._16_4_ * fVar16;
                pfVar43[5] = auVar80._20_4_ * fVar17;
                pfVar43[6] = auVar80._24_4_ * fVar18;
                pfVar43[7] = in_register_0000125c;
                pfVar36 = pfVar36 + 8;
                pfVar43 = pfVar43 + 8;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar61 ^ uVar49) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) && uVar59 != 1) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar59,uVar50,sVar5,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100->cstep;
            pvVar41 = (void *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                              (long)local_100[1].data);
            pvVar55 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            sVar5 = local_100->elemsize;
            pvVar9 = local_100->data;
            for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
              for (lVar40 = 0; (ulong)uVar49 * 0x20 != lVar40; lVar40 = lVar40 + 0x20) {
                pfVar36 = (float *)((long)pvVar41 + lVar40);
                pfVar43 = (float *)((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32);
                auVar13._4_4_ = pfVar36[1] * pfVar43[1];
                auVar13._0_4_ = *pfVar36 * *pfVar43;
                auVar13._8_4_ = pfVar36[2] * pfVar43[2];
                auVar13._12_4_ = pfVar36[3] * pfVar43[3];
                auVar13._16_4_ = pfVar36[4] * pfVar43[4];
                auVar13._20_4_ = pfVar36[5] * pfVar43[5];
                auVar13._24_4_ = pfVar36[6] * pfVar43[6];
                auVar13._28_4_ = pfVar36[7];
                *(undefined1 (*) [32])((long)pvVar55 + lVar40) = auVar13;
              }
              pvVar41 = (void *)((long)pvVar41 + lVar40);
              pvVar55 = (void *)((long)pvVar55 + lVar40);
            }
          }
          return 0;
        }
        return -100;
      }
LAB_003a5ebd:
      local_d8 = CONCAT44(local_d8._4_4_,uVar47);
      local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
      local_100 = a;
      goto LAB_0039a549;
    case 4:
      if (a[1].dims != 4) {
        local_d8 = CONCAT44(local_d8._4_4_,uVar47);
        local_b0 = opt;
        Mat::create(this_00,uVar49,uVar51,iVar35,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = a[1].dims;
        iVar34 = (int)local_f8;
        if (iVar29 != 1) {
          if (iVar29 == 3) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            if (iVar35 < 1) {
              iVar35 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if (iVar34 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pfVar36 = (float *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
              pauVar37 = (undefined1 (*) [32])
                         (a[1].cstep * uVar32 * a[1].elemsize + (long)a[1].data);
              pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              for (iVar29 = 0; iVar29 != iVar35; iVar29 = iVar29 + 1) {
                for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                  auVar80 = *pauVar37;
                  uVar50 = uVar49;
                  while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                    fVar2 = pfVar36[1];
                    fVar14 = pfVar36[2];
                    fVar15 = pfVar36[3];
                    fVar16 = pfVar36[4];
                    fVar17 = pfVar36[5];
                    fVar18 = pfVar36[6];
                    *pfVar43 = auVar80._0_4_ * *pfVar36;
                    pfVar43[1] = auVar80._4_4_ * fVar2;
                    pfVar43[2] = auVar80._8_4_ * fVar14;
                    pfVar43[3] = auVar80._12_4_ * fVar15;
                    pfVar43[4] = auVar80._16_4_ * fVar16;
                    pfVar43[5] = auVar80._20_4_ * fVar17;
                    pfVar43[6] = auVar80._24_4_ * fVar18;
                    pfVar43[7] = in_register_0000125c;
                    pfVar36 = pfVar36 + 8;
                    pfVar43 = pfVar43 + 8;
                  }
                  pauVar37 = pauVar37 + 1;
                }
              }
            }
            return 0;
          }
          if (iVar29 == 2) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            if (iVar35 < 1) {
              iVar35 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if (iVar34 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pfVar36 = (float *)(a->cstep * uVar32 * a->elemsize + (long)a->data);
              pauVar37 = (undefined1 (*) [32])
                         ((long)a[1].w * uVar32 * a[1].elemsize + (long)a[1].data);
              pfVar43 = (float *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data)
              ;
              for (iVar29 = 0; iVar29 != iVar35; iVar29 = iVar29 + 1) {
                auVar80 = *pauVar37;
                for (uVar47 = 0; uVar50 = uVar49, uVar47 != uVar51; uVar47 = uVar47 + 1) {
                  while (uVar50 != 0) {
                    fVar2 = pfVar36[1];
                    fVar14 = pfVar36[2];
                    fVar15 = pfVar36[3];
                    fVar16 = pfVar36[4];
                    fVar17 = pfVar36[5];
                    fVar18 = pfVar36[6];
                    *pfVar43 = auVar80._0_4_ * *pfVar36;
                    pfVar43[1] = auVar80._4_4_ * fVar2;
                    pfVar43[2] = auVar80._8_4_ * fVar14;
                    pfVar43[3] = auVar80._12_4_ * fVar15;
                    pfVar43[4] = auVar80._16_4_ * fVar16;
                    pfVar43[5] = auVar80._20_4_ * fVar17;
                    pfVar43[6] = auVar80._24_4_ * fVar18;
                    pfVar43[7] = in_register_0000125c;
                    pfVar36 = pfVar36 + 8;
                    pfVar43 = pfVar43 + 8;
                    uVar50 = uVar50 - 1;
                  }
                }
                pauVar37 = pauVar37 + 1;
              }
            }
            return 0;
          }
          return 0;
        }
        opt = local_b0;
        if ((int)local_d8 != 1 || a[1].w != 1) {
          if ((int)local_d0 < 1) {
            local_d0._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if (iVar34 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = a->cstep;
            sVar5 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pvVar9 = this_00->data;
            pfVar36 = (float *)((long)a[1].data + uVar32 * 0x20);
            fVar2 = *pfVar36;
            fVar14 = pfVar36[1];
            fVar15 = pfVar36[2];
            fVar16 = pfVar36[3];
            fVar17 = pfVar36[4];
            fVar18 = pfVar36[5];
            fVar19 = pfVar36[6];
            sVar8 = a->elemsize;
            pvVar41 = a->data;
            lVar40 = 0;
            iVar29 = (int)local_d0;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              pfVar36 = (float *)((long)pvVar41 + lVar40 + sVar48 * sVar8 * uVar32);
              fVar20 = pfVar36[1];
              fVar21 = pfVar36[2];
              fVar22 = pfVar36[3];
              fVar23 = pfVar36[4];
              fVar24 = pfVar36[5];
              fVar25 = pfVar36[6];
              pfVar43 = (float *)((long)pvVar9 + lVar40 + sVar5 * sVar7 * uVar32);
              *pfVar43 = fVar2 * *pfVar36;
              pfVar43[1] = fVar14 * fVar20;
              pfVar43[2] = fVar15 * fVar21;
              pfVar43[3] = fVar16 * fVar22;
              pfVar43[4] = fVar17 * fVar23;
              pfVar43[5] = fVar18 * fVar24;
              pfVar43[6] = fVar19 * fVar25;
              pfVar43[7] = in_register_0000125c;
              lVar40 = lVar40 + 0x20;
            }
          }
          return 0;
        }
        goto LAB_003a361f;
      }
LAB_0039a53c:
      local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
      goto LAB_0039a549;
    }
LAB_0039dd60:
    a = local_100;
    if (iVar29 != 2) {
      return 0;
    }
LAB_0039a549:
    iVar29 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_mul>
                       (a,local_f0,this_00,opt);
    return iVar29;
  case 3:
    pMVar42 = b;
    goto LAB_00398d4e;
  case 4:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
    uVar49 = a->w;
    uVar51 = a->h;
    iVar35 = a->d;
    uVar50 = a->c;
    local_f8 = (__m256 *)(ulong)uVar50;
    local_d0 = (void *)CONCAT44(local_d0._4_4_,uVar51 * uVar49 * iVar35);
    sVar48 = a->elemsize;
    uVar61 = a[1].w;
    uVar59 = a[1].h;
    iVar34 = a[1].d;
    uVar3 = a[1].c;
    local_e8 = (__m256 *)(ulong)uVar3;
    local_c8 = (__m256 *)CONCAT44(local_c8._4_4_,uVar59 * uVar61 * iVar34);
    sVar5 = a[1].elemsize;
    switch(a->dims) {
    case 1:
      if (iVar29 != 1 || uVar49 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_00398908_caseD_1;
        case 2:
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,sVar5,uVar47,opt->blob_allocator);
          pauVar37 = (undefined1 (*) [32])this_00->data;
          if (pauVar37 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            pauVar38 = (undefined1 (*) [32])local_100->data;
            pauVar44 = (undefined1 (*) [32])local_100[1].data;
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
              auVar80 = *pauVar38;
              uVar49 = uVar61;
              while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                auVar83 = vmaxps_avx(auVar80,*pauVar44);
                *pauVar37 = auVar83;
                pauVar44 = pauVar44 + 1;
                pauVar37 = pauVar37 + 1;
              }
              pauVar38 = pauVar38 + 1;
            }
            return 0;
          }
          return -100;
        case 3:
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,uVar3,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100[1].cstep;
              sVar5 = local_100[1].elemsize;
              auVar80 = *(undefined1 (*) [32])((long)local_100->data + uVar32 * 0x20);
              pvVar9 = local_100[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar41 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                auVar83 = vmaxps_avx(auVar80,*(undefined1 (*) [32])
                                              ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
                *(undefined1 (*) [32])((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32) = auVar83;
                lVar40 = lVar40 + 0x20;
              }
            }
            return 0;
          }
          return -100;
        case 4:
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100[1].cstep;
              sVar5 = local_100[1].elemsize;
              auVar80 = *(undefined1 (*) [32])((long)local_100->data + uVar32 * 0x20);
              pvVar9 = local_100[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar41 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                auVar83 = vmaxps_avx(auVar80,*(undefined1 (*) [32])
                                              ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
                *(undefined1 (*) [32])((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32) = auVar83;
                lVar40 = lVar40 + 0x20;
              }
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      goto LAB_00398dfd;
    case 2:
      pAVar6 = opt->blob_allocator;
      if (a[1].dims == 3) {
        local_100 = a;
        Mat::create(this_00,uVar61,uVar59,uVar3,sVar5,uVar47,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar61 < 1) {
            uVar61 = 0;
          }
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          uVar58 = (ulong)local_e8 & 0xffffffff;
          if ((int)local_e8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            pauVar37 = (undefined1 (*) [32])
                       ((long)local_100->w * uVar32 * local_100->elemsize + (long)local_100->data);
            pauVar38 = (undefined1 (*) [32])
                       (local_100[1].cstep * uVar32 * local_100[1].elemsize +
                       (long)local_100[1].data);
            pauVar44 = (undefined1 (*) [32])
                       (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
              auVar80 = *pauVar37;
              uVar49 = uVar61;
              while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                auVar83 = vmaxps_avx(auVar80,*pauVar38);
                *pauVar44 = auVar83;
                pauVar38 = pauVar38 + 1;
                pauVar44 = pauVar44 + 1;
              }
              pauVar37 = pauVar37 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        local_100 = a;
        Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar61 < 1) {
            uVar61 = 0;
          }
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          if (iVar34 < 1) {
            iVar34 = 0;
          }
          uVar58 = (ulong)local_e8 & 0xffffffff;
          if ((int)local_e8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            pauVar37 = (undefined1 (*) [32])
                       ((long)local_100->w * uVar32 * local_100->elemsize + (long)local_100->data);
            pauVar38 = (undefined1 (*) [32])
                       (local_100[1].cstep * uVar32 * local_100[1].elemsize +
                       (long)local_100[1].data);
            pauVar44 = (undefined1 (*) [32])
                       (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            for (iVar29 = 0; iVar29 != iVar34; iVar29 = iVar29 + 1) {
              auVar80 = *pauVar37;
              for (uVar47 = 0; uVar49 = uVar61, uVar47 != uVar59; uVar47 = uVar47 + 1) {
                while (uVar49 != 0) {
                  auVar83 = vmaxps_avx(auVar80,*pauVar38);
                  *pauVar44 = auVar83;
                  pauVar38 = pauVar38 + 1;
                  pauVar44 = pauVar44 + 1;
                  uVar49 = uVar49 - 1;
                }
              }
              pauVar37 = pauVar37 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      local_d8 = CONCAT44(local_d8._4_4_,uVar47);
      local_100 = a;
      Mat::create(this_00,uVar49,uVar51,sVar48,iVar29,pAVar6);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar29 = local_100[1].dims;
      if (iVar29 == 1) {
        Mat::create(this_00,uVar49,uVar51,sVar48,(int)local_e0,opt->blob_allocator);
        pauVar37 = (undefined1 (*) [32])this_00->data;
        if (pauVar37 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        a = local_100;
        if ((int)local_d8 != 1 || local_100[1].w != 1) {
          pauVar38 = (undefined1 (*) [32])local_100->data;
          pauVar44 = (undefined1 (*) [32])local_100[1].data;
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
          if ((int)uVar51 < 1) {
            uVar51 = 0;
          }
          for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
            auVar80 = *pauVar44;
            uVar50 = uVar49;
            while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
              auVar83 = vmaxps_avx(auVar80,*pauVar38);
              *pauVar37 = auVar83;
              pauVar38 = pauVar38 + 1;
              pauVar37 = pauVar37 + 1;
            }
            pauVar44 = pauVar44 + 1;
          }
          return 0;
        }
        goto LAB_003a346d;
      }
      break;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            if (iVar34 < 1) {
              iVar34 = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar37 = (undefined1 (*) [32])
                         (local_100->cstep * uVar32 * local_100->elemsize + (long)local_100->data);
              pauVar38 = (undefined1 (*) [32])
                         (local_100[1].cstep * uVar32 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pauVar44 = (undefined1 (*) [32])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              for (iVar29 = 0; iVar29 != iVar34; iVar29 = iVar29 + 1) {
                for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                  auVar80 = *pauVar37;
                  uVar49 = uVar61;
                  while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                    auVar83 = vmaxps_avx(auVar80,*pauVar38);
                    *pauVar44 = auVar83;
                    pauVar38 = pauVar38 + 1;
                    pauVar44 = pauVar44 + 1;
                  }
                  pauVar37 = pauVar37 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_100[1].dims != 1) {
          if (local_100[1].dims == 2) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar37 = (undefined1 (*) [32])
                         (local_100->cstep * uVar32 * local_100->elemsize + (long)local_100->data);
              pauVar38 = (undefined1 (*) [32])
                         ((long)local_100[1].w * uVar32 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pauVar44 = (undefined1 (*) [32])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                auVar80 = *pauVar38;
                uVar50 = uVar49;
                while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                  auVar83 = vmaxps_avx(auVar80,*pauVar37);
                  *pauVar44 = auVar83;
                  pauVar37 = pauVar37 + 1;
                  pauVar44 = pauVar44 + 1;
                }
                pauVar38 = pauVar38 + 1;
              }
            }
            return 0;
          }
          return 0;
        }
        a = local_100;
        if (uVar47 != 1 || local_100[1].w != 1) {
          if ((int)local_d0 < 1) {
            local_d0._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100->cstep;
            sVar5 = local_100->elemsize;
            auVar80 = *(undefined1 (*) [32])((long)local_100[1].data + uVar32 * 0x20);
            pvVar9 = local_100->data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar41 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_d0;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              auVar83 = vmaxps_avx(auVar80,*(undefined1 (*) [32])
                                            ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
              *(undefined1 (*) [32])((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32) = auVar83;
              lVar40 = lVar40 + 0x20;
            }
          }
          return 0;
        }
        goto LAB_003a346d;
      }
      local_d8 = CONCAT44(local_d8._4_4_,uVar47);
      uVar31 = uVar3 ^ uVar50;
      if (((uVar61 ^ 1) == 0 && (uVar59 ^ 1) == 0) && uVar31 == 0) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_d0 < 1) {
            local_d0._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100->cstep;
            sVar5 = local_100->elemsize;
            sVar7 = this_00->cstep;
            pvVar9 = local_100->data;
            auVar80 = *(undefined1 (*) [32])
                       ((long)local_100[1].data +
                       local_100[1].cstep * uVar32 * local_100[1].elemsize);
            sVar8 = this_00->elemsize;
            pvVar41 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_d0;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              auVar83 = vmaxps_avx(auVar80,*(undefined1 (*) [32])
                                            ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
              *(undefined1 (*) [32])((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32) = auVar83;
              lVar40 = lVar40 + 0x20;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((uVar61 == uVar49) && (uVar47 == 1 && (uVar3 == 1 && uVar59 == uVar51))) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_d0 < 1) {
            local_d0._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100->cstep;
            sVar5 = local_100->elemsize;
            pvVar9 = local_100[1].data;
            pvVar41 = local_100->data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar55 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_d0;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              uVar1 = *(undefined4 *)((long)pvVar9 + lVar40);
              auVar78._4_4_ = uVar1;
              auVar78._0_4_ = uVar1;
              auVar78._8_4_ = uVar1;
              auVar78._12_4_ = uVar1;
              auVar78._16_4_ = uVar1;
              auVar78._20_4_ = uVar1;
              auVar78._24_4_ = uVar1;
              auVar78._28_4_ = uVar1;
              auVar80 = vmaxps_avx(auVar78,*(undefined1 (*) [32])
                                            ((long)pvVar41 + lVar40 * 8 + sVar48 * sVar5 * uVar32));
              *(undefined1 (*) [32])((long)pvVar55 + lVar40 * 8 + sVar7 * sVar8 * uVar32) = auVar80;
              lVar40 = lVar40 + 4;
            }
          }
          return 0;
        }
        return -100;
      }
      local_d0 = (void *)sVar48;
      if (((uVar49 ^ 1) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) {
        local_100 = a;
        Mat::create(this_00,uVar61,uVar59,uVar50,sVar5,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_c8 < 1) {
            local_c8._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100[1].cstep;
            sVar5 = local_100[1].elemsize;
            sVar7 = this_00->cstep;
            pvVar9 = local_100[1].data;
            auVar80 = *(undefined1 (*) [32])
                       ((long)local_100->data + local_100->cstep * uVar32 * local_100->elemsize);
            sVar8 = this_00->elemsize;
            pvVar41 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_c8;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              auVar83 = vmaxps_avx(auVar80,*(undefined1 (*) [32])
                                            ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
              *(undefined1 (*) [32])((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32) = auVar83;
              lVar40 = lVar40 + 0x20;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar61 == uVar49) && (iVar29 == 1)) && (uVar59 == uVar51)) && (uVar50 == 1)) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar3,sVar5,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_c8 < 1) {
            local_c8._0_4_ = 0;
          }
          uVar58 = (ulong)local_e8 & 0xffffffff;
          if ((int)local_e8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100[1].cstep;
            sVar5 = local_100[1].elemsize;
            pvVar9 = local_100->data;
            pvVar41 = local_100[1].data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar55 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_c8;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              uVar1 = *(undefined4 *)((long)pvVar9 + lVar40);
              auVar81._4_4_ = uVar1;
              auVar81._0_4_ = uVar1;
              auVar81._8_4_ = uVar1;
              auVar81._12_4_ = uVar1;
              auVar81._16_4_ = uVar1;
              auVar81._20_4_ = uVar1;
              auVar81._24_4_ = uVar1;
              auVar81._28_4_ = uVar1;
              auVar80 = vmaxps_avx(auVar81,*(undefined1 (*) [32])
                                            ((long)pvVar41 + lVar40 * 8 + sVar48 * sVar5 * uVar32));
              *(undefined1 (*) [32])((long)pvVar55 + lVar40 * 8 + sVar7 * sVar8 * uVar32) = auVar80;
              lVar40 = lVar40 + 4;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar61 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar49 != 1) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
          uVar58 = (ulong)uVar51;
          if ((int)uVar51 < 1) {
            uVar58 = 0;
          }
          uVar32 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar32 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
            pauVar37 = (undefined1 (*) [32])
                       (local_100->cstep * uVar33 * local_100->elemsize + (long)local_100->data);
            sVar48 = local_100[1].cstep;
            sVar5 = local_100[1].elemsize;
            pvVar9 = local_100[1].data;
            pauVar38 = (undefined1 (*) [32])
                       (this_00->cstep * uVar33 * this_00->elemsize + (long)this_00->data);
            for (uVar46 = 0; uVar46 != uVar58; uVar46 = uVar46 + 1) {
              auVar80 = *(undefined1 (*) [32])
                         ((long)pvVar9 + uVar46 * 0x20 + sVar48 * uVar33 * sVar5);
              uVar47 = uVar49;
              while (bVar64 = uVar47 != 0, uVar47 = uVar47 - 1, bVar64) {
                auVar83 = vmaxps_avx(auVar80,*pauVar37);
                *pauVar38 = auVar83;
                pauVar37 = pauVar37 + 1;
                pauVar38 = pauVar38 + 1;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar59 ^ 1) == 0 && (uVar61 ^ uVar49) == 0) && uVar31 == 0) && uVar51 != 1) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
          if ((int)uVar51 < 1) {
            uVar51 = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            pvVar41 = (void *)(local_100->cstep * uVar32 * local_100->elemsize +
                              (long)local_100->data);
            sVar48 = local_100[1].cstep;
            pvVar55 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            sVar5 = local_100[1].elemsize;
            pvVar9 = local_100[1].data;
            for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
              for (lVar40 = 0; (ulong)uVar49 * 0x20 != lVar40; lVar40 = lVar40 + 0x20) {
                auVar80 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar41 + lVar40),
                                     *(undefined1 (*) [32])
                                      ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
                *(undefined1 (*) [32])((long)pvVar55 + lVar40) = auVar80;
              }
              pvVar41 = (void *)((long)pvVar41 + lVar40);
              pvVar55 = (void *)((long)pvVar55 + lVar40);
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar49 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar61 != 1) {
        local_100 = a;
        Mat::create(this_00,uVar61,uVar51,uVar50,sVar5,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar61 < 1) {
            uVar61 = 0;
          }
          uVar58 = (ulong)uVar51;
          if ((int)uVar51 < 1) {
            uVar58 = 0;
          }
          uVar32 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar32 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
            sVar48 = local_100->cstep;
            sVar5 = local_100->elemsize;
            pvVar9 = local_100->data;
            pauVar37 = (undefined1 (*) [32])
                       (local_100[1].cstep * uVar33 * local_100[1].elemsize +
                       (long)local_100[1].data);
            pauVar38 = (undefined1 (*) [32])
                       (this_00->cstep * uVar33 * this_00->elemsize + (long)this_00->data);
            for (uVar46 = 0; uVar46 != uVar58; uVar46 = uVar46 + 1) {
              auVar80 = *(undefined1 (*) [32])
                         ((long)pvVar9 + uVar46 * 0x20 + sVar48 * uVar33 * sVar5);
              uVar47 = uVar61;
              while (bVar64 = uVar47 != 0, uVar47 = uVar47 - 1, bVar64) {
                auVar83 = vmaxps_avx(auVar80,*pauVar37);
                *pauVar38 = auVar83;
                pauVar37 = pauVar37 + 1;
                pauVar38 = pauVar38 + 1;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar61 ^ uVar49) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) && uVar59 != 1) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar59,uVar50,sVar5,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100->cstep;
            pvVar41 = (void *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                              (long)local_100[1].data);
            pvVar55 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            sVar5 = local_100->elemsize;
            pvVar9 = local_100->data;
            for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
              for (lVar40 = 0; (ulong)uVar49 * 0x20 != lVar40; lVar40 = lVar40 + 0x20) {
                auVar80 = vmaxps_avx(*(undefined1 (*) [32])
                                      ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32),
                                     *(undefined1 (*) [32])((long)pvVar41 + lVar40));
                *(undefined1 (*) [32])((long)pvVar55 + lVar40) = auVar80;
              }
              pvVar41 = (void *)((long)pvVar41 + lVar40);
              pvVar55 = (void *)((long)pvVar55 + lVar40);
            }
          }
          return 0;
        }
        return -100;
      }
LAB_003a5d95:
      local_d8 = CONCAT44(local_d8._4_4_,uVar47);
      local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
      local_100 = a;
      goto LAB_0039a2f8;
    case 4:
      if (a[1].dims != 4) {
        local_d8 = CONCAT44(local_d8._4_4_,uVar47);
        local_b0 = opt;
        Mat::create(this_00,uVar49,uVar51,iVar35,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = a[1].dims;
        iVar34 = (int)local_f8;
        if (iVar29 != 1) {
          if (iVar29 == 3) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            if (iVar35 < 1) {
              iVar35 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if (iVar34 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar37 = (undefined1 (*) [32])(a->cstep * uVar32 * a->elemsize + (long)a->data);
              pauVar38 = (undefined1 (*) [32])
                         (a[1].cstep * uVar32 * a[1].elemsize + (long)a[1].data);
              pauVar44 = (undefined1 (*) [32])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              for (iVar29 = 0; iVar29 != iVar35; iVar29 = iVar29 + 1) {
                for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                  auVar80 = *pauVar38;
                  uVar50 = uVar49;
                  while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                    auVar83 = vmaxps_avx(auVar80,*pauVar37);
                    *pauVar44 = auVar83;
                    pauVar37 = pauVar37 + 1;
                    pauVar44 = pauVar44 + 1;
                  }
                  pauVar38 = pauVar38 + 1;
                }
              }
            }
            return 0;
          }
          if (iVar29 == 2) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            if (iVar35 < 1) {
              iVar35 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if (iVar34 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar37 = (undefined1 (*) [32])(a->cstep * uVar32 * a->elemsize + (long)a->data);
              pauVar38 = (undefined1 (*) [32])
                         ((long)a[1].w * uVar32 * a[1].elemsize + (long)a[1].data);
              pauVar44 = (undefined1 (*) [32])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              for (iVar29 = 0; iVar29 != iVar35; iVar29 = iVar29 + 1) {
                auVar80 = *pauVar38;
                for (uVar47 = 0; uVar50 = uVar49, uVar47 != uVar51; uVar47 = uVar47 + 1) {
                  while (uVar50 != 0) {
                    auVar83 = vmaxps_avx(auVar80,*pauVar37);
                    *pauVar44 = auVar83;
                    pauVar37 = pauVar37 + 1;
                    pauVar44 = pauVar44 + 1;
                    uVar50 = uVar50 - 1;
                  }
                }
                pauVar38 = pauVar38 + 1;
              }
            }
            return 0;
          }
          return 0;
        }
        opt = local_b0;
        if ((int)local_d8 != 1 || a[1].w != 1) {
          if ((int)local_d0 < 1) {
            local_d0._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if (iVar34 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = a->cstep;
            sVar5 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pvVar9 = this_00->data;
            auVar80 = *(undefined1 (*) [32])((long)a[1].data + uVar32 * 0x20);
            sVar8 = a->elemsize;
            pvVar41 = a->data;
            lVar40 = 0;
            iVar29 = (int)local_d0;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              auVar83 = vmaxps_avx(auVar80,*(undefined1 (*) [32])
                                            ((long)pvVar41 + lVar40 + sVar48 * sVar8 * uVar32));
              *(undefined1 (*) [32])((long)pvVar9 + lVar40 + sVar5 * sVar7 * uVar32) = auVar83;
              lVar40 = lVar40 + 0x20;
            }
          }
          return 0;
        }
        goto LAB_003a346d;
      }
LAB_0039a2eb:
      local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
      goto LAB_0039a2f8;
    }
LAB_0039d88c:
    a = local_100;
    if (iVar29 != 2) {
      return 0;
    }
LAB_0039a2f8:
    iVar29 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_max>
                       (a,local_f0,this_00,opt);
    return iVar29;
  case 5:
    if (3 < a->dims - 1U) {
      return 0;
    }
    local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
    uVar49 = a->w;
    uVar51 = a->h;
    iVar35 = a->d;
    uVar50 = a->c;
    local_f8 = (__m256 *)(ulong)uVar50;
    local_d0 = (void *)CONCAT44(local_d0._4_4_,uVar51 * uVar49 * iVar35);
    sVar48 = a->elemsize;
    uVar61 = a[1].w;
    uVar59 = a[1].h;
    iVar34 = a[1].d;
    uVar3 = a[1].c;
    local_e8 = (__m256 *)(ulong)uVar3;
    local_c8 = (__m256 *)CONCAT44(local_c8._4_4_,uVar59 * uVar61 * iVar34);
    sVar5 = a[1].elemsize;
    switch(a->dims) {
    case 1:
      if (iVar29 != 1 || uVar49 != 1) {
        switch(a[1].dims) {
        case 1:
          goto switchD_00398bf5_caseD_1;
        case 2:
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,sVar5,uVar47,opt->blob_allocator);
          pauVar37 = (undefined1 (*) [32])this_00->data;
          if (pauVar37 == (undefined1 (*) [32])0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            pauVar38 = (undefined1 (*) [32])local_100->data;
            pauVar44 = (undefined1 (*) [32])local_100[1].data;
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
              auVar80 = *pauVar38;
              uVar49 = uVar61;
              while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                auVar83 = vminps_avx(auVar80,*pauVar44);
                *pauVar37 = auVar83;
                pauVar44 = pauVar44 + 1;
                pauVar37 = pauVar37 + 1;
              }
              pauVar38 = pauVar38 + 1;
            }
            return 0;
          }
          return -100;
        case 3:
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,uVar3,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100[1].cstep;
              sVar5 = local_100[1].elemsize;
              auVar80 = *(undefined1 (*) [32])((long)local_100->data + uVar32 * 0x20);
              pvVar9 = local_100[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar41 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                auVar83 = vminps_avx(auVar80,*(undefined1 (*) [32])
                                              ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
                *(undefined1 (*) [32])((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32) = auVar83;
                lVar40 = lVar40 + 0x20;
              }
            }
            return 0;
          }
          return -100;
        case 4:
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              sVar48 = local_100[1].cstep;
              sVar5 = local_100[1].elemsize;
              auVar80 = *(undefined1 (*) [32])((long)local_100->data + uVar32 * 0x20);
              pvVar9 = local_100[1].data;
              sVar7 = this_00->cstep;
              sVar8 = this_00->elemsize;
              pvVar41 = this_00->data;
              lVar40 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                auVar83 = vminps_avx(auVar80,*(undefined1 (*) [32])
                                              ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
                *(undefined1 (*) [32])((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32) = auVar83;
                lVar40 = lVar40 + 0x20;
              }
            }
            return 0;
          }
          return -100;
        default:
          return 0;
        }
      }
      goto LAB_00398f9c;
    case 2:
      pAVar6 = opt->blob_allocator;
      if (a[1].dims == 3) {
        local_100 = a;
        Mat::create(this_00,uVar61,uVar59,uVar3,sVar5,uVar47,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar61 < 1) {
            uVar61 = 0;
          }
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          uVar58 = (ulong)local_e8 & 0xffffffff;
          if ((int)local_e8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            pauVar37 = (undefined1 (*) [32])
                       ((long)local_100->w * uVar32 * local_100->elemsize + (long)local_100->data);
            pauVar38 = (undefined1 (*) [32])
                       (local_100[1].cstep * uVar32 * local_100[1].elemsize +
                       (long)local_100[1].data);
            pauVar44 = (undefined1 (*) [32])
                       (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
              auVar80 = *pauVar37;
              uVar49 = uVar61;
              while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                auVar83 = vminps_avx(auVar80,*pauVar38);
                *pauVar44 = auVar83;
                pauVar38 = pauVar38 + 1;
                pauVar44 = pauVar44 + 1;
              }
              pauVar37 = pauVar37 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        local_100 = a;
        Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar61 < 1) {
            uVar61 = 0;
          }
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          if (iVar34 < 1) {
            iVar34 = 0;
          }
          uVar58 = (ulong)local_e8 & 0xffffffff;
          if ((int)local_e8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            pauVar37 = (undefined1 (*) [32])
                       ((long)local_100->w * uVar32 * local_100->elemsize + (long)local_100->data);
            pauVar38 = (undefined1 (*) [32])
                       (local_100[1].cstep * uVar32 * local_100[1].elemsize +
                       (long)local_100[1].data);
            pauVar44 = (undefined1 (*) [32])
                       (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            for (iVar29 = 0; iVar29 != iVar34; iVar29 = iVar29 + 1) {
              auVar80 = *pauVar37;
              for (uVar47 = 0; uVar49 = uVar61, uVar47 != uVar59; uVar47 = uVar47 + 1) {
                while (uVar49 != 0) {
                  auVar83 = vminps_avx(auVar80,*pauVar38);
                  *pauVar44 = auVar83;
                  pauVar38 = pauVar38 + 1;
                  pauVar44 = pauVar44 + 1;
                  uVar49 = uVar49 - 1;
                }
              }
              pauVar37 = pauVar37 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      local_d8 = CONCAT44(local_d8._4_4_,uVar47);
      local_100 = a;
      Mat::create(this_00,uVar49,uVar51,sVar48,iVar29,pAVar6);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar29 = local_100[1].dims;
      if (iVar29 == 1) {
        Mat::create(this_00,uVar49,uVar51,sVar48,(int)local_e0,opt->blob_allocator);
        pauVar37 = (undefined1 (*) [32])this_00->data;
        if (pauVar37 == (undefined1 (*) [32])0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        a = local_100;
        if ((int)local_d8 != 1 || local_100[1].w != 1) {
          pauVar38 = (undefined1 (*) [32])local_100->data;
          pauVar44 = (undefined1 (*) [32])local_100[1].data;
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
          if ((int)uVar51 < 1) {
            uVar51 = 0;
          }
          for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
            auVar80 = *pauVar44;
            uVar50 = uVar49;
            while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
              auVar83 = vminps_avx(auVar80,*pauVar38);
              *pauVar37 = auVar83;
              pauVar38 = pauVar38 + 1;
              pauVar37 = pauVar37 + 1;
            }
            pauVar44 = pauVar44 + 1;
          }
          return 0;
        }
        goto LAB_003a37d9;
      }
      break;
    case 3:
      if (a[1].dims != 3) {
        if (a[1].dims == 4) {
          local_100 = a;
          Mat::create(this_00,uVar61,uVar59,iVar34,uVar3,sVar5,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)uVar61 < 1) {
              uVar61 = 0;
            }
            if ((int)uVar59 < 1) {
              uVar59 = 0;
            }
            if (iVar34 < 1) {
              iVar34 = 0;
            }
            uVar58 = (ulong)local_e8 & 0xffffffff;
            if ((int)local_e8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar37 = (undefined1 (*) [32])
                         (local_100->cstep * uVar32 * local_100->elemsize + (long)local_100->data);
              pauVar38 = (undefined1 (*) [32])
                         (local_100[1].cstep * uVar32 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pauVar44 = (undefined1 (*) [32])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              for (iVar29 = 0; iVar29 != iVar34; iVar29 = iVar29 + 1) {
                for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
                  auVar80 = *pauVar37;
                  uVar49 = uVar61;
                  while (bVar64 = uVar49 != 0, uVar49 = uVar49 - 1, bVar64) {
                    auVar83 = vminps_avx(auVar80,*pauVar38);
                    *pauVar44 = auVar83;
                    pauVar38 = pauVar38 + 1;
                    pauVar44 = pauVar44 + 1;
                  }
                  pauVar37 = pauVar37 + 1;
                }
              }
            }
            return 0;
          }
          return -100;
        }
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        if (local_100[1].dims != 1) {
          if (local_100[1].dims == 2) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if ((int)local_f8 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar37 = (undefined1 (*) [32])
                         (local_100->cstep * uVar32 * local_100->elemsize + (long)local_100->data);
              pauVar38 = (undefined1 (*) [32])
                         ((long)local_100[1].w * uVar32 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pauVar44 = (undefined1 (*) [32])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                auVar80 = *pauVar38;
                uVar50 = uVar49;
                while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                  auVar83 = vminps_avx(auVar80,*pauVar37);
                  *pauVar44 = auVar83;
                  pauVar37 = pauVar37 + 1;
                  pauVar44 = pauVar44 + 1;
                }
                pauVar38 = pauVar38 + 1;
              }
            }
            return 0;
          }
          return 0;
        }
        a = local_100;
        if (uVar47 != 1 || local_100[1].w != 1) {
          if ((int)local_d0 < 1) {
            local_d0._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100->cstep;
            sVar5 = local_100->elemsize;
            auVar80 = *(undefined1 (*) [32])((long)local_100[1].data + uVar32 * 0x20);
            pvVar9 = local_100->data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar41 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_d0;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              auVar83 = vminps_avx(auVar80,*(undefined1 (*) [32])
                                            ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
              *(undefined1 (*) [32])((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32) = auVar83;
              lVar40 = lVar40 + 0x20;
            }
          }
          return 0;
        }
        goto LAB_003a37d9;
      }
      local_d8 = CONCAT44(local_d8._4_4_,uVar47);
      uVar31 = uVar3 ^ uVar50;
      if (((uVar61 ^ 1) == 0 && (uVar59 ^ 1) == 0) && uVar31 == 0) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_d0 < 1) {
            local_d0._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100->cstep;
            sVar5 = local_100->elemsize;
            sVar7 = this_00->cstep;
            pvVar9 = local_100->data;
            auVar80 = *(undefined1 (*) [32])
                       ((long)local_100[1].data +
                       local_100[1].cstep * uVar32 * local_100[1].elemsize);
            sVar8 = this_00->elemsize;
            pvVar41 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_d0;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              auVar83 = vminps_avx(auVar80,*(undefined1 (*) [32])
                                            ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
              *(undefined1 (*) [32])((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32) = auVar83;
              lVar40 = lVar40 + 0x20;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((uVar61 == uVar49) && (uVar47 == 1 && (uVar3 == 1 && uVar59 == uVar51))) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_d0 < 1) {
            local_d0._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100->cstep;
            sVar5 = local_100->elemsize;
            pvVar9 = local_100[1].data;
            pvVar41 = local_100->data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar55 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_d0;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              uVar1 = *(undefined4 *)((long)pvVar9 + lVar40);
              auVar80._4_4_ = uVar1;
              auVar80._0_4_ = uVar1;
              auVar80._8_4_ = uVar1;
              auVar80._12_4_ = uVar1;
              auVar80._16_4_ = uVar1;
              auVar80._20_4_ = uVar1;
              auVar80._24_4_ = uVar1;
              auVar80._28_4_ = uVar1;
              auVar80 = vminps_avx(auVar80,*(undefined1 (*) [32])
                                            ((long)pvVar41 + lVar40 * 8 + sVar48 * sVar5 * uVar32));
              *(undefined1 (*) [32])((long)pvVar55 + lVar40 * 8 + sVar7 * sVar8 * uVar32) = auVar80;
              lVar40 = lVar40 + 4;
            }
          }
          return 0;
        }
        return -100;
      }
      local_d0 = (void *)sVar48;
      if (((uVar49 ^ 1) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) {
        local_100 = a;
        Mat::create(this_00,uVar61,uVar59,uVar50,sVar5,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_c8 < 1) {
            local_c8._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100[1].cstep;
            sVar5 = local_100[1].elemsize;
            sVar7 = this_00->cstep;
            pvVar9 = local_100[1].data;
            auVar80 = *(undefined1 (*) [32])
                       ((long)local_100->data + local_100->cstep * uVar32 * local_100->elemsize);
            sVar8 = this_00->elemsize;
            pvVar41 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_c8;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              auVar83 = vminps_avx(auVar80,*(undefined1 (*) [32])
                                            ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
              *(undefined1 (*) [32])((long)pvVar41 + lVar40 + sVar7 * sVar8 * uVar32) = auVar83;
              lVar40 = lVar40 + 0x20;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((uVar61 == uVar49) && (iVar29 == 1)) && ((uVar59 == uVar51 && (uVar50 == 1)))) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar3,sVar5,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_c8 < 1) {
            local_c8._0_4_ = 0;
          }
          uVar58 = (ulong)local_e8 & 0xffffffff;
          if ((int)local_e8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100[1].cstep;
            sVar5 = local_100[1].elemsize;
            pvVar9 = local_100->data;
            pvVar41 = local_100[1].data;
            sVar7 = this_00->cstep;
            sVar8 = this_00->elemsize;
            pvVar55 = this_00->data;
            lVar40 = 0;
            iVar29 = (int)local_c8;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              uVar1 = *(undefined4 *)((long)pvVar9 + lVar40);
              auVar83._4_4_ = uVar1;
              auVar83._0_4_ = uVar1;
              auVar83._8_4_ = uVar1;
              auVar83._12_4_ = uVar1;
              auVar83._16_4_ = uVar1;
              auVar83._20_4_ = uVar1;
              auVar83._24_4_ = uVar1;
              auVar83._28_4_ = uVar1;
              auVar80 = vminps_avx(auVar83,*(undefined1 (*) [32])
                                            ((long)pvVar41 + lVar40 * 8 + sVar48 * sVar5 * uVar32));
              *(undefined1 (*) [32])((long)pvVar55 + lVar40 * 8 + sVar7 * sVar8 * uVar32) = auVar80;
              lVar40 = lVar40 + 4;
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar61 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar49 != 1) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
          uVar58 = (ulong)uVar51;
          if ((int)uVar51 < 1) {
            uVar58 = 0;
          }
          uVar32 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar32 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
            pauVar37 = (undefined1 (*) [32])
                       (local_100->cstep * uVar33 * local_100->elemsize + (long)local_100->data);
            sVar48 = local_100[1].cstep;
            sVar5 = local_100[1].elemsize;
            pvVar9 = local_100[1].data;
            pauVar38 = (undefined1 (*) [32])
                       (this_00->cstep * uVar33 * this_00->elemsize + (long)this_00->data);
            for (uVar46 = 0; uVar46 != uVar58; uVar46 = uVar46 + 1) {
              auVar80 = *(undefined1 (*) [32])
                         ((long)pvVar9 + uVar46 * 0x20 + sVar48 * uVar33 * sVar5);
              uVar47 = uVar49;
              while (bVar64 = uVar47 != 0, uVar47 = uVar47 - 1, bVar64) {
                auVar83 = vminps_avx(auVar80,*pauVar37);
                *pauVar38 = auVar83;
                pauVar37 = pauVar37 + 1;
                pauVar38 = pauVar38 + 1;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar59 ^ 1) == 0 && (uVar61 ^ uVar49) == 0) && uVar31 == 0) && uVar51 != 1) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar51,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
          if ((int)uVar51 < 1) {
            uVar51 = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            pvVar41 = (void *)(local_100->cstep * uVar32 * local_100->elemsize +
                              (long)local_100->data);
            sVar48 = local_100[1].cstep;
            pvVar55 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            sVar5 = local_100[1].elemsize;
            pvVar9 = local_100[1].data;
            for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
              for (lVar40 = 0; (ulong)uVar49 * 0x20 != lVar40; lVar40 = lVar40 + 0x20) {
                auVar80 = vminps_avx(*(undefined1 (*) [32])((long)pvVar41 + lVar40),
                                     *(undefined1 (*) [32])
                                      ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32));
                *(undefined1 (*) [32])((long)pvVar55 + lVar40) = auVar80;
              }
              pvVar41 = (void *)((long)pvVar41 + lVar40);
              pvVar55 = (void *)((long)pvVar55 + lVar40);
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar49 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar61 != 1) {
        local_100 = a;
        Mat::create(this_00,uVar61,uVar51,uVar50,sVar5,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar61 < 1) {
            uVar61 = 0;
          }
          uVar58 = (ulong)uVar51;
          if ((int)uVar51 < 1) {
            uVar58 = 0;
          }
          uVar32 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar32 = 0;
          }
          for (uVar33 = 0; uVar33 != uVar32; uVar33 = uVar33 + 1) {
            sVar48 = local_100->cstep;
            sVar5 = local_100->elemsize;
            pvVar9 = local_100->data;
            pauVar37 = (undefined1 (*) [32])
                       (local_100[1].cstep * uVar33 * local_100[1].elemsize +
                       (long)local_100[1].data);
            pauVar38 = (undefined1 (*) [32])
                       (this_00->cstep * uVar33 * this_00->elemsize + (long)this_00->data);
            for (uVar46 = 0; uVar46 != uVar58; uVar46 = uVar46 + 1) {
              auVar80 = *(undefined1 (*) [32])
                         ((long)pvVar9 + uVar46 * 0x20 + sVar48 * uVar33 * sVar5);
              uVar47 = uVar61;
              while (bVar64 = uVar47 != 0, uVar47 = uVar47 - 1, bVar64) {
                auVar83 = vminps_avx(auVar80,*pauVar37);
                *pauVar38 = auVar83;
                pauVar37 = pauVar37 + 1;
                pauVar38 = pauVar38 + 1;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      if ((((uVar61 ^ uVar49) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) && uVar59 != 1) {
        local_100 = a;
        Mat::create(this_00,uVar49,uVar59,uVar50,sVar5,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
          if ((int)uVar59 < 1) {
            uVar59 = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if ((int)local_f8 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = local_100->cstep;
            pvVar41 = (void *)(local_100[1].cstep * uVar32 * local_100[1].elemsize +
                              (long)local_100[1].data);
            pvVar55 = (void *)(this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
            sVar5 = local_100->elemsize;
            pvVar9 = local_100->data;
            for (uVar47 = 0; uVar47 != uVar59; uVar47 = uVar47 + 1) {
              for (lVar40 = 0; (ulong)uVar49 * 0x20 != lVar40; lVar40 = lVar40 + 0x20) {
                auVar80 = vminps_avx(*(undefined1 (*) [32])
                                      ((long)pvVar9 + lVar40 + sVar48 * sVar5 * uVar32),
                                     *(undefined1 (*) [32])((long)pvVar41 + lVar40));
                *(undefined1 (*) [32])((long)pvVar55 + lVar40) = auVar80;
              }
              pvVar41 = (void *)((long)pvVar41 + lVar40);
              pvVar55 = (void *)((long)pvVar55 + lVar40);
            }
          }
          return 0;
        }
        return -100;
      }
LAB_003a610d:
      local_d8 = CONCAT44(local_d8._4_4_,uVar47);
      local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
      local_100 = a;
      goto LAB_0039ab85;
    case 4:
      if (a[1].dims != 4) {
        local_d8 = CONCAT44(local_d8._4_4_,uVar47);
        local_b0 = opt;
        Mat::create(this_00,uVar49,uVar51,iVar35,uVar50,sVar48,iVar29,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep == 0) {
          return -100;
        }
        iVar29 = a[1].dims;
        iVar34 = (int)local_f8;
        if (iVar29 != 1) {
          if (iVar29 == 3) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            if (iVar35 < 1) {
              iVar35 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if (iVar34 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar37 = (undefined1 (*) [32])(a->cstep * uVar32 * a->elemsize + (long)a->data);
              pauVar38 = (undefined1 (*) [32])
                         (a[1].cstep * uVar32 * a[1].elemsize + (long)a[1].data);
              pauVar44 = (undefined1 (*) [32])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              for (iVar29 = 0; iVar29 != iVar35; iVar29 = iVar29 + 1) {
                for (uVar47 = 0; uVar47 != uVar51; uVar47 = uVar47 + 1) {
                  auVar80 = *pauVar38;
                  uVar50 = uVar49;
                  while (bVar64 = uVar50 != 0, uVar50 = uVar50 - 1, bVar64) {
                    auVar83 = vminps_avx(auVar80,*pauVar37);
                    *pauVar44 = auVar83;
                    pauVar37 = pauVar37 + 1;
                    pauVar44 = pauVar44 + 1;
                  }
                  pauVar38 = pauVar38 + 1;
                }
              }
            }
            return 0;
          }
          if (iVar29 == 2) {
            if ((int)uVar49 < 1) {
              uVar49 = 0;
            }
            if ((int)uVar51 < 1) {
              uVar51 = 0;
            }
            if (iVar35 < 1) {
              iVar35 = 0;
            }
            uVar58 = (ulong)local_f8 & 0xffffffff;
            if (iVar34 < 1) {
              uVar58 = 0;
            }
            for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
              pauVar37 = (undefined1 (*) [32])(a->cstep * uVar32 * a->elemsize + (long)a->data);
              pauVar38 = (undefined1 (*) [32])
                         ((long)a[1].w * uVar32 * a[1].elemsize + (long)a[1].data);
              pauVar44 = (undefined1 (*) [32])
                         (this_00->cstep * uVar32 * this_00->elemsize + (long)this_00->data);
              for (iVar29 = 0; iVar29 != iVar35; iVar29 = iVar29 + 1) {
                auVar80 = *pauVar38;
                for (uVar47 = 0; uVar50 = uVar49, uVar47 != uVar51; uVar47 = uVar47 + 1) {
                  while (uVar50 != 0) {
                    auVar83 = vminps_avx(auVar80,*pauVar37);
                    *pauVar44 = auVar83;
                    pauVar37 = pauVar37 + 1;
                    pauVar44 = pauVar44 + 1;
                    uVar50 = uVar50 - 1;
                  }
                }
                pauVar38 = pauVar38 + 1;
              }
            }
            return 0;
          }
          return 0;
        }
        opt = local_b0;
        if ((int)local_d8 != 1 || a[1].w != 1) {
          if ((int)local_d0 < 1) {
            local_d0._0_4_ = 0;
          }
          uVar58 = (ulong)local_f8 & 0xffffffff;
          if (iVar34 < 1) {
            uVar58 = 0;
          }
          for (uVar32 = 0; uVar32 != uVar58; uVar32 = uVar32 + 1) {
            sVar48 = a->cstep;
            sVar5 = this_00->cstep;
            sVar7 = this_00->elemsize;
            pvVar9 = this_00->data;
            auVar80 = *(undefined1 (*) [32])((long)a[1].data + uVar32 * 0x20);
            sVar8 = a->elemsize;
            pvVar41 = a->data;
            lVar40 = 0;
            iVar29 = (int)local_d0;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              auVar83 = vminps_avx(auVar80,*(undefined1 (*) [32])
                                            ((long)pvVar41 + lVar40 + sVar48 * sVar8 * uVar32));
              *(undefined1 (*) [32])((long)pvVar9 + lVar40 + sVar5 * sVar7 * uVar32) = auVar83;
              lVar40 = lVar40 + 0x20;
            }
          }
          return 0;
        }
        goto LAB_003a37d9;
      }
LAB_0039ab78:
      local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
      goto LAB_0039ab85;
    }
LAB_0039e0f2:
    a = local_100;
    if (iVar29 != 2) {
      return 0;
    }
LAB_0039ab85:
    iVar29 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_min>
                       (a,local_f0,this_00,opt);
    return iVar29;
  case 6:
    if (3 < a->dims - 1U) {
      return 0;
    }
    uVar49 = a->w;
    uVar58 = (ulong)uVar49;
    uVar51 = a->h;
    local_f8 = (__m256 *)(ulong)uVar51;
    iVar35 = a->d;
    uVar50 = a->c;
    uVar32 = (ulong)uVar50;
    local_c8._0_4_ = uVar51 * uVar49 * iVar35;
    local_a8 = a->elemsize;
    uVar61 = a[1].w;
    uVar59 = a[1].h;
    local_e0._0_4_ = a[1].d;
    uVar3 = a[1].c;
    local_d8 = (ulong)uVar3;
    local_f0 = (Mat *)CONCAT44(local_f0._4_4_,uVar59);
    iVar34 = uVar59 * uVar61 * (int)local_e0;
    sVar48 = a[1].elemsize;
    local_e8._0_4_ = uVar61;
    local_b8._0_4_ = iVar34;
    switch(a->dims) {
    case 1:
      if (iVar29 == 1 && uVar49 == 1) {
        iVar29 = binary_op_2_3_4_20<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>(a,b,this_00,opt);
        return iVar29;
      }
      switch(a[1].dims) {
      case 1:
        goto switchD_0039b067_caseD_1;
      case 2:
        Mat::create(this_00,uVar61,uVar59,sVar48,uVar47,opt->blob_allocator);
        puVar60 = (undefined8 *)this_00->data;
        if (puVar60 == (undefined8 *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          local_f8 = (__m256 *)a->data;
          if ((int)uVar61 < 1) {
            uVar61 = 0;
          }
          local_e8 = (__m256 *)CONCAT44(local_e8._4_4_,uVar61);
          pafVar56 = (__m256 *)a[1].data;
          iVar29 = (int)local_f0;
          if ((int)local_f0 < 1) {
            iVar29 = 0;
          }
          local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar29);
          iVar29 = 0;
          while (iVar29 != (int)local_f0) {
            local_d0 = (void *)CONCAT44(local_d0._4_4_,iVar29);
            local_80 = *local_f8;
            iVar29 = (uint)local_e8;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              uVar99 = *(undefined8 *)*pafVar56;
              uVar98 = *(undefined8 *)(*pafVar56 + 2);
              uVar101 = *(undefined8 *)(*pafVar56 + 4);
              uVar102 = *(undefined8 *)(*pafVar56 + 6);
              local_a0 = *pafVar56;
              BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_101,&local_80,&local_a0);
              *puVar60 = uVar99;
              puVar60[1] = uVar98;
              puVar60[2] = uVar101;
              puVar60[3] = uVar102;
              pafVar56 = pafVar56 + 1;
              puVar60 = puVar60 + 4;
            }
            local_f8 = local_f8 + 1;
            iVar29 = (int)local_d0 + 1;
          }
          return 0;
        }
        return -100;
      case 3:
        Mat::create(this_00,uVar61,uVar59,uVar3,sVar48,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_b8 < 1) {
            local_b8._0_4_ = 0;
          }
          iVar29 = (int)local_d8;
          local_d8 = local_d8 & 0xffffffff;
          if (iVar29 < 1) {
            local_d8 = 0;
          }
          local_100 = a;
          for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)local_d8;
              local_f0 = (Mat *)((long)local_f0 + 1)) {
            local_80 = *(__m256 *)((long)local_100->data + (long)local_f0 * 0x20);
            lVar54 = local_100[1].cstep * local_100[1].elemsize * (long)local_f0;
            pvVar9 = local_100[1].data;
            lVar40 = this_00->cstep * this_00->elemsize * (long)local_f0;
            pvVar41 = this_00->data;
            lVar57 = 0;
            iVar29 = (int)local_b8;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              pafVar56 = (__m256 *)((long)pvVar9 + lVar57 + lVar54);
              uVar99 = *(undefined8 *)*pafVar56;
              uVar98 = *(undefined8 *)(*pafVar56 + 2);
              uVar101 = *(undefined8 *)(*pafVar56 + 4);
              uVar102 = *(undefined8 *)(*pafVar56 + 6);
              local_a0 = *pafVar56;
              BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_101,&local_80,&local_a0);
              puVar60 = (undefined8 *)((long)pvVar41 + lVar57 + lVar40);
              *puVar60 = uVar99;
              puVar60[1] = uVar98;
              puVar60[2] = uVar101;
              puVar60[3] = uVar102;
              lVar57 = lVar57 + 0x20;
            }
          }
          return 0;
        }
        return -100;
      case 4:
        Mat::create(this_00,uVar61,uVar59,(int)local_e0,uVar3,sVar48,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)local_b8 < 1) {
            local_b8._0_4_ = 0;
          }
          iVar29 = (int)local_d8;
          local_d8 = local_d8 & 0xffffffff;
          if (iVar29 < 1) {
            local_d8 = 0;
          }
          local_100 = a;
          for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)local_d8;
              local_f0 = (Mat *)((long)local_f0 + 1)) {
            local_80 = *(__m256 *)((long)local_100->data + (long)local_f0 * 0x20);
            lVar54 = local_100[1].cstep * local_100[1].elemsize * (long)local_f0;
            pvVar9 = local_100[1].data;
            lVar40 = this_00->cstep * this_00->elemsize * (long)local_f0;
            pvVar41 = this_00->data;
            lVar57 = 0;
            iVar29 = (int)local_b8;
            while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
              pafVar56 = (__m256 *)((long)pvVar9 + lVar57 + lVar54);
              uVar99 = *(undefined8 *)*pafVar56;
              uVar98 = *(undefined8 *)(*pafVar56 + 2);
              uVar101 = *(undefined8 *)(*pafVar56 + 4);
              uVar102 = *(undefined8 *)(*pafVar56 + 6);
              local_a0 = *pafVar56;
              BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_101,&local_80,&local_a0);
              puVar60 = (undefined8 *)((long)pvVar41 + lVar57 + lVar40);
              *puVar60 = uVar99;
              puVar60[1] = uVar98;
              puVar60[2] = uVar101;
              puVar60[3] = uVar102;
              lVar57 = lVar57 + 0x20;
            }
          }
          return 0;
        }
        return -100;
      default:
        return 0;
      }
    case 2:
      pAVar6 = opt->blob_allocator;
      if (a[1].dims == 3) {
        Mat::create(this_00,uVar61,uVar59,uVar3,sVar48,uVar47,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar61 < 1) {
            uVar61 = 0;
          }
          local_e8 = (__m256 *)CONCAT44(local_e8._4_4_,uVar61);
          iVar29 = (int)local_f0;
          if ((int)local_f0 < 1) {
            iVar29 = 0;
          }
          local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar29);
          iVar29 = (int)local_d8;
          local_d8 = local_d8 & 0xffffffff;
          if (iVar29 < 1) {
            local_d8 = 0;
          }
          local_100 = a;
          for (local_e0 = (__m256 *)0x0; local_e0 != (__m256 *)local_d8;
              local_e0 = (__m256 *)((long)local_e0 + 1)) {
            local_f8 = (__m256 *)
                       ((long)local_100->w * (long)local_e0 * local_100->elemsize +
                       (long)local_100->data);
            pafVar52 = (__m256 *)
                       (local_100[1].cstep * (long)local_e0 * local_100[1].elemsize +
                       (long)local_100[1].data);
            pafVar56 = (__m256 *)
                       (this_00->cstep * (long)local_e0 * this_00->elemsize + (long)this_00->data);
            iVar29 = 0;
            while (iVar29 != (int)local_f0) {
              local_d0 = (void *)CONCAT44(local_d0._4_4_,iVar29);
              local_80 = *local_f8;
              iVar29 = (uint)local_e8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                local_a0 = *pafVar52;
                BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_101,&local_80,&local_a0);
                *pafVar56 = local_a0;
                pafVar52 = pafVar52 + 1;
                pafVar56 = pafVar56 + 1;
              }
              local_f8 = local_f8 + 1;
              iVar29 = (int)local_d0 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar61,uVar59,(int)local_e0,uVar3,sVar48,uVar47,pAVar6);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar61 < 1) {
            uVar61 = 0;
          }
          local_e8 = (__m256 *)CONCAT44(local_e8._4_4_,uVar61);
          iVar29 = (int)local_f0;
          if ((int)local_f0 < 1) {
            iVar29 = 0;
          }
          local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar29);
          if ((int)local_e0 < 1) {
            local_e0._0_4_ = 0;
          }
          iVar29 = (int)local_d8;
          local_d8 = local_d8 & 0xffffffff;
          if (iVar29 < 1) {
            local_d8 = 0;
          }
          local_100 = a;
          for (local_c0 = 0; local_c0 != local_d8; local_c0 = local_c0 + 1) {
            local_c8 = (__m256 *)
                       ((long)local_100->w * local_c0 * local_100->elemsize + (long)local_100->data)
            ;
            pafVar56 = (__m256 *)
                       (local_100[1].cstep * local_c0 * local_100[1].elemsize +
                       (long)local_100[1].data);
            pafVar52 = (__m256 *)
                       (this_00->cstep * local_c0 * this_00->elemsize + (long)this_00->data);
            for (iVar29 = 0; iVar29 != (int)local_e0; iVar29 = iVar29 + 1) {
              local_80 = *local_c8;
              local_d0 = (void *)CONCAT44(local_d0._4_4_,iVar29);
              iVar35 = 0;
              while (iVar35 != (int)local_f0) {
                local_f8 = (__m256 *)CONCAT44(local_f8._4_4_,iVar35);
                iVar29 = (uint)local_e8;
                while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                  local_a0 = *pafVar56;
                  BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                            (&local_101,&local_80,&local_a0);
                  *pafVar52 = local_a0;
                  pafVar56 = pafVar56 + 1;
                  pafVar52 = pafVar52 + 1;
                }
                iVar29 = (int)local_d0;
                iVar35 = (int)local_f8 + 1;
              }
              local_c8 = local_c8 + 1;
            }
          }
          return 0;
        }
        return -100;
      }
      local_d8 = (ulong)uVar47;
      local_d0 = (void *)uVar58;
      Mat::create(this_00,uVar49,uVar51,local_a8,iVar29,pAVar6);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        local_f0 = b;
        if (a[1].dims != 2) {
          return 0;
        }
LAB_00399f04:
        iVar29 = binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>
                           (a,b,this_00,opt);
        return iVar29;
      }
      local_f0 = b;
      Mat::create(this_00,(int)local_d0,(int)local_f8,local_a8,iVar29,opt->blob_allocator);
      puVar60 = (undefined8 *)this_00->data;
      if (puVar60 == (undefined8 *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      b = local_f0;
      if ((int)local_d8 != 1 || a[1].w != 1) {
        pafVar56 = (__m256 *)a->data;
        iVar29 = (int)local_d0;
        local_d0 = (void *)((ulong)local_d0 & 0xffffffff);
        if (iVar29 < 1) {
          local_d0 = (void *)0x0;
        }
        local_e8 = (__m256 *)a[1].data;
        iVar29 = (int)local_f8;
        local_f8 = (__m256 *)((ulong)local_f8 & 0xffffffff);
        if (iVar29 < 1) {
          local_f8 = (__m256 *)0x0;
        }
        iVar29 = 0;
        while( true ) {
          local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar29);
          if (iVar29 == (int)local_f8) break;
          local_80 = *local_e8;
          uVar58 = (ulong)local_d0 & 0xffffffff;
          while (iVar29 = (int)uVar58, uVar58 = (ulong)(iVar29 - 1), iVar29 != 0) {
            uVar99 = *(undefined8 *)*pafVar56;
            uVar98 = *(undefined8 *)(*pafVar56 + 2);
            uVar101 = *(undefined8 *)(*pafVar56 + 4);
            uVar102 = *(undefined8 *)(*pafVar56 + 6);
            local_a0 = *pafVar56;
            BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_101,&local_a0,&local_80);
            *puVar60 = uVar99;
            puVar60[1] = uVar98;
            puVar60[2] = uVar101;
            puVar60[3] = uVar102;
            pafVar56 = pafVar56 + 1;
            puVar60 = puVar60 + 4;
          }
          local_e8 = local_e8 + 1;
          iVar29 = (int)local_f0 + 1;
        }
        return 0;
      }
      break;
    case 3:
      if (a[1].dims == 3) {
        uVar31 = uVar3 ^ uVar50;
        if (((uVar61 ^ 1) == 0 && (uVar59 ^ 1) == 0) && uVar31 == 0) {
          local_d0 = (void *)uVar58;
          local_e0._0_4_ = iVar29;
          Mat::create(this_00,uVar49,uVar51,uVar50,local_a8,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            local_c0 = uVar32;
            if ((int)uVar50 < 1) {
              local_c0 = 0;
            }
            local_100 = a;
            for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)local_c0;
                local_f0 = (Mat *)((long)local_f0 + 1)) {
              lVar54 = local_100->cstep * local_100->elemsize * (long)local_f0;
              pvVar9 = local_100->data;
              lVar40 = this_00->cstep * this_00->elemsize * (long)local_f0;
              pvVar41 = this_00->data;
              local_80 = *(__m256 *)
                          ((long)local_100[1].data +
                          local_100[1].cstep * (long)local_f0 * local_100[1].elemsize);
              lVar57 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                pafVar56 = (__m256 *)((long)pvVar9 + lVar57 + lVar54);
                uVar99 = *(undefined8 *)*pafVar56;
                uVar98 = *(undefined8 *)(*pafVar56 + 2);
                uVar101 = *(undefined8 *)(*pafVar56 + 4);
                uVar102 = *(undefined8 *)(*pafVar56 + 6);
                local_a0 = *pafVar56;
                BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_101,&local_a0,&local_80);
                puVar60 = (undefined8 *)((long)pvVar41 + lVar57 + lVar40);
                *puVar60 = uVar99;
                puVar60[1] = uVar98;
                puVar60[2] = uVar101;
                puVar60[3] = uVar102;
                lVar57 = lVar57 + 0x20;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((uVar61 == uVar49) && (uVar47 == 1 && (uVar3 == 1 && uVar59 == uVar51))) {
          local_d0 = (void *)uVar58;
          local_c0 = uVar32;
          local_e0._0_4_ = iVar29;
          Mat::create(this_00,uVar49,uVar51,uVar50,local_a8,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_c8 < 1) {
              local_c8._0_4_ = 0;
            }
            iVar29 = (int)local_c0;
            local_c0 = local_c0 & 0xffffffff;
            if (iVar29 < 1) {
              local_c0 = 0;
            }
            local_100 = a;
            for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)local_c0;
                local_f0 = (Mat *)((long)local_f0 + 1)) {
              pvVar9 = local_100[1].data;
              lVar54 = local_100->cstep * local_100->elemsize * (long)local_f0;
              pvVar41 = local_100->data;
              lVar40 = this_00->cstep * this_00->elemsize * (long)local_f0;
              pvVar55 = this_00->data;
              lVar57 = 0;
              iVar29 = (int)local_c8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                local_80 = *(__m256 *)((long)pvVar41 + lVar57 * 8 + lVar54);
                fVar2 = *(float *)((long)pvVar9 + lVar57);
                local_a0[1] = fVar2;
                local_a0[0] = fVar2;
                local_a0[2] = fVar2;
                local_a0[3] = fVar2;
                local_a0[4] = fVar2;
                local_a0[5] = fVar2;
                local_a0[6] = fVar2;
                local_a0[7] = fVar2;
                BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_101,&local_80,&local_a0);
                *(__m256 *)((long)pvVar55 + lVar57 * 8 + lVar40) = local_a0;
                lVar57 = lVar57 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        if (((uVar49 ^ 1) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) {
          local_d0 = (void *)uVar58;
          local_c0 = uVar32;
          local_e0._0_4_ = iVar29;
          Mat::create(this_00,uVar61,uVar59,uVar50,sVar48,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_b8 < 1) {
              local_b8._0_4_ = 0;
            }
            iVar29 = (int)local_c0;
            local_c0 = local_c0 & 0xffffffff;
            if (iVar29 < 1) {
              local_c0 = 0;
            }
            local_100 = a;
            for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)local_c0;
                local_f0 = (Mat *)((long)local_f0 + 1)) {
              lVar54 = local_100[1].cstep * local_100[1].elemsize * (long)local_f0;
              pvVar9 = local_100[1].data;
              lVar40 = this_00->cstep * this_00->elemsize * (long)local_f0;
              pvVar41 = this_00->data;
              local_80 = *(__m256 *)
                          ((long)local_100->data +
                          local_100->cstep * (long)local_f0 * local_100->elemsize);
              lVar57 = 0;
              iVar29 = (int)local_b8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                pafVar56 = (__m256 *)((long)pvVar9 + lVar57 + lVar54);
                uVar99 = *(undefined8 *)*pafVar56;
                uVar98 = *(undefined8 *)(*pafVar56 + 2);
                uVar101 = *(undefined8 *)(*pafVar56 + 4);
                uVar102 = *(undefined8 *)(*pafVar56 + 6);
                local_a0 = *pafVar56;
                BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_101,&local_80,&local_a0);
                puVar60 = (undefined8 *)((long)pvVar41 + lVar57 + lVar40);
                *puVar60 = uVar99;
                puVar60[1] = uVar98;
                puVar60[2] = uVar101;
                puVar60[3] = uVar102;
                lVar57 = lVar57 + 0x20;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar61 == uVar49) && (iVar29 == 1)) && (uVar59 == uVar51)) && (uVar50 == 1)) {
          local_d0 = (void *)uVar58;
          local_c0 = uVar32;
          local_e0._0_4_ = iVar29;
          Mat::create(this_00,uVar49,uVar51,uVar3,sVar48,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)local_b8 < 1) {
              local_b8._0_4_ = 0;
            }
            iVar29 = (int)local_d8;
            local_d8 = local_d8 & 0xffffffff;
            if (iVar29 < 1) {
              local_d8 = 0;
            }
            local_100 = a;
            for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)local_d8;
                local_f0 = (Mat *)((long)local_f0 + 1)) {
              pvVar9 = local_100->data;
              lVar54 = local_100[1].cstep * local_100[1].elemsize * (long)local_f0;
              pvVar41 = local_100[1].data;
              lVar40 = this_00->cstep * this_00->elemsize * (long)local_f0;
              pvVar55 = this_00->data;
              lVar57 = 0;
              iVar29 = (int)local_b8;
              while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                local_80[1] = *(float *)((long)pvVar9 + lVar57);
                local_80[0] = local_80[1];
                local_80[2] = local_80[1];
                local_80[3] = local_80[1];
                local_80[4] = local_80[1];
                local_80[5] = local_80[1];
                local_80[6] = local_80[1];
                local_80[7] = local_80[1];
                local_a0 = *(__m256 *)((long)pvVar41 + lVar57 * 8 + lVar54);
                BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_101,&local_80,&local_a0);
                *(__m256 *)((long)pvVar55 + lVar57 * 8 + lVar40) = local_a0;
                lVar57 = lVar57 + 4;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar61 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar49 != 1) {
          local_d0 = (void *)uVar58;
          local_c0 = uVar32;
          local_b0 = opt;
          local_e0._0_4_ = iVar29;
          Mat::create(this_00,uVar49,uVar51,uVar50,local_a8,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar58 = 0;
            iVar29 = (int)local_d0;
            local_d0 = (void *)((ulong)local_d0 & 0xffffffff);
            if (iVar29 < 1) {
              local_d0 = (void *)uVar58;
            }
            pafVar56 = (__m256 *)((ulong)local_f8 & 0xffffffff);
            if ((int)local_f8 < 1) {
              pafVar56 = (__m256 *)uVar58;
            }
            iVar29 = (int)local_c0;
            local_c0 = local_c0 & 0xffffffff;
            if (iVar29 < 1) {
              local_c0 = uVar58;
            }
            local_100 = a;
            local_f8 = pafVar56;
            for (local_e0 = (__m256 *)0x0; local_e0 != (__m256 *)local_c0;
                local_e0 = (__m256 *)((long)local_e0 + 1)) {
              pafVar52 = (__m256 *)
                         (local_100->cstep * (long)local_e0 * local_100->elemsize +
                         (long)local_100->data);
              local_e8 = (__m256 *)
                         (local_100[1].cstep * (long)local_e0 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pafVar62 = (__m256 *)
                         (this_00->cstep * (long)local_e0 * this_00->elemsize + (long)this_00->data)
              ;
              for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)pafVar56;
                  local_f0 = (Mat *)((long)local_f0 + 1)) {
                local_80 = *(__m256 *)((long)local_e8 + (long)local_f0 * 0x20);
                uVar58 = (ulong)local_d0 & 0xffffffff;
                while (iVar29 = (int)uVar58, uVar58 = (ulong)(iVar29 - 1), iVar29 != 0) {
                  local_a0 = *pafVar52;
                  BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                            (&local_101,&local_a0,&local_80);
                  *pafVar62 = local_a0;
                  pafVar52 = pafVar52 + 1;
                  pafVar62 = pafVar62 + 1;
                }
                pafVar56 = local_f8;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar59 ^ 1) == 0 && (uVar61 ^ uVar49) == 0) && uVar31 == 0) && uVar51 != 1) {
          local_d0 = (void *)uVar58;
          local_c0 = uVar32;
          local_b0 = opt;
          local_e0._0_4_ = iVar29;
          Mat::create(this_00,uVar49,uVar51,uVar50,local_a8,iVar29,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar58 = (ulong)local_d0 & 0xffffffff;
            if ((int)local_d0 < 1) {
              uVar58 = 0;
            }
            iVar29 = (int)local_f8;
            local_f8 = (__m256 *)((ulong)local_f8 & 0xffffffff);
            if (iVar29 < 1) {
              local_f8 = (__m256 *)0x0;
            }
            iVar29 = (int)local_c0;
            local_c0 = local_c0 & 0xffffffff;
            if (iVar29 < 1) {
              local_c0 = 0;
            }
            local_100 = a;
            for (local_e8 = (__m256 *)0x0; local_e8 != (__m256 *)local_c0;
                local_e8 = (__m256 *)((long)local_e8 + 1)) {
              pvVar55 = (void *)(local_100->cstep * (long)local_e8 * local_100->elemsize +
                                (long)local_100->data);
              pvVar41 = (void *)(this_00->cstep * (long)local_e8 * this_00->elemsize +
                                (long)this_00->data);
              lVar40 = local_100[1].cstep * local_100[1].elemsize * (long)local_e8;
              pvVar9 = local_100[1].data;
              iVar29 = 0;
              while (iVar29 != (int)local_f8) {
                local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar29);
                for (lVar54 = 0; uVar58 * 0x20 != lVar54; lVar54 = lVar54 + 0x20) {
                  local_80 = *(__m256 *)((long)pvVar55 + lVar54);
                  local_a0 = *(__m256 *)((long)pvVar9 + lVar54 + lVar40);
                  BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                            (&local_101,&local_80,&local_a0);
                  *(__m256 *)((long)pvVar41 + lVar54) = local_a0;
                }
                pvVar55 = (void *)((long)pvVar55 + lVar54);
                pvVar41 = (void *)((long)pvVar41 + lVar54);
                iVar29 = (int)local_f0 + 1;
              }
            }
            return 0;
          }
          return -100;
        }
        if ((((uVar49 ^ 1) == 0 && (uVar59 ^ uVar51) == 0) && uVar31 == 0) && uVar61 != 1) {
          local_100 = a;
          local_d0 = (void *)uVar58;
          local_c0 = uVar32;
          local_b0 = opt;
          local_e0._0_4_ = iVar29;
          Mat::create(this_00,uVar61,uVar51,uVar50,sVar48,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            if ((int)(uint)local_e8 < 1) {
              local_e8._0_4_ = 0;
            }
            pafVar56 = (__m256 *)((ulong)local_f8 & 0xffffffff);
            if ((int)local_f8 < 1) {
              pafVar56 = (__m256 *)0x0;
            }
            iVar29 = (int)local_c0;
            local_c0 = local_c0 & 0xffffffff;
            if (iVar29 < 1) {
              local_c0 = 0;
            }
            local_f8 = pafVar56;
            for (local_e0 = (__m256 *)0x0; local_e0 != (__m256 *)local_c0;
                local_e0 = (__m256 *)((long)local_e0 + 1)) {
              local_d0 = (void *)(local_100->cstep * (long)local_e0 * local_100->elemsize +
                                 (long)local_100->data);
              pafVar62 = (__m256 *)
                         (local_100[1].cstep * (long)local_e0 * local_100[1].elemsize +
                         (long)local_100[1].data);
              pafVar52 = (__m256 *)
                         (this_00->cstep * (long)local_e0 * this_00->elemsize + (long)this_00->data)
              ;
              for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)pafVar56;
                  local_f0 = (Mat *)((long)local_f0 + 1)) {
                local_80 = *(__m256 *)((long)local_d0 + (long)local_f0 * 0x20);
                iVar29 = (uint)local_e8;
                while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
                  local_a0 = *pafVar62;
                  BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                            (&local_101,&local_80,&local_a0);
                  *pafVar52 = local_a0;
                  pafVar62 = pafVar62 + 1;
                  pafVar52 = pafVar52 + 1;
                }
                pafVar56 = local_f8;
              }
            }
            return 0;
          }
          return -100;
        }
        local_100 = a;
        local_d0 = (void *)uVar58;
        local_c0 = uVar32;
        local_b0 = opt;
        local_e0._0_4_ = iVar29;
        if ((((uVar61 ^ uVar49) == 0 && (uVar51 ^ 1) == 0) && uVar31 == 0) && uVar59 != 1) {
          Mat::create(this_00,uVar49,uVar59,uVar50,sVar48,uVar47,opt->blob_allocator);
          if (this_00->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar58 = (ulong)local_d0 & 0xffffffff;
            if ((int)local_d0 < 1) {
              uVar58 = 0;
            }
            iVar29 = (int)local_f0;
            if ((int)local_f0 < 1) {
              iVar29 = 0;
            }
            local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar29);
            iVar29 = (int)local_c0;
            local_c0 = local_c0 & 0xffffffff;
            if (iVar29 < 1) {
              local_c0 = 0;
            }
            for (local_f8 = (__m256 *)0x0; local_f8 != (__m256 *)local_c0;
                local_f8 = (__m256 *)((long)local_f8 + 1)) {
              pvVar55 = (void *)(local_100[1].cstep * (long)local_f8 * local_100[1].elemsize +
                                (long)local_100[1].data);
              pvVar41 = (void *)(this_00->cstep * (long)local_f8 * this_00->elemsize +
                                (long)this_00->data);
              lVar40 = local_100->cstep * local_100->elemsize * (long)local_f8;
              pvVar9 = local_100->data;
              for (local_e8._0_4_ = 0; (uint)local_e8 != (int)local_f0;
                  local_e8._0_4_ = (uint)local_e8 + 1) {
                for (lVar54 = 0; uVar58 * 0x20 != lVar54; lVar54 = lVar54 + 0x20) {
                  local_80 = *(__m256 *)((long)pvVar9 + lVar54 + lVar40);
                  local_a0 = *(__m256 *)((long)pvVar55 + lVar54);
                  BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                            (&local_101,&local_80,&local_a0);
                  *(__m256 *)((long)pvVar41 + lVar54) = local_a0;
                }
                pvVar55 = (void *)((long)pvVar55 + lVar54);
                pvVar41 = (void *)((long)pvVar41 + lVar54);
              }
            }
            return 0;
          }
          return -100;
        }
        goto LAB_00399f04;
      }
      if (a[1].dims == 4) {
        Mat::create(this_00,uVar61,uVar59,(int)local_e0,uVar3,sVar48,uVar47,opt->blob_allocator);
        if (this_00->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_00->c * this_00->cstep != 0) {
          if ((int)uVar61 < 1) {
            uVar61 = 0;
          }
          iVar29 = (int)local_f0;
          if ((int)local_f0 < 1) {
            iVar29 = 0;
          }
          local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar29);
          if ((int)local_e0 < 1) {
            local_e0._0_4_ = 0;
          }
          iVar29 = (int)local_d8;
          local_d8 = local_d8 & 0xffffffff;
          if (iVar29 < 1) {
            local_d8 = 0;
          }
          local_e8 = (__m256 *)CONCAT44(local_e8._4_4_,uVar61);
          local_100 = a;
          for (local_c8 = (__m256 *)0x0; local_c8 != (__m256 *)local_d8;
              local_c8 = (__m256 *)((long)local_c8 + 1)) {
            local_f8 = (__m256 *)
                       (local_100->cstep * (long)local_c8 * local_100->elemsize +
                       (long)local_100->data);
            pafVar56 = (__m256 *)
                       (local_100[1].cstep * (long)local_c8 * local_100[1].elemsize +
                       (long)local_100[1].data);
            pafVar52 = (__m256 *)
                       (this_00->cstep * (long)local_c8 * this_00->elemsize + (long)this_00->data);
            for (iVar29 = 0; iVar29 != (int)local_e0; iVar29 = iVar29 + 1) {
              local_d0 = (void *)CONCAT44(local_d0._4_4_,iVar29);
              for (iVar35 = 0; iVar35 != (int)local_f0; iVar35 = iVar35 + 1) {
                local_80 = *local_f8;
                while (bVar64 = uVar61 != 0, uVar61 = uVar61 - 1, bVar64) {
                  local_a0 = *pafVar56;
                  BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                            (&local_101,&local_80,&local_a0);
                  *pafVar52 = local_a0;
                  pafVar56 = pafVar56 + 1;
                  pafVar52 = pafVar52 + 1;
                }
                local_f8 = local_f8 + 1;
                iVar29 = (int)local_d0;
                uVar61 = (uint)local_e8;
              }
            }
          }
          return 0;
        }
        return -100;
      }
      local_f0 = b;
      local_b0 = opt;
      Mat::create(this_00,uVar49,uVar51,uVar50,local_a8,iVar29,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (a[1].dims != 1) {
        if (a[1].dims == 2) {
          if ((int)uVar49 < 1) {
            uVar58 = 0;
          }
          iVar29 = (int)local_f8;
          local_f8 = (__m256 *)((ulong)local_f8 & 0xffffffff);
          if (iVar29 < 1) {
            local_f8 = (__m256 *)0x0;
          }
          if ((int)uVar50 < 1) {
            uVar32 = 0;
          }
          local_100 = a;
          local_d0 = (void *)uVar58;
          local_c0 = uVar32;
          for (local_e0 = (__m256 *)0x0; local_e0 != (__m256 *)local_c0;
              local_e0 = (__m256 *)((long)local_e0 + 1)) {
            pafVar56 = (__m256 *)
                       (local_100->cstep * (long)local_e0 * local_100->elemsize +
                       (long)local_100->data);
            local_f0 = (Mat *)((long)local_100[1].w * (long)local_e0 * local_100[1].elemsize +
                              (long)local_100[1].data);
            pafVar52 = (__m256 *)
                       (this_00->cstep * (long)local_e0 * this_00->elemsize + (long)this_00->data);
            for (local_e8._0_4_ = 0; (uint)local_e8 != (int)local_f8;
                local_e8._0_4_ = (uint)local_e8 + 1) {
              local_80 = *(__m256 *)local_f0;
              uVar58 = (ulong)local_d0 & 0xffffffff;
              while (iVar29 = (int)uVar58, uVar58 = (ulong)(iVar29 - 1), iVar29 != 0) {
                local_a0 = *pafVar56;
                BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_101,&local_a0,&local_80);
                *pafVar52 = local_a0;
                pafVar56 = pafVar56 + 1;
                pafVar52 = pafVar52 + 1;
              }
              local_f0 = (Mat *)((long)local_f0 + 0x20);
            }
          }
          return 0;
        }
        return 0;
      }
      opt = local_b0;
      b = local_f0;
      if (uVar47 != 1 || a[1].w != 1) {
        if ((int)local_c8 < 1) {
          local_c8._0_4_ = 0;
        }
        local_c0 = uVar32;
        if ((int)uVar50 < 1) {
          local_c0 = 0;
        }
        local_100 = a;
        for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)local_c0;
            local_f0 = (Mat *)((long)local_f0 + 1)) {
          lVar54 = local_100->cstep * local_100->elemsize * (long)local_f0;
          pvVar9 = local_100->data;
          local_80 = *(__m256 *)((long)local_100[1].data + (long)local_f0 * 0x20);
          lVar40 = this_00->cstep * this_00->elemsize * (long)local_f0;
          pvVar41 = this_00->data;
          lVar57 = 0;
          iVar29 = (int)local_c8;
          while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
            pafVar56 = (__m256 *)((long)pvVar9 + lVar57 + lVar54);
            uVar99 = *(undefined8 *)*pafVar56;
            uVar98 = *(undefined8 *)(*pafVar56 + 2);
            uVar101 = *(undefined8 *)(*pafVar56 + 4);
            uVar102 = *(undefined8 *)(*pafVar56 + 6);
            local_a0 = *pafVar56;
            BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_101,&local_a0,&local_80);
            puVar60 = (undefined8 *)((long)pvVar41 + lVar57 + lVar40);
            *puVar60 = uVar99;
            puVar60[1] = uVar98;
            puVar60[2] = uVar101;
            puVar60[3] = uVar102;
            lVar57 = lVar57 + 0x20;
          }
        }
        return 0;
      }
      break;
    case 4:
      if (a[1].dims == 4) goto LAB_00399f04;
      local_f0 = b;
      local_c0 = uVar32;
      local_b0 = opt;
      Mat::create(this_00,uVar49,uVar51,iVar35,uVar50,local_a8,iVar29,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      iVar29 = a[1].dims;
      iVar34 = (int)local_c0;
      if (iVar29 != 1) {
        iVar30 = (int)local_f8;
        if (iVar29 == 3) {
          if ((int)uVar49 < 1) {
            uVar58 = 0;
          }
          local_f8 = (__m256 *)((ulong)local_f8 & 0xffffffff);
          if (iVar30 < 1) {
            local_f8 = (__m256 *)0x0;
          }
          if (iVar35 < 1) {
            iVar35 = 0;
          }
          local_c0 = local_c0 & 0xffffffff;
          if (iVar34 < 1) {
            local_c0 = 0;
          }
          local_c8 = (__m256 *)CONCAT44(local_c8._4_4_,iVar35);
          local_100 = a;
          local_d0 = (void *)uVar58;
          for (local_d8 = 0; local_d8 != local_c0; local_d8 = local_d8 + 1) {
            pafVar62 = (__m256 *)
                       (local_100->cstep * local_d8 * local_100->elemsize + (long)local_100->data);
            local_f0 = (Mat *)(local_100[1].cstep * local_d8 * local_100[1].elemsize +
                              (long)local_100[1].data);
            pafVar52 = (__m256 *)
                       (this_00->cstep * local_d8 * this_00->elemsize + (long)this_00->data);
            pafVar56 = local_f8;
            for (local_e0._0_4_ = 0; (int)local_e0 != (int)local_c8;
                local_e0._0_4_ = (int)local_e0 + 1) {
              for (local_e8._0_4_ = 0; (uint)local_e8 != (int)pafVar56;
                  local_e8._0_4_ = (uint)local_e8 + 1) {
                local_80 = *(__m256 *)local_f0;
                uVar58 = (ulong)local_d0 & 0xffffffff;
                while (iVar29 = (int)uVar58, uVar58 = (ulong)(iVar29 - 1), iVar29 != 0) {
                  local_a0 = *pafVar62;
                  BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                            (&local_101,&local_a0,&local_80);
                  *pafVar52 = local_a0;
                  pafVar62 = pafVar62 + 1;
                  pafVar52 = pafVar52 + 1;
                }
                local_f0 = (Mat *)((long)local_f0 + 0x20);
                pafVar56 = local_f8;
              }
            }
          }
          return 0;
        }
        if (iVar29 == 2) {
          if ((int)uVar49 < 1) {
            uVar58 = 0;
          }
          local_f8 = (__m256 *)((ulong)local_f8 & 0xffffffff);
          if (iVar30 < 1) {
            local_f8 = (__m256 *)0x0;
          }
          if (iVar35 < 1) {
            iVar35 = 0;
          }
          local_c0 = local_c0 & 0xffffffff;
          if (iVar34 < 1) {
            local_c0 = 0;
          }
          local_c8 = (__m256 *)CONCAT44(local_c8._4_4_,iVar35);
          local_100 = a;
          local_d0 = (void *)uVar58;
          for (local_d8 = 0; local_d8 != local_c0; local_d8 = local_d8 + 1) {
            pafVar62 = (__m256 *)
                       (local_100->cstep * local_d8 * local_100->elemsize + (long)local_100->data);
            local_e0 = (__m256 *)
                       ((long)local_100[1].w * local_d8 * local_100[1].elemsize +
                       (long)local_100[1].data);
            pafVar52 = (__m256 *)
                       (this_00->cstep * local_d8 * this_00->elemsize + (long)this_00->data);
            pafVar56 = local_f8;
            for (local_e8._0_4_ = 0; (uint)local_e8 != (int)local_c8;
                local_e8._0_4_ = (uint)local_e8 + 1) {
              local_80 = *local_e0;
              iVar29 = 0;
              while (iVar29 != (int)pafVar56) {
                local_f0 = (Mat *)CONCAT44(local_f0._4_4_,iVar29);
                uVar58 = (ulong)local_d0 & 0xffffffff;
                while (iVar29 = (int)uVar58, uVar58 = (ulong)(iVar29 - 1), iVar29 != 0) {
                  local_a0 = *pafVar62;
                  BinaryOp_x86_fma_functor::binary_op_pow::func_pack8
                            (&local_101,&local_a0,&local_80);
                  *pafVar52 = local_a0;
                  pafVar62 = pafVar62 + 1;
                  pafVar52 = pafVar52 + 1;
                }
                pafVar56 = local_f8;
                iVar29 = (int)local_f0 + 1;
              }
              local_e0 = local_e0 + 1;
            }
          }
          return 0;
        }
        return 0;
      }
      opt = local_b0;
      b = local_f0;
      if (uVar47 != 1 || a[1].w != 1) {
        if ((int)local_c8 < 1) {
          local_c8._0_4_ = 0;
        }
        local_c0 = local_c0 & 0xffffffff;
        if (iVar34 < 1) {
          local_c0 = 0;
        }
        local_100 = a;
        for (local_f0 = (Mat *)0x0; local_f0 != (Mat *)local_c0;
            local_f0 = (Mat *)((long)local_f0 + 1)) {
          lVar57 = local_100->cstep * local_100->elemsize * (long)local_f0;
          pvVar9 = local_100->data;
          local_80 = *(__m256 *)((long)local_100[1].data + (long)local_f0 * 0x20);
          lVar54 = this_00->cstep * this_00->elemsize * (long)local_f0;
          pvVar41 = this_00->data;
          lVar40 = 0;
          iVar29 = (int)local_c8;
          while (bVar64 = iVar29 != 0, iVar29 = iVar29 + -1, bVar64) {
            pafVar56 = (__m256 *)((long)pvVar9 + lVar40 + lVar57);
            uVar99 = *(undefined8 *)*pafVar56;
            uVar98 = *(undefined8 *)(*pafVar56 + 2);
            uVar101 = *(undefined8 *)(*pafVar56 + 4);
            uVar102 = *(undefined8 *)(*pafVar56 + 6);
            local_a0 = *pafVar56;
            BinaryOp_x86_fma_functor::binary_op_pow::func_pack8(&local_101,&local_a0,&local_80);
            puVar60 = (undefined8 *)((long)pvVar41 + lVar40 + lVar54);
            *puVar60 = uVar99;
            puVar60[1] = uVar98;
            puVar60[2] = uVar101;
            puVar60[3] = uVar102;
            lVar40 = lVar40 + 0x20;
          }
        }
        return 0;
      }
    }
LAB_003a21e5:
    iVar29 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>(a,b,this_00,opt);
    return iVar29;
  case 7:
    pMVar42 = a;
    a = b;
    break;
  case 8:
    pMVar42 = a;
    a = b;
LAB_00398d4e:
    iVar29 = binary_op_pack8<ncnn::BinaryOp_x86_fma_functor::binary_op_div>(a,pMVar42,this_00,opt);
    return iVar29;
  default:
    goto switchD_003985fc_default;
  }
  iVar29 = binary_op_pack8<ncnn::BinaryOp_x86_fma_functor::binary_op_sub>(a,pMVar42,this_00,opt);
  return iVar29;
switchD_0039ceb3_caseD_1:
  local_c8._0_4_ = iVar34;
  Mat::create(this_00,uVar49,local_60,iVar29,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if ((int)local_d8 != 1 || a[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>(a,b,this_00,opt);
    return 0;
  }
  goto LAB_003a3763;
switchD_0039ca84_caseD_1:
  local_100 = a;
  Mat::create(this_00,uVar49,sVar48,iVar29,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  a = local_100;
  if (uVar47 != 1 || local_100[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
              (local_100,local_f0,this_00,opt);
    return 0;
  }
  goto LAB_003a3733;
switchD_0039b067_caseD_1:
  Mat::create(this_00,uVar49,local_a8,iVar29,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  if (uVar47 != 1 || a[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>(a,b,this_00,opt);
    return 0;
  }
  goto LAB_003a21e5;
switchD_00398bf5_caseD_1:
  local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
  local_100 = a;
  Mat::create(this_00,uVar49,sVar48,iVar29,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  a = local_100;
  if (uVar47 != 1 || local_100[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_min>
              (local_100,local_f0,this_00,opt);
    return 0;
  }
  goto LAB_003a37d9;
switchD_00398908_caseD_1:
  local_e0 = (__m256 *)CONCAT44(local_e0._4_4_,iVar29);
  local_100 = a;
  Mat::create(this_00,uVar49,sVar48,iVar29,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  a = local_100;
  if (uVar47 != 1 || local_100[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_max>
              (local_100,local_f0,this_00,opt);
    return 0;
  }
  goto LAB_003a346d;
switchD_003986c3_caseD_1:
  local_100 = a;
  Mat::create(this_00,uVar49,sVar48,iVar29,opt->blob_allocator);
  if (this_00->data == (void *)0x0) {
    return -100;
  }
  if ((long)this_00->c * this_00->cstep == 0) {
    return -100;
  }
  a = local_100;
  if (uVar47 != 1 || local_100[1].w != 1) {
    binary_op_7_13_19_29<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
              (local_100,local_f0,this_00,opt);
    return 0;
  }
LAB_003a3733:
  iVar29 = binary_op_6_11_16_25<ncnn::BinaryOp_x86_fma_functor::binary_op_add>
                     (a,local_f0,this_00,opt);
  return iVar29;
}

Assistant:

int BinaryOp_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __SSE2__
    using namespace BinaryOp_x86_fma_functor;

    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int elempack = bottom_blob.elempack;
    int elempack1 = bottom_blob1.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16 || elempack1 == 16)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack16<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack16<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack16<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack16<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack16<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack16<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack16<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack16<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX512F__

    if (elempack == 8 || elempack1 == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack8<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack8<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack8<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack8<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack8<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack8<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack8<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack8<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __AVX__

    if (elempack == 4 || elempack1 == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_pack4<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_SUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MUL)
            return binary_op_pack4<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_DIV)
            return binary_op_pack4<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MAX)
            return binary_op_pack4<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_MIN)
            return binary_op_pack4<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_POW)
            return binary_op_pack4<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

        if (op_type == Operation_RSUB)
            return binary_op_pack4<binary_op_sub>(bottom_blob1, bottom_blob, top_blob, opt);

        if (op_type == Operation_RDIV)
            return binary_op_pack4<binary_op_div>(bottom_blob1, bottom_blob, top_blob, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward(bottom_blobs, top_blobs, opt);
}